

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx::CurveNiIntersectorK<8,8>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  float *pfVar2;
  undefined1 (*pauVar3) [32];
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Primitive PVar15;
  uint uVar16;
  undefined4 uVar17;
  Geometry *pGVar18;
  RTCFilterFunctionN p_Var19;
  uint uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [28];
  undefined1 auVar120 [28];
  undefined1 auVar121 [28];
  undefined1 auVar122 [28];
  undefined1 auVar123 [24];
  undefined8 uVar124;
  undefined8 uVar125;
  undefined8 uVar126;
  undefined8 uVar127;
  uint uVar128;
  uint uVar129;
  uint uVar130;
  long lVar131;
  ulong uVar132;
  long lVar133;
  ulong uVar134;
  float fVar135;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar136;
  float fVar160;
  float fVar162;
  float fVar163;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar159;
  float fVar161;
  float fVar164;
  float fVar166;
  float fVar168;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar169;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar170;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar165;
  float fVar167;
  float fVar171;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  float fVar172;
  float fVar191;
  float fVar192;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar193;
  float fVar197;
  float fVar198;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar199;
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar216;
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar217;
  float fVar234;
  undefined1 auVar219 [16];
  float fVar218;
  undefined1 auVar220 [16];
  float fVar230;
  float fVar232;
  float fVar235;
  float fVar236;
  float fVar238;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  float fVar231;
  float fVar233;
  float fVar237;
  float fVar239;
  float fVar240;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [64];
  float fVar241;
  undefined1 auVar243 [16];
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar242 [16];
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  float fVar256;
  float fVar257;
  float fVar266;
  float fVar268;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar272;
  float fVar273;
  float fVar274;
  undefined1 auVar261 [32];
  float fVar270;
  undefined1 auVar262 [32];
  float fVar267;
  float fVar269;
  float fVar271;
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar276 [16];
  float fVar275;
  float fVar286;
  float fVar287;
  float fVar291;
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  float fVar292;
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  float fVar288;
  float fVar290;
  float fVar293;
  undefined1 auVar284 [32];
  float fVar289;
  undefined1 auVar285 [64];
  float fVar294;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  float fVar307;
  undefined1 auVar302 [32];
  float fVar308;
  undefined1 auVar309 [16];
  float fVar316;
  float fVar317;
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [64];
  float fVar318;
  float fVar319;
  float fVar325;
  float fVar327;
  float fVar329;
  undefined1 auVar320 [32];
  float fVar326;
  float fVar328;
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  float fVar330;
  float fVar331;
  float fVar336;
  float fVar338;
  float fVar340;
  float fVar341;
  undefined1 auVar332 [32];
  float fVar337;
  float fVar339;
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  float in_register_0000151c;
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  float fVar352;
  undefined1 auVar353 [16];
  float fVar358;
  float fVar359;
  undefined1 auVar354 [32];
  float fVar360;
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  float fVar361;
  float fVar364;
  float fVar365;
  float fVar366;
  float in_register_0000159c;
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  float fVar367;
  float fVar371;
  float fVar372;
  float fVar373;
  float in_register_000015dc;
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  float local_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined8 local_900;
  undefined8 uStack_8f8;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float local_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  RTCFilterFunctionNArguments local_830;
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined1 local_7c0 [8];
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined1 *local_778;
  undefined1 (*local_770) [16];
  undefined1 (*local_768) [32];
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  undefined8 uStack_738;
  undefined1 auStack_730 [8];
  undefined8 uStack_728;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [2] [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [8];
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  uint local_3c0;
  uint local_3bc;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  float local_340 [4];
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  RTCHitN local_260 [16];
  undefined1 auStack_250 [16];
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  undefined1 local_220 [16];
  undefined1 auStack_210 [16];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  
  PVar15 = prim[1];
  uVar134 = (ulong)(byte)PVar15;
  lVar131 = uVar134 * 5;
  auVar243 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar243 = vinsertps_avx(auVar243,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar204 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar204 = vinsertps_avx(auVar204,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar217 = *(float *)(prim + uVar134 * 0x19 + 0x12);
  auVar243 = vsubps_avx(auVar243,*(undefined1 (*) [16])(prim + uVar134 * 0x19 + 6));
  auVar173._0_4_ = fVar217 * auVar243._0_4_;
  auVar173._4_4_ = fVar217 * auVar243._4_4_;
  auVar173._8_4_ = fVar217 * auVar243._8_4_;
  auVar173._12_4_ = fVar217 * auVar243._12_4_;
  auVar243 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 4 + 6)));
  auVar220 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 4 + 10)));
  auVar258._0_4_ = fVar217 * auVar204._0_4_;
  auVar258._4_4_ = fVar217 * auVar204._4_4_;
  auVar258._8_4_ = fVar217 * auVar204._8_4_;
  auVar258._12_4_ = fVar217 * auVar204._12_4_;
  auVar147._16_16_ = auVar220;
  auVar147._0_16_ = auVar243;
  auVar243 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar131 + 6)));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar131 + 10)));
  auVar210._16_16_ = auVar204;
  auVar210._0_16_ = auVar243;
  auVar154 = vcvtdq2ps_avx(auVar210);
  auVar243 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 6 + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 6 + 10)));
  auVar221._16_16_ = auVar204;
  auVar221._0_16_ = auVar243;
  auVar243 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 0xb + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar134 * 0xb + 10)));
  auVar22 = vcvtdq2ps_avx(auVar221);
  auVar222._16_16_ = auVar204;
  auVar222._0_16_ = auVar243;
  auVar23 = vcvtdq2ps_avx(auVar222);
  uVar132 = (ulong)((uint)(byte)PVar15 * 0xc);
  auVar243 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 + 10)));
  auVar277._16_16_ = auVar204;
  auVar277._0_16_ = auVar243;
  auVar243 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 + uVar134 + 6)));
  auVar24 = vcvtdq2ps_avx(auVar277);
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 + uVar134 + 10)));
  auVar295._16_16_ = auVar204;
  auVar295._0_16_ = auVar243;
  lVar133 = uVar134 * 9;
  uVar132 = (ulong)(uint)((int)lVar133 * 2);
  auVar243 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 + 6)));
  auVar370 = vcvtdq2ps_avx(auVar295);
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 + 10)));
  auVar296._16_16_ = auVar204;
  auVar296._0_16_ = auVar243;
  auVar25 = vcvtdq2ps_avx(auVar296);
  auVar243 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 + uVar134 + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 + uVar134 + 10)));
  auVar320._16_16_ = auVar204;
  auVar320._0_16_ = auVar243;
  uVar132 = (ulong)(uint)((int)lVar131 << 2);
  auVar243 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 + 10)));
  auVar26 = vcvtdq2ps_avx(auVar320);
  auVar332._16_16_ = auVar204;
  auVar332._0_16_ = auVar243;
  auVar27 = vcvtdq2ps_avx(auVar332);
  auVar243 = vshufps_avx(auVar258,auVar258,0);
  auVar204 = vshufps_avx(auVar258,auVar258,0x55);
  auVar220 = vshufps_avx(auVar258,auVar258,0xaa);
  fVar217 = auVar220._0_4_;
  fVar230 = auVar220._4_4_;
  fVar232 = auVar220._8_4_;
  fVar234 = auVar220._12_4_;
  fVar235 = auVar204._0_4_;
  fVar236 = auVar204._4_4_;
  fVar238 = auVar204._8_4_;
  fVar241 = auVar204._12_4_;
  fVar249 = auVar243._0_4_;
  fVar250 = auVar243._4_4_;
  fVar251 = auVar243._8_4_;
  fVar253 = auVar243._12_4_;
  auVar346._0_4_ = fVar249 * auVar147._0_4_ + fVar235 * auVar154._0_4_ + fVar217 * auVar22._0_4_;
  auVar346._4_4_ = fVar250 * auVar147._4_4_ + fVar236 * auVar154._4_4_ + fVar230 * auVar22._4_4_;
  auVar346._8_4_ = fVar251 * auVar147._8_4_ + fVar238 * auVar154._8_4_ + fVar232 * auVar22._8_4_;
  auVar346._12_4_ = fVar253 * auVar147._12_4_ + fVar241 * auVar154._12_4_ + fVar234 * auVar22._12_4_
  ;
  auVar346._16_4_ = fVar249 * auVar147._16_4_ + fVar235 * auVar154._16_4_ + fVar217 * auVar22._16_4_
  ;
  auVar346._20_4_ = fVar250 * auVar147._20_4_ + fVar236 * auVar154._20_4_ + fVar230 * auVar22._20_4_
  ;
  auVar346._24_4_ = fVar251 * auVar147._24_4_ + fVar238 * auVar154._24_4_ + fVar232 * auVar22._24_4_
  ;
  auVar346._28_4_ = fVar241 + in_register_000015dc + in_register_0000151c;
  auVar342._0_4_ = fVar249 * auVar23._0_4_ + fVar235 * auVar24._0_4_ + auVar370._0_4_ * fVar217;
  auVar342._4_4_ = fVar250 * auVar23._4_4_ + fVar236 * auVar24._4_4_ + auVar370._4_4_ * fVar230;
  auVar342._8_4_ = fVar251 * auVar23._8_4_ + fVar238 * auVar24._8_4_ + auVar370._8_4_ * fVar232;
  auVar342._12_4_ = fVar253 * auVar23._12_4_ + fVar241 * auVar24._12_4_ + auVar370._12_4_ * fVar234;
  auVar342._16_4_ = fVar249 * auVar23._16_4_ + fVar235 * auVar24._16_4_ + auVar370._16_4_ * fVar217;
  auVar342._20_4_ = fVar250 * auVar23._20_4_ + fVar236 * auVar24._20_4_ + auVar370._20_4_ * fVar230;
  auVar342._24_4_ = fVar251 * auVar23._24_4_ + fVar238 * auVar24._24_4_ + auVar370._24_4_ * fVar232;
  auVar342._28_4_ = fVar241 + in_register_000015dc + in_register_0000159c;
  auVar261._0_4_ = fVar249 * auVar25._0_4_ + fVar235 * auVar26._0_4_ + auVar27._0_4_ * fVar217;
  auVar261._4_4_ = fVar250 * auVar25._4_4_ + fVar236 * auVar26._4_4_ + auVar27._4_4_ * fVar230;
  auVar261._8_4_ = fVar251 * auVar25._8_4_ + fVar238 * auVar26._8_4_ + auVar27._8_4_ * fVar232;
  auVar261._12_4_ = fVar253 * auVar25._12_4_ + fVar241 * auVar26._12_4_ + auVar27._12_4_ * fVar234;
  auVar261._16_4_ = fVar249 * auVar25._16_4_ + fVar235 * auVar26._16_4_ + auVar27._16_4_ * fVar217;
  auVar261._20_4_ = fVar250 * auVar25._20_4_ + fVar236 * auVar26._20_4_ + auVar27._20_4_ * fVar230;
  auVar261._24_4_ = fVar251 * auVar25._24_4_ + fVar238 * auVar26._24_4_ + auVar27._24_4_ * fVar232;
  auVar261._28_4_ = fVar253 + fVar241 + fVar234;
  auVar243 = vshufps_avx(auVar173,auVar173,0);
  auVar204 = vshufps_avx(auVar173,auVar173,0x55);
  auVar220 = vshufps_avx(auVar173,auVar173,0xaa);
  fVar230 = auVar220._0_4_;
  fVar232 = auVar220._4_4_;
  fVar234 = auVar220._8_4_;
  fVar235 = auVar220._12_4_;
  fVar250 = auVar204._0_4_;
  fVar251 = auVar204._4_4_;
  fVar253 = auVar204._8_4_;
  fVar254 = auVar204._12_4_;
  fVar236 = auVar243._0_4_;
  fVar238 = auVar243._4_4_;
  fVar241 = auVar243._8_4_;
  fVar249 = auVar243._12_4_;
  fVar217 = auVar147._28_4_;
  auVar278._0_4_ = fVar236 * auVar147._0_4_ + fVar250 * auVar154._0_4_ + fVar230 * auVar22._0_4_;
  auVar278._4_4_ = fVar238 * auVar147._4_4_ + fVar251 * auVar154._4_4_ + fVar232 * auVar22._4_4_;
  auVar278._8_4_ = fVar241 * auVar147._8_4_ + fVar253 * auVar154._8_4_ + fVar234 * auVar22._8_4_;
  auVar278._12_4_ = fVar249 * auVar147._12_4_ + fVar254 * auVar154._12_4_ + fVar235 * auVar22._12_4_
  ;
  auVar278._16_4_ = fVar236 * auVar147._16_4_ + fVar250 * auVar154._16_4_ + fVar230 * auVar22._16_4_
  ;
  auVar278._20_4_ = fVar238 * auVar147._20_4_ + fVar251 * auVar154._20_4_ + fVar232 * auVar22._20_4_
  ;
  auVar278._24_4_ = fVar241 * auVar147._24_4_ + fVar253 * auVar154._24_4_ + fVar234 * auVar22._24_4_
  ;
  auVar278._28_4_ = fVar217 + auVar154._28_4_ + auVar22._28_4_;
  auVar178._0_4_ = fVar236 * auVar23._0_4_ + auVar370._0_4_ * fVar230 + fVar250 * auVar24._0_4_;
  auVar178._4_4_ = fVar238 * auVar23._4_4_ + auVar370._4_4_ * fVar232 + fVar251 * auVar24._4_4_;
  auVar178._8_4_ = fVar241 * auVar23._8_4_ + auVar370._8_4_ * fVar234 + fVar253 * auVar24._8_4_;
  auVar178._12_4_ = fVar249 * auVar23._12_4_ + auVar370._12_4_ * fVar235 + fVar254 * auVar24._12_4_;
  auVar178._16_4_ = fVar236 * auVar23._16_4_ + auVar370._16_4_ * fVar230 + fVar250 * auVar24._16_4_;
  auVar178._20_4_ = fVar238 * auVar23._20_4_ + auVar370._20_4_ * fVar232 + fVar251 * auVar24._20_4_;
  auVar178._24_4_ = fVar241 * auVar23._24_4_ + auVar370._24_4_ * fVar234 + fVar253 * auVar24._24_4_;
  auVar178._28_4_ = fVar217 + auVar370._28_4_ + auVar22._28_4_;
  auVar297._8_4_ = 0x7fffffff;
  auVar297._0_8_ = 0x7fffffff7fffffff;
  auVar297._12_4_ = 0x7fffffff;
  auVar297._16_4_ = 0x7fffffff;
  auVar297._20_4_ = 0x7fffffff;
  auVar297._24_4_ = 0x7fffffff;
  auVar297._28_4_ = 0x7fffffff;
  auVar211._8_4_ = 0x219392ef;
  auVar211._0_8_ = 0x219392ef219392ef;
  auVar211._12_4_ = 0x219392ef;
  auVar211._16_4_ = 0x219392ef;
  auVar211._20_4_ = 0x219392ef;
  auVar211._24_4_ = 0x219392ef;
  auVar211._28_4_ = 0x219392ef;
  auVar147 = vandps_avx(auVar346,auVar297);
  auVar147 = vcmpps_avx(auVar147,auVar211,1);
  auVar154 = vblendvps_avx(auVar346,auVar211,auVar147);
  auVar147 = vandps_avx(auVar342,auVar297);
  auVar147 = vcmpps_avx(auVar147,auVar211,1);
  auVar22 = vblendvps_avx(auVar342,auVar211,auVar147);
  auVar147 = vandps_avx(auVar261,auVar297);
  auVar147 = vcmpps_avx(auVar147,auVar211,1);
  auVar147 = vblendvps_avx(auVar261,auVar211,auVar147);
  auVar212._0_4_ = fVar250 * auVar26._0_4_ + auVar27._0_4_ * fVar230 + fVar236 * auVar25._0_4_;
  auVar212._4_4_ = fVar251 * auVar26._4_4_ + auVar27._4_4_ * fVar232 + fVar238 * auVar25._4_4_;
  auVar212._8_4_ = fVar253 * auVar26._8_4_ + auVar27._8_4_ * fVar234 + fVar241 * auVar25._8_4_;
  auVar212._12_4_ = fVar254 * auVar26._12_4_ + auVar27._12_4_ * fVar235 + fVar249 * auVar25._12_4_;
  auVar212._16_4_ = fVar250 * auVar26._16_4_ + auVar27._16_4_ * fVar230 + fVar236 * auVar25._16_4_;
  auVar212._20_4_ = fVar251 * auVar26._20_4_ + auVar27._20_4_ * fVar232 + fVar238 * auVar25._20_4_;
  auVar212._24_4_ = fVar253 * auVar26._24_4_ + auVar27._24_4_ * fVar234 + fVar241 * auVar25._24_4_;
  auVar212._28_4_ = auVar24._28_4_ + fVar235 + fVar217;
  auVar23 = vrcpps_avx(auVar154);
  fVar217 = auVar23._0_4_;
  fVar230 = auVar23._4_4_;
  auVar24._4_4_ = auVar154._4_4_ * fVar230;
  auVar24._0_4_ = auVar154._0_4_ * fVar217;
  fVar232 = auVar23._8_4_;
  auVar24._8_4_ = auVar154._8_4_ * fVar232;
  fVar234 = auVar23._12_4_;
  auVar24._12_4_ = auVar154._12_4_ * fVar234;
  fVar235 = auVar23._16_4_;
  auVar24._16_4_ = auVar154._16_4_ * fVar235;
  fVar236 = auVar23._20_4_;
  auVar24._20_4_ = auVar154._20_4_ * fVar236;
  fVar238 = auVar23._24_4_;
  auVar24._24_4_ = auVar154._24_4_ * fVar238;
  auVar24._28_4_ = auVar154._28_4_;
  auVar310._8_4_ = 0x3f800000;
  auVar310._0_8_ = 0x3f8000003f800000;
  auVar310._12_4_ = 0x3f800000;
  auVar310._16_4_ = 0x3f800000;
  auVar310._20_4_ = 0x3f800000;
  auVar310._24_4_ = 0x3f800000;
  auVar310._28_4_ = 0x3f800000;
  auVar24 = vsubps_avx(auVar310,auVar24);
  auVar154 = vrcpps_avx(auVar22);
  fVar217 = fVar217 + fVar217 * auVar24._0_4_;
  fVar230 = fVar230 + fVar230 * auVar24._4_4_;
  fVar232 = fVar232 + fVar232 * auVar24._8_4_;
  fVar234 = fVar234 + fVar234 * auVar24._12_4_;
  fVar235 = fVar235 + fVar235 * auVar24._16_4_;
  fVar236 = fVar236 + fVar236 * auVar24._20_4_;
  fVar238 = fVar238 + fVar238 * auVar24._24_4_;
  fVar256 = auVar154._0_4_;
  fVar266 = auVar154._4_4_;
  auVar370._4_4_ = fVar266 * auVar22._4_4_;
  auVar370._0_4_ = fVar256 * auVar22._0_4_;
  fVar268 = auVar154._8_4_;
  auVar370._8_4_ = fVar268 * auVar22._8_4_;
  fVar270 = auVar154._12_4_;
  auVar370._12_4_ = fVar270 * auVar22._12_4_;
  fVar272 = auVar154._16_4_;
  auVar370._16_4_ = fVar272 * auVar22._16_4_;
  fVar273 = auVar154._20_4_;
  auVar370._20_4_ = fVar273 * auVar22._20_4_;
  fVar274 = auVar154._24_4_;
  auVar370._24_4_ = fVar274 * auVar22._24_4_;
  auVar370._28_4_ = auVar23._28_4_;
  auVar154 = vsubps_avx(auVar310,auVar370);
  fVar256 = fVar256 + fVar256 * auVar154._0_4_;
  fVar266 = fVar266 + fVar266 * auVar154._4_4_;
  fVar268 = fVar268 + fVar268 * auVar154._8_4_;
  fVar270 = fVar270 + fVar270 * auVar154._12_4_;
  fVar272 = fVar272 + fVar272 * auVar154._16_4_;
  fVar273 = fVar273 + fVar273 * auVar154._20_4_;
  fVar274 = fVar274 + fVar274 * auVar154._24_4_;
  auVar154 = vrcpps_avx(auVar147);
  fVar241 = auVar154._0_4_;
  fVar249 = auVar154._4_4_;
  auVar25._4_4_ = fVar249 * auVar147._4_4_;
  auVar25._0_4_ = fVar241 * auVar147._0_4_;
  fVar250 = auVar154._8_4_;
  auVar25._8_4_ = fVar250 * auVar147._8_4_;
  fVar251 = auVar154._12_4_;
  auVar25._12_4_ = fVar251 * auVar147._12_4_;
  fVar253 = auVar154._16_4_;
  auVar25._16_4_ = fVar253 * auVar147._16_4_;
  fVar254 = auVar154._20_4_;
  auVar25._20_4_ = fVar254 * auVar147._20_4_;
  fVar255 = auVar154._24_4_;
  auVar25._24_4_ = fVar255 * auVar147._24_4_;
  auVar25._28_4_ = auVar22._28_4_;
  auVar147 = vsubps_avx(auVar310,auVar25);
  fVar241 = fVar241 + fVar241 * auVar147._0_4_;
  fVar249 = fVar249 + fVar249 * auVar147._4_4_;
  fVar250 = fVar250 + fVar250 * auVar147._8_4_;
  fVar251 = fVar251 + fVar251 * auVar147._12_4_;
  fVar253 = fVar253 + fVar253 * auVar147._16_4_;
  fVar254 = fVar254 + fVar254 * auVar147._20_4_;
  fVar255 = fVar255 + fVar255 * auVar147._24_4_;
  auVar243._8_8_ = 0;
  auVar243._0_8_ = *(ulong *)(prim + uVar134 * 7 + 6);
  auVar243 = vpmovsxwd_avx(auVar243);
  auVar204._8_8_ = 0;
  auVar204._0_8_ = *(ulong *)(prim + uVar134 * 7 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar204);
  auVar141._16_16_ = auVar204;
  auVar141._0_16_ = auVar243;
  auVar147 = vcvtdq2ps_avx(auVar141);
  auVar147 = vsubps_avx(auVar147,auVar278);
  auVar137._0_4_ = fVar217 * auVar147._0_4_;
  auVar137._4_4_ = fVar230 * auVar147._4_4_;
  auVar137._8_4_ = fVar232 * auVar147._8_4_;
  auVar137._12_4_ = fVar234 * auVar147._12_4_;
  auVar22._16_4_ = fVar235 * auVar147._16_4_;
  auVar22._0_16_ = auVar137;
  auVar22._20_4_ = fVar236 * auVar147._20_4_;
  auVar22._24_4_ = fVar238 * auVar147._24_4_;
  auVar22._28_4_ = auVar147._28_4_;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = *(ulong *)(prim + lVar133 + 6);
  auVar243 = vpmovsxwd_avx(auVar220);
  auVar208._8_8_ = 0;
  auVar208._0_8_ = *(ulong *)(prim + lVar133 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar208);
  auVar298._16_16_ = auVar204;
  auVar298._0_16_ = auVar243;
  auVar147 = vcvtdq2ps_avx(auVar298);
  auVar147 = vsubps_avx(auVar147,auVar278);
  auVar219._0_4_ = fVar217 * auVar147._0_4_;
  auVar219._4_4_ = fVar230 * auVar147._4_4_;
  auVar219._8_4_ = fVar232 * auVar147._8_4_;
  auVar219._12_4_ = fVar234 * auVar147._12_4_;
  auVar26._16_4_ = fVar235 * auVar147._16_4_;
  auVar26._0_16_ = auVar219;
  auVar26._20_4_ = fVar236 * auVar147._20_4_;
  auVar26._24_4_ = fVar238 * auVar147._24_4_;
  auVar26._28_4_ = auVar23._28_4_ + auVar24._28_4_;
  lVar131 = (ulong)(byte)PVar15 * 0x10;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = *(ulong *)(prim + lVar131 + 6);
  auVar243 = vpmovsxwd_avx(auVar206);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + lVar131 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar8);
  lVar131 = lVar131 + uVar134 * -2;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + lVar131 + 6);
  auVar220 = vpmovsxwd_avx(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + lVar131 + 0xe);
  auVar208 = vpmovsxwd_avx(auVar10);
  auVar279._16_16_ = auVar208;
  auVar279._0_16_ = auVar220;
  auVar147 = vcvtdq2ps_avx(auVar279);
  auVar147 = vsubps_avx(auVar147,auVar178);
  auVar276._0_4_ = fVar256 * auVar147._0_4_;
  auVar276._4_4_ = fVar266 * auVar147._4_4_;
  auVar276._8_4_ = fVar268 * auVar147._8_4_;
  auVar276._12_4_ = fVar270 * auVar147._12_4_;
  auVar23._16_4_ = fVar272 * auVar147._16_4_;
  auVar23._0_16_ = auVar276;
  auVar23._20_4_ = fVar273 * auVar147._20_4_;
  auVar23._24_4_ = fVar274 * auVar147._24_4_;
  auVar23._28_4_ = auVar147._28_4_;
  auVar299._16_16_ = auVar204;
  auVar299._0_16_ = auVar243;
  auVar147 = vcvtdq2ps_avx(auVar299);
  auVar147 = vsubps_avx(auVar147,auVar178);
  auVar174._0_4_ = fVar256 * auVar147._0_4_;
  auVar174._4_4_ = fVar266 * auVar147._4_4_;
  auVar174._8_4_ = fVar268 * auVar147._8_4_;
  auVar174._12_4_ = fVar270 * auVar147._12_4_;
  auVar27._16_4_ = fVar272 * auVar147._16_4_;
  auVar27._0_16_ = auVar174;
  auVar27._20_4_ = fVar273 * auVar147._20_4_;
  auVar27._24_4_ = fVar274 * auVar147._24_4_;
  auVar27._28_4_ = auVar147._28_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar132 + uVar134 + 6);
  auVar243 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar132 + uVar134 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar12);
  auVar262._16_16_ = auVar204;
  auVar262._0_16_ = auVar243;
  auVar147 = vcvtdq2ps_avx(auVar262);
  auVar147 = vsubps_avx(auVar147,auVar212);
  auVar259._0_4_ = fVar241 * auVar147._0_4_;
  auVar259._4_4_ = fVar249 * auVar147._4_4_;
  auVar259._8_4_ = fVar250 * auVar147._8_4_;
  auVar259._12_4_ = fVar251 * auVar147._12_4_;
  auVar28._16_4_ = fVar253 * auVar147._16_4_;
  auVar28._0_16_ = auVar259;
  auVar28._20_4_ = fVar254 * auVar147._20_4_;
  auVar28._24_4_ = fVar255 * auVar147._24_4_;
  auVar28._28_4_ = auVar147._28_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar134 * 0x17 + 6);
  auVar243 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar134 * 0x17 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar14);
  auVar300._16_16_ = auVar204;
  auVar300._0_16_ = auVar243;
  auVar147 = vcvtdq2ps_avx(auVar300);
  auVar147 = vsubps_avx(auVar147,auVar212);
  auVar200._0_4_ = fVar241 * auVar147._0_4_;
  auVar200._4_4_ = fVar249 * auVar147._4_4_;
  auVar200._8_4_ = fVar250 * auVar147._8_4_;
  auVar200._12_4_ = fVar251 * auVar147._12_4_;
  auVar21._16_4_ = fVar253 * auVar147._16_4_;
  auVar21._0_16_ = auVar200;
  auVar21._20_4_ = fVar254 * auVar147._20_4_;
  auVar21._24_4_ = fVar255 * auVar147._24_4_;
  auVar21._28_4_ = auVar147._28_4_;
  auVar243 = vpminsd_avx(auVar22._16_16_,auVar26._16_16_);
  auVar204 = vpminsd_avx(auVar137,auVar219);
  auVar311._16_16_ = auVar243;
  auVar311._0_16_ = auVar204;
  auVar243 = vpminsd_avx(auVar23._16_16_,auVar27._16_16_);
  auVar204 = vpminsd_avx(auVar276,auVar174);
  auVar343._16_16_ = auVar243;
  auVar343._0_16_ = auVar204;
  auVar147 = vmaxps_avx(auVar311,auVar343);
  auVar243 = vpminsd_avx(auVar28._16_16_,auVar21._16_16_);
  auVar204 = vpminsd_avx(auVar259,auVar200);
  auVar354._16_16_ = auVar243;
  auVar354._0_16_ = auVar204;
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar362._4_4_ = uVar7;
  auVar362._0_4_ = uVar7;
  auVar362._8_4_ = uVar7;
  auVar362._12_4_ = uVar7;
  auVar362._16_4_ = uVar7;
  auVar362._20_4_ = uVar7;
  auVar362._24_4_ = uVar7;
  auVar362._28_4_ = uVar7;
  auVar154 = vmaxps_avx(auVar354,auVar362);
  auVar147 = vmaxps_avx(auVar147,auVar154);
  local_80._4_4_ = auVar147._4_4_ * 0.99999964;
  local_80._0_4_ = auVar147._0_4_ * 0.99999964;
  local_80._8_4_ = auVar147._8_4_ * 0.99999964;
  local_80._12_4_ = auVar147._12_4_ * 0.99999964;
  local_80._16_4_ = auVar147._16_4_ * 0.99999964;
  local_80._20_4_ = auVar147._20_4_ * 0.99999964;
  local_80._24_4_ = auVar147._24_4_ * 0.99999964;
  local_80._28_4_ = auVar147._28_4_;
  auVar315 = ZEXT3264(local_80);
  auVar243 = vpmaxsd_avx(auVar22._16_16_,auVar26._16_16_);
  auVar204 = vpmaxsd_avx(auVar137,auVar219);
  auVar142._16_16_ = auVar243;
  auVar142._0_16_ = auVar204;
  auVar243 = vpmaxsd_avx(auVar23._16_16_,auVar27._16_16_);
  auVar204 = vpmaxsd_avx(auVar276,auVar174);
  auVar179._16_16_ = auVar243;
  auVar179._0_16_ = auVar204;
  auVar147 = vminps_avx(auVar142,auVar179);
  auVar243 = vpmaxsd_avx(auVar28._16_16_,auVar21._16_16_);
  auVar204 = vpmaxsd_avx(auVar259,auVar200);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar223._4_4_ = uVar7;
  auVar223._0_4_ = uVar7;
  auVar223._8_4_ = uVar7;
  auVar223._12_4_ = uVar7;
  auVar223._16_4_ = uVar7;
  auVar223._20_4_ = uVar7;
  auVar223._24_4_ = uVar7;
  auVar223._28_4_ = uVar7;
  auVar180._16_16_ = auVar243;
  auVar180._0_16_ = auVar204;
  auVar154 = vminps_avx(auVar180,auVar223);
  auVar147 = vminps_avx(auVar147,auVar154);
  auVar154._4_4_ = auVar147._4_4_ * 1.0000004;
  auVar154._0_4_ = auVar147._0_4_ * 1.0000004;
  auVar154._8_4_ = auVar147._8_4_ * 1.0000004;
  auVar154._12_4_ = auVar147._12_4_ * 1.0000004;
  auVar154._16_4_ = auVar147._16_4_ * 1.0000004;
  auVar154._20_4_ = auVar147._20_4_ * 1.0000004;
  auVar154._24_4_ = auVar147._24_4_ * 1.0000004;
  auVar154._28_4_ = auVar147._28_4_;
  auVar147 = vcmpps_avx(local_80,auVar154,2);
  auVar243 = vpshufd_avx(ZEXT116((byte)PVar15),0);
  auVar181._16_16_ = auVar243;
  auVar181._0_16_ = auVar243;
  auVar154 = vcvtdq2ps_avx(auVar181);
  auVar154 = vcmpps_avx(_DAT_01faff40,auVar154,1);
  auVar147 = vandps_avx(auVar147,auVar154);
  uVar128 = vmovmskps_avx(auVar147);
  if (uVar128 != 0) {
    uVar128 = uVar128 & 0xff;
    local_660[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_660[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_660[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_660[1]._24_8_ = mm_lookupmask_ps._24_8_;
    uVar130 = 1 << ((byte)k & 0x1f);
    local_768 = (undefined1 (*) [32])&local_180;
    local_770 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar130 & 0xf) << 4));
    local_778 = mm_lookupmask_ps + (long)((int)uVar130 >> 4) * 0x10;
    do {
      uVar134 = (ulong)uVar128;
      auVar147 = auVar315._0_32_;
      lVar131 = 0;
      if (uVar134 != 0) {
        for (; (uVar128 >> lVar131 & 1) == 0; lVar131 = lVar131 + 1) {
        }
      }
      uVar134 = uVar134 - 1 & uVar134;
      uVar128 = *(uint *)(prim + 2);
      uVar130 = *(uint *)(prim + lVar131 * 4 + 6);
      pGVar18 = (context->scene->geometries).items[uVar128].ptr;
      uVar132 = (ulong)*(uint *)(*(long *)&pGVar18->field_0x58 +
                                pGVar18[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i * (ulong)uVar130);
      p_Var19 = pGVar18[1].intersectionFilterN;
      lVar131 = *(long *)&pGVar18[1].time_range.upper;
      auVar243 = *(undefined1 (*) [16])(lVar131 + (long)p_Var19 * uVar132);
      auVar204 = *(undefined1 (*) [16])(lVar131 + (uVar132 + 1) * (long)p_Var19);
      auVar220 = *(undefined1 (*) [16])(lVar131 + (uVar132 + 2) * (long)p_Var19);
      lVar133 = 0;
      if (uVar134 != 0) {
        for (; (uVar134 >> lVar133 & 1) == 0; lVar133 = lVar133 + 1) {
        }
      }
      auVar208 = *(undefined1 (*) [16])(lVar131 + (uVar132 + 3) * (long)p_Var19);
      if (((uVar134 != 0) && (uVar132 = uVar134 - 1 & uVar134, uVar132 != 0)) &&
         (lVar131 = 0, uVar132 != 0)) {
        for (; (uVar132 >> lVar131 & 1) == 0; lVar131 = lVar131 + 1) {
        }
      }
      uVar16 = (uint)pGVar18[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar206 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar10 = vinsertps_avx(auVar206,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar9 = vsubps_avx(auVar243,auVar10);
      auVar206 = vshufps_avx(auVar9,auVar9,0);
      auVar8 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      fVar217 = pre->ray_space[k].vx.field_0.m128[0];
      fVar230 = pre->ray_space[k].vx.field_0.m128[1];
      fVar232 = pre->ray_space[k].vx.field_0.m128[2];
      fVar234 = pre->ray_space[k].vx.field_0.m128[3];
      fVar235 = pre->ray_space[k].vy.field_0.m128[0];
      fVar236 = pre->ray_space[k].vy.field_0.m128[1];
      fVar238 = pre->ray_space[k].vy.field_0.m128[2];
      fVar241 = pre->ray_space[k].vy.field_0.m128[3];
      fVar249 = pre->ray_space[k].vz.field_0.m128[0];
      fVar250 = pre->ray_space[k].vz.field_0.m128[1];
      fVar251 = pre->ray_space[k].vz.field_0.m128[2];
      fVar253 = pre->ray_space[k].vz.field_0.m128[3];
      auVar175._0_4_ = auVar206._0_4_ * fVar217 + auVar8._0_4_ * fVar235 + fVar249 * auVar9._0_4_;
      auVar175._4_4_ = auVar206._4_4_ * fVar230 + auVar8._4_4_ * fVar236 + fVar250 * auVar9._4_4_;
      auVar175._8_4_ = auVar206._8_4_ * fVar232 + auVar8._8_4_ * fVar238 + fVar251 * auVar9._8_4_;
      auVar175._12_4_ =
           auVar206._12_4_ * fVar234 + auVar8._12_4_ * fVar241 + fVar253 * auVar9._12_4_;
      auVar206 = vblendps_avx(auVar175,auVar243,8);
      auVar11 = vsubps_avx(auVar204,auVar10);
      auVar8 = vshufps_avx(auVar11,auVar11,0);
      auVar9 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      auVar353._0_4_ = auVar8._0_4_ * fVar217 + auVar9._0_4_ * fVar235 + fVar249 * auVar11._0_4_;
      auVar353._4_4_ = auVar8._4_4_ * fVar230 + auVar9._4_4_ * fVar236 + fVar250 * auVar11._4_4_;
      auVar353._8_4_ = auVar8._8_4_ * fVar232 + auVar9._8_4_ * fVar238 + fVar251 * auVar11._8_4_;
      auVar353._12_4_ = auVar8._12_4_ * fVar234 + auVar9._12_4_ * fVar241 + fVar253 * auVar11._12_4_
      ;
      auVar8 = vblendps_avx(auVar353,auVar204,8);
      auVar12 = vsubps_avx(auVar220,auVar10);
      auVar9 = vshufps_avx(auVar12,auVar12,0);
      auVar11 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar260._0_4_ = auVar9._0_4_ * fVar217 + auVar11._0_4_ * fVar235 + fVar249 * auVar12._0_4_;
      auVar260._4_4_ = auVar9._4_4_ * fVar230 + auVar11._4_4_ * fVar236 + fVar250 * auVar12._4_4_;
      auVar260._8_4_ = auVar9._8_4_ * fVar232 + auVar11._8_4_ * fVar238 + fVar251 * auVar12._8_4_;
      auVar260._12_4_ =
           auVar9._12_4_ * fVar234 + auVar11._12_4_ * fVar241 + fVar253 * auVar12._12_4_;
      auVar12 = vshufps_avx(auVar220,auVar220,0xff);
      auVar9 = vblendps_avx(auVar260,auVar220,8);
      auVar13 = vsubps_avx(auVar208,auVar10);
      auVar10 = vshufps_avx(auVar13,auVar13,0);
      auVar11 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar309._0_4_ = auVar10._0_4_ * fVar217 + auVar11._0_4_ * fVar235 + fVar249 * auVar13._0_4_;
      auVar309._4_4_ = auVar10._4_4_ * fVar230 + auVar11._4_4_ * fVar236 + fVar250 * auVar13._4_4_;
      auVar309._8_4_ = auVar10._8_4_ * fVar232 + auVar11._8_4_ * fVar238 + fVar251 * auVar13._8_4_;
      auVar309._12_4_ =
           auVar10._12_4_ * fVar234 + auVar11._12_4_ * fVar241 + fVar253 * auVar13._12_4_;
      auVar13 = vshufps_avx(auVar208,auVar208,0xff);
      auVar10 = vblendps_avx(auVar309,auVar208,8);
      auVar242._8_4_ = 0x7fffffff;
      auVar242._0_8_ = 0x7fffffff7fffffff;
      auVar242._12_4_ = 0x7fffffff;
      auVar206 = vandps_avx(auVar206,auVar242);
      auVar8 = vandps_avx(auVar8,auVar242);
      auVar11 = vmaxps_avx(auVar206,auVar8);
      auVar206 = vandps_avx(auVar9,auVar242);
      auVar8 = vandps_avx(auVar10,auVar242);
      auVar206 = vmaxps_avx(auVar206,auVar8);
      auVar206 = vmaxps_avx(auVar11,auVar206);
      auVar8 = vmovshdup_avx(auVar206);
      auVar8 = vmaxss_avx(auVar8,auVar206);
      auVar206 = vshufpd_avx(auVar206,auVar206,1);
      auVar206 = vmaxss_avx(auVar206,auVar8);
      lVar131 = (long)(int)uVar16 * 0x44;
      fVar160 = *(float *)(bezier_basis0 + lVar131 + 0x908);
      fVar162 = *(float *)(bezier_basis0 + lVar131 + 0x90c);
      fVar163 = *(float *)(bezier_basis0 + lVar131 + 0x910);
      fVar165 = *(float *)(bezier_basis0 + lVar131 + 0x914);
      fVar167 = *(float *)(bezier_basis0 + lVar131 + 0x918);
      fVar290 = *(float *)(bezier_basis0 + lVar131 + 0x91c);
      fVar171 = *(float *)(bezier_basis0 + lVar131 + 0x920);
      auVar8 = vshufps_avx(auVar260,auVar260,0);
      register0x00001450 = auVar8;
      _local_6c0 = auVar8;
      auVar9 = vshufps_avx(auVar260,auVar260,0x55);
      register0x00001390 = auVar9;
      _local_680 = auVar9;
      register0x00001490 = auVar12;
      _local_280 = auVar12;
      pauVar3 = (undefined1 (*) [32])(bezier_basis0 + lVar131 + 0xd8c);
      fVar230 = *(float *)*pauVar3;
      fVar232 = *(float *)(bezier_basis0 + lVar131 + 0xd90);
      fVar234 = *(float *)(bezier_basis0 + lVar131 + 0xd94);
      fVar236 = *(float *)(bezier_basis0 + lVar131 + 0xd98);
      fVar238 = *(float *)(bezier_basis0 + lVar131 + 0xd9c);
      fVar241 = *(float *)(bezier_basis0 + lVar131 + 0xda0);
      fVar250 = *(float *)(bezier_basis0 + lVar131 + 0xda4);
      auVar119 = *(undefined1 (*) [28])*pauVar3;
      _auStack_730 = SUB3216(*pauVar3,0x10);
      auVar10 = vshufps_avx(auVar309,auVar309,0);
      register0x00001310 = auVar10;
      _local_540 = auVar10;
      auVar11 = vshufps_avx(auVar309,auVar309,0x55);
      register0x000015d0 = auVar11;
      _local_6a0 = auVar11;
      register0x000013d0 = auVar13;
      _local_2c0 = auVar13;
      fVar237 = auVar10._0_4_;
      fVar239 = auVar10._4_4_;
      fVar307 = auVar10._8_4_;
      fVar252 = auVar10._12_4_;
      fVar367 = auVar11._0_4_;
      fVar371 = auVar11._4_4_;
      fVar372 = auVar11._8_4_;
      fVar373 = auVar11._12_4_;
      fVar318 = auVar8._0_4_;
      fVar325 = auVar8._4_4_;
      fVar327 = auVar8._8_4_;
      fVar329 = auVar8._12_4_;
      fVar275 = auVar9._0_4_;
      fVar286 = auVar9._4_4_;
      fVar287 = auVar9._8_4_;
      fVar289 = auVar9._12_4_;
      fVar294 = auVar13._0_4_;
      fVar303 = auVar13._4_4_;
      fVar304 = auVar13._8_4_;
      fVar305 = auVar13._12_4_;
      fVar330 = auVar12._0_4_;
      fVar336 = auVar12._4_4_;
      fVar338 = auVar12._8_4_;
      auVar8 = vshufps_avx(auVar353,auVar353,0);
      register0x00001350 = auVar8;
      _local_440 = auVar8;
      fVar251 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar131 + 0x484);
      fVar253 = *(float *)(bezier_basis0 + lVar131 + 0x488);
      fVar255 = *(float *)(bezier_basis0 + lVar131 + 0x48c);
      fVar256 = *(float *)(bezier_basis0 + lVar131 + 0x490);
      fVar266 = *(float *)(bezier_basis0 + lVar131 + 0x494);
      fVar268 = *(float *)(bezier_basis0 + lVar131 + 0x498);
      fVar270 = *(float *)(bezier_basis0 + lVar131 + 0x49c);
      auVar120 = *(undefined1 (*) [28])(bezier_basis0 + lVar131 + 0x484);
      fVar272 = *(float *)(bezier_basis0 + lVar131 + 0x4a0);
      fVar257 = auVar8._0_4_;
      fVar267 = auVar8._4_4_;
      fVar269 = auVar8._8_4_;
      fVar271 = auVar8._12_4_;
      auVar8 = vshufps_avx(auVar353,auVar353,0x55);
      register0x00001550 = auVar8;
      _local_520 = auVar8;
      fVar352 = auVar8._0_4_;
      fVar358 = auVar8._4_4_;
      fVar359 = auVar8._8_4_;
      fVar360 = auVar8._12_4_;
      auVar8 = vshufps_avx(auVar204,auVar204,0xff);
      register0x00001590 = auVar8;
      _local_a0 = auVar8;
      fVar361 = auVar8._0_4_;
      fVar364 = auVar8._4_4_;
      fVar365 = auVar8._8_4_;
      fVar366 = auVar8._12_4_;
      fVar216 = *(float *)(bezier_basis0 + lVar131 + 0x924) + 0.0 + 0.0;
      auVar8 = vshufps_avx(auVar175,auVar175,0);
      register0x00001210 = auVar8;
      _local_2a0 = auVar8;
      fVar273 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar131);
      fVar274 = *(float *)(bezier_basis0 + lVar131 + 4);
      fVar341 = *(float *)(bezier_basis0 + lVar131 + 8);
      fVar308 = *(float *)(bezier_basis0 + lVar131 + 0xc);
      fVar288 = *(float *)(bezier_basis0 + lVar131 + 0x10);
      fVar136 = *(float *)(bezier_basis0 + lVar131 + 0x14);
      fVar306 = *(float *)(bezier_basis0 + lVar131 + 0x18);
      auVar121 = *(undefined1 (*) [28])(bezier_basis0 + lVar131);
      fVar217 = auVar8._0_4_;
      fVar235 = auVar8._4_4_;
      fVar249 = auVar8._8_4_;
      fVar254 = auVar8._12_4_;
      auVar347._0_4_ = fVar273 * fVar217 + fVar257 * fVar251 + fVar318 * fVar160 + fVar237 * fVar230
      ;
      auVar347._4_4_ = fVar274 * fVar235 + fVar267 * fVar253 + fVar325 * fVar162 + fVar239 * fVar232
      ;
      auVar347._8_4_ = fVar341 * fVar249 + fVar269 * fVar255 + fVar327 * fVar163 + fVar307 * fVar234
      ;
      auVar347._12_4_ =
           fVar308 * fVar254 + fVar271 * fVar256 + fVar329 * fVar165 + fVar252 * fVar236;
      auVar347._16_4_ =
           fVar288 * fVar217 + fVar257 * fVar266 + fVar318 * fVar167 + fVar237 * fVar238;
      auVar347._20_4_ =
           fVar136 * fVar235 + fVar267 * fVar268 + fVar325 * fVar290 + fVar239 * fVar241;
      auVar347._24_4_ =
           fVar306 * fVar249 + fVar269 * fVar270 + fVar327 * fVar171 + fVar307 * fVar250;
      auVar347._28_4_ = fVar272 + 0.0;
      auVar8 = vshufps_avx(auVar175,auVar175,0x55);
      register0x00001490 = auVar8;
      _local_460 = auVar8;
      fVar331 = auVar8._0_4_;
      fVar337 = auVar8._4_4_;
      fVar339 = auVar8._8_4_;
      fVar340 = auVar8._12_4_;
      auVar312._0_4_ = fVar331 * fVar273 + fVar352 * fVar251 + fVar275 * fVar160 + fVar367 * fVar230
      ;
      auVar312._4_4_ = fVar337 * fVar274 + fVar358 * fVar253 + fVar286 * fVar162 + fVar371 * fVar232
      ;
      auVar312._8_4_ = fVar339 * fVar341 + fVar359 * fVar255 + fVar287 * fVar163 + fVar372 * fVar234
      ;
      auVar312._12_4_ =
           fVar340 * fVar308 + fVar360 * fVar256 + fVar289 * fVar165 + fVar373 * fVar236;
      auVar312._16_4_ =
           fVar331 * fVar288 + fVar352 * fVar266 + fVar275 * fVar167 + fVar367 * fVar238;
      auVar312._20_4_ =
           fVar337 * fVar136 + fVar358 * fVar268 + fVar286 * fVar290 + fVar371 * fVar241;
      auVar312._24_4_ =
           fVar339 * fVar306 + fVar359 * fVar270 + fVar287 * fVar171 + fVar372 * fVar250;
      auVar312._28_4_ = 0;
      auVar8 = vpermilps_avx(auVar243,0xff);
      register0x00001450 = auVar8;
      _local_2e0 = auVar8;
      fVar319 = auVar8._0_4_;
      fVar326 = auVar8._4_4_;
      fVar328 = auVar8._8_4_;
      fVar172 = fVar319 * fVar273 + fVar361 * fVar251 + fVar330 * fVar160 + fVar294 * fVar230;
      fVar191 = fVar326 * fVar274 + fVar364 * fVar253 + fVar336 * fVar162 + fVar303 * fVar232;
      fVar192 = fVar328 * fVar341 + fVar365 * fVar255 + fVar338 * fVar163 + fVar304 * fVar234;
      fVar193 = auVar8._12_4_ * fVar308 +
                fVar366 * fVar256 + auVar12._12_4_ * fVar165 + fVar305 * fVar236;
      fVar194 = fVar319 * fVar288 + fVar361 * fVar266 + fVar330 * fVar167 + fVar294 * fVar238;
      fVar195 = fVar326 * fVar136 + fVar364 * fVar268 + fVar336 * fVar290 + fVar303 * fVar241;
      fVar196 = fVar328 * fVar306 + fVar365 * fVar270 + fVar338 * fVar171 + fVar304 * fVar250;
      fVar197 = fVar216 + 0.0;
      fVar306 = *(float *)(bezier_basis1 + lVar131 + 0x908);
      fVar316 = *(float *)(bezier_basis1 + lVar131 + 0x90c);
      fVar317 = *(float *)(bezier_basis1 + lVar131 + 0x910);
      fVar240 = *(float *)(bezier_basis1 + lVar131 + 0x914);
      fVar170 = *(float *)(bezier_basis1 + lVar131 + 0x918);
      fVar199 = *(float *)(bezier_basis1 + lVar131 + 0x91c);
      fVar293 = *(float *)(bezier_basis1 + lVar131 + 0x920);
      fVar161 = *(float *)(bezier_basis1 + lVar131 + 0xd8c);
      fVar198 = *(float *)(bezier_basis1 + lVar131 + 0xd90);
      fVar164 = *(float *)(bezier_basis1 + lVar131 + 0xd94);
      fVar292 = *(float *)(bezier_basis1 + lVar131 + 0xd98);
      fVar166 = *(float *)(bezier_basis1 + lVar131 + 0xd9c);
      fVar291 = *(float *)(bezier_basis1 + lVar131 + 0xda0);
      fVar168 = *(float *)(bezier_basis1 + lVar131 + 0xda4);
      auVar154 = *(undefined1 (*) [32])(bezier_basis1 + lVar131 + 0x484);
      auVar285 = ZEXT3264(auVar154);
      fVar230 = auVar154._0_4_;
      fVar236 = auVar154._4_4_;
      fVar250 = auVar154._8_4_;
      fVar255 = auVar154._12_4_;
      fVar268 = auVar154._16_4_;
      fVar273 = auVar154._20_4_;
      fVar308 = auVar154._24_4_;
      fVar234 = fVar360 + fVar216 + 0.0;
      fVar216 = *(float *)(bezier_basis1 + lVar131);
      fVar169 = *(float *)(bezier_basis1 + lVar131 + 4);
      fVar218 = *(float *)(bezier_basis1 + lVar131 + 8);
      fVar231 = *(float *)(bezier_basis1 + lVar131 + 0xc);
      fVar233 = *(float *)(bezier_basis1 + lVar131 + 0x10);
      fVar135 = *(float *)(bezier_basis1 + lVar131 + 0x14);
      fVar159 = *(float *)(bezier_basis1 + lVar131 + 0x18);
      auVar244._0_4_ = fVar217 * fVar216 + fVar257 * fVar230 + fVar306 * fVar318 + fVar161 * fVar237
      ;
      auVar244._4_4_ = fVar235 * fVar169 + fVar267 * fVar236 + fVar316 * fVar325 + fVar198 * fVar239
      ;
      auVar244._8_4_ = fVar249 * fVar218 + fVar269 * fVar250 + fVar317 * fVar327 + fVar164 * fVar307
      ;
      auVar244._12_4_ =
           fVar254 * fVar231 + fVar271 * fVar255 + fVar240 * fVar329 + fVar292 * fVar252;
      auVar244._16_4_ =
           fVar217 * fVar233 + fVar257 * fVar268 + fVar170 * fVar318 + fVar166 * fVar237;
      auVar244._20_4_ =
           fVar235 * fVar135 + fVar267 * fVar273 + fVar199 * fVar325 + fVar291 * fVar239;
      auVar244._24_4_ =
           fVar249 * fVar159 + fVar269 * fVar308 + fVar293 * fVar327 + fVar168 * fVar307;
      auVar244._28_4_ = fVar366 + fVar234;
      auVar224._0_4_ = fVar331 * fVar216 + fVar352 * fVar230 + fVar306 * fVar275 + fVar367 * fVar161
      ;
      auVar224._4_4_ = fVar337 * fVar169 + fVar358 * fVar236 + fVar316 * fVar286 + fVar371 * fVar198
      ;
      auVar224._8_4_ = fVar339 * fVar218 + fVar359 * fVar250 + fVar317 * fVar287 + fVar372 * fVar164
      ;
      auVar224._12_4_ =
           fVar340 * fVar231 + fVar360 * fVar255 + fVar240 * fVar289 + fVar373 * fVar292;
      auVar224._16_4_ =
           fVar331 * fVar233 + fVar352 * fVar268 + fVar170 * fVar275 + fVar367 * fVar166;
      auVar224._20_4_ =
           fVar337 * fVar135 + fVar358 * fVar273 + fVar199 * fVar286 + fVar371 * fVar291;
      auVar224._24_4_ =
           fVar339 * fVar159 + fVar359 * fVar308 + fVar293 * fVar287 + fVar372 * fVar168;
      auVar224._28_4_ = fVar234 + fVar360 + fVar272 + 0.0;
      auVar263._0_4_ = fVar361 * fVar230 + fVar306 * fVar330 + fVar161 * fVar294 + fVar319 * fVar216
      ;
      auVar263._4_4_ = fVar364 * fVar236 + fVar316 * fVar336 + fVar198 * fVar303 + fVar326 * fVar169
      ;
      auVar263._8_4_ = fVar365 * fVar250 + fVar317 * fVar338 + fVar164 * fVar304 + fVar328 * fVar218
      ;
      auVar263._12_4_ =
           fVar366 * fVar255 + fVar240 * auVar12._12_4_ + fVar292 * fVar305 +
           auVar8._12_4_ * fVar231;
      auVar263._16_4_ =
           fVar361 * fVar268 + fVar170 * fVar330 + fVar166 * fVar294 + fVar319 * fVar233;
      auVar263._20_4_ =
           fVar364 * fVar273 + fVar199 * fVar336 + fVar291 * fVar303 + fVar326 * fVar135;
      auVar263._24_4_ =
           fVar365 * fVar308 + fVar293 * fVar338 + fVar168 * fVar304 + fVar328 * fVar159;
      auVar263._28_4_ = fVar360 + fVar305 + fVar272 + fVar234;
      auVar24 = vsubps_avx(auVar244,auVar347);
      auVar370 = vsubps_avx(auVar224,auVar312);
      fVar232 = auVar24._0_4_;
      fVar238 = auVar24._4_4_;
      auVar29._4_4_ = auVar312._4_4_ * fVar238;
      auVar29._0_4_ = auVar312._0_4_ * fVar232;
      fVar251 = auVar24._8_4_;
      auVar29._8_4_ = auVar312._8_4_ * fVar251;
      fVar256 = auVar24._12_4_;
      auVar29._12_4_ = auVar312._12_4_ * fVar256;
      fVar270 = auVar24._16_4_;
      auVar29._16_4_ = auVar312._16_4_ * fVar270;
      fVar274 = auVar24._20_4_;
      auVar29._20_4_ = auVar312._20_4_ * fVar274;
      fVar288 = auVar24._24_4_;
      auVar29._24_4_ = auVar312._24_4_ * fVar288;
      auVar29._28_4_ = fVar234;
      fVar234 = auVar370._0_4_;
      fVar241 = auVar370._4_4_;
      auVar30._4_4_ = auVar347._4_4_ * fVar241;
      auVar30._0_4_ = auVar347._0_4_ * fVar234;
      fVar253 = auVar370._8_4_;
      auVar30._8_4_ = auVar347._8_4_ * fVar253;
      fVar266 = auVar370._12_4_;
      auVar30._12_4_ = auVar347._12_4_ * fVar266;
      fVar272 = auVar370._16_4_;
      auVar30._16_4_ = auVar347._16_4_ * fVar272;
      fVar341 = auVar370._20_4_;
      auVar30._20_4_ = auVar347._20_4_ * fVar341;
      fVar136 = auVar370._24_4_;
      auVar30._24_4_ = auVar347._24_4_ * fVar136;
      auVar30._28_4_ = auVar224._28_4_;
      auVar23 = vsubps_avx(auVar29,auVar30);
      auVar114._4_4_ = fVar191;
      auVar114._0_4_ = fVar172;
      auVar114._8_4_ = fVar192;
      auVar114._12_4_ = fVar193;
      auVar114._16_4_ = fVar194;
      auVar114._20_4_ = fVar195;
      auVar114._24_4_ = fVar196;
      auVar114._28_4_ = fVar197;
      auVar22 = vmaxps_avx(auVar114,auVar263);
      auVar31._4_4_ = auVar22._4_4_ * auVar22._4_4_ * (fVar238 * fVar238 + fVar241 * fVar241);
      auVar31._0_4_ = auVar22._0_4_ * auVar22._0_4_ * (fVar232 * fVar232 + fVar234 * fVar234);
      auVar31._8_4_ = auVar22._8_4_ * auVar22._8_4_ * (fVar251 * fVar251 + fVar253 * fVar253);
      auVar31._12_4_ = auVar22._12_4_ * auVar22._12_4_ * (fVar256 * fVar256 + fVar266 * fVar266);
      auVar31._16_4_ = auVar22._16_4_ * auVar22._16_4_ * (fVar270 * fVar270 + fVar272 * fVar272);
      auVar31._20_4_ = auVar22._20_4_ * auVar22._20_4_ * (fVar274 * fVar274 + fVar341 * fVar341);
      auVar31._24_4_ = auVar22._24_4_ * auVar22._24_4_ * (fVar288 * fVar288 + fVar136 * fVar136);
      auVar31._28_4_ = auVar370._28_4_ + auVar224._28_4_;
      auVar32._4_4_ = auVar23._4_4_ * auVar23._4_4_;
      auVar32._0_4_ = auVar23._0_4_ * auVar23._0_4_;
      auVar32._8_4_ = auVar23._8_4_ * auVar23._8_4_;
      auVar32._12_4_ = auVar23._12_4_ * auVar23._12_4_;
      auVar32._16_4_ = auVar23._16_4_ * auVar23._16_4_;
      auVar32._20_4_ = auVar23._20_4_ * auVar23._20_4_;
      auVar32._24_4_ = auVar23._24_4_ * auVar23._24_4_;
      auVar32._28_4_ = auVar23._28_4_;
      auVar22 = vcmpps_avx(auVar32,auVar31,2);
      local_560 = (float)(int)uVar16;
      fStack_55c = 0.0;
      fStack_558 = 0.0;
      fStack_554 = 0.0;
      auVar8 = vshufps_avx(ZEXT416((uint)local_560),ZEXT416((uint)local_560),0);
      auVar225._16_16_ = auVar8;
      auVar225._0_16_ = auVar8;
      auVar23 = vcmpps_avx(_DAT_01faff40,auVar225,1);
      auVar229 = ZEXT3264(auVar23);
      auVar8 = vpermilps_avx(auVar175,0xaa);
      register0x00001450 = auVar8;
      _local_600 = auVar8;
      auVar9 = vpermilps_avx(auVar353,0xaa);
      register0x00001550 = auVar9;
      _local_580 = auVar9;
      auVar10 = vpermilps_avx(auVar260,0xaa);
      register0x00001590 = auVar10;
      _local_c0 = auVar10;
      auVar11 = vpermilps_avx(auVar309,0xaa);
      auVar25 = auVar23 & auVar22;
      local_760._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x60));
      auVar206 = ZEXT416((uint)(auVar206._0_4_ * 4.7683716e-07));
      local_800._0_16_ = auVar206;
      local_900._0_4_ = auVar243._0_4_;
      fVar251 = (float)local_900;
      local_900._4_4_ = auVar243._4_4_;
      fVar253 = local_900._4_4_;
      uStack_8f8._0_4_ = auVar243._8_4_;
      fVar256 = (float)uStack_8f8;
      uStack_8f8._4_4_ = auVar243._12_4_;
      fVar266 = uStack_8f8._4_4_;
      local_900 = auVar243._0_8_;
      uStack_8f8 = auVar243._8_8_;
      local_8d0 = auVar220._0_4_;
      fStack_8cc = auVar220._4_4_;
      fStack_8c8 = auVar220._8_4_;
      fStack_8c4 = auVar220._12_4_;
      local_390 = auVar220._0_8_;
      uVar124 = local_390;
      uStack_388 = auVar220._8_8_;
      uVar125 = uStack_388;
      local_8e0 = auVar208._0_4_;
      fStack_8dc = auVar208._4_4_;
      fStack_8d8 = auVar208._8_4_;
      fStack_8d4 = auVar208._12_4_;
      local_380 = auVar208._0_8_;
      uVar126 = local_380;
      uStack_378 = auVar208._8_8_;
      uVar127 = uStack_378;
      local_930 = auVar204._0_4_;
      fStack_92c = auVar204._4_4_;
      fStack_928 = auVar204._8_4_;
      fStack_924 = auVar204._12_4_;
      fVar232 = auVar11._0_4_;
      fVar234 = auVar11._4_4_;
      fVar238 = auVar11._8_4_;
      fVar241 = auVar11._12_4_;
      if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar25 >> 0x7f,0) == '\0') &&
            (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar25 >> 0xbf,0) == '\0') &&
          (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar25[0x1f])
      {
        auVar315 = ZEXT3264(auVar147);
      }
      else {
        local_480 = vandps_avx(auVar22,auVar23);
        fVar294 = auVar8._0_4_;
        fVar303 = auVar8._4_4_;
        fVar304 = auVar8._8_4_;
        fVar305 = auVar8._12_4_;
        fVar319 = auVar9._0_4_;
        fVar326 = auVar9._4_4_;
        fVar328 = auVar9._8_4_;
        fVar330 = auVar9._12_4_;
        fVar336 = auVar10._0_4_;
        fVar338 = auVar10._4_4_;
        fVar361 = auVar10._8_4_;
        fVar364 = auVar10._12_4_;
        local_4a0._0_4_ =
             fVar294 * fVar216 + fVar319 * fVar230 + fVar336 * fVar306 + fVar161 * fVar232;
        local_4a0._4_4_ =
             fVar303 * fVar169 + fVar326 * fVar236 + fVar338 * fVar316 + fVar198 * fVar234;
        fStack_498 = fVar304 * fVar218 + fVar328 * fVar250 + fVar361 * fVar317 + fVar164 * fVar238;
        fStack_494 = fVar305 * fVar231 + fVar330 * fVar255 + fVar364 * fVar240 + fVar292 * fVar241;
        fStack_490 = fVar294 * fVar233 + fVar319 * fVar268 + fVar336 * fVar170 + fVar166 * fVar232;
        fStack_48c = fVar303 * fVar135 + fVar326 * fVar273 + fVar338 * fVar199 + fVar291 * fVar234;
        fStack_488 = fVar304 * fVar159 + fVar328 * fVar308 + fVar361 * fVar293 + fVar168 * fVar238;
        fStack_484 = local_480._28_4_ +
                     auVar23._28_4_ + *(float *)(bezier_basis1 + lVar131 + 0x924) + 0.0;
        local_5c0._0_4_ = auVar121._0_4_;
        local_5c0._4_4_ = auVar121._4_4_;
        fStack_5b8 = auVar121._8_4_;
        fStack_5b4 = auVar121._12_4_;
        fStack_5b0 = auVar121._16_4_;
        fStack_5ac = auVar121._20_4_;
        fStack_5a8 = auVar121._24_4_;
        local_5a0._0_4_ = auVar120._0_4_;
        local_5a0._4_4_ = auVar120._4_4_;
        fStack_598 = auVar120._8_4_;
        fStack_594 = auVar120._12_4_;
        fStack_590 = auVar120._16_4_;
        fStack_58c = auVar120._20_4_;
        fStack_588 = auVar120._24_4_;
        local_740._0_4_ = auVar119._0_4_;
        local_740._4_4_ = auVar119._4_4_;
        uStack_738._0_4_ = auVar119._8_4_;
        uStack_738._4_4_ = auVar119._12_4_;
        auStack_730._0_4_ = auVar119._16_4_;
        auStack_730._4_4_ = auVar119._20_4_;
        uStack_728._0_4_ = auVar119._24_4_;
        local_720 = fVar294 * (float)local_5c0._0_4_ +
                    fVar319 * (float)local_5a0._0_4_ +
                    fVar336 * fVar160 + fVar232 * (float)local_740._0_4_;
        fStack_71c = fVar303 * (float)local_5c0._4_4_ +
                     fVar326 * (float)local_5a0._4_4_ +
                     fVar338 * fVar162 + fVar234 * (float)local_740._4_4_;
        fStack_718 = fVar304 * fStack_5b8 +
                     fVar328 * fStack_598 + fVar361 * fVar163 + fVar238 * (float)uStack_738;
        fStack_714 = fVar305 * fStack_5b4 +
                     fVar330 * fStack_594 + fVar364 * fVar165 + fVar241 * uStack_738._4_4_;
        fVar164 = fVar294 * fStack_5b0 +
                  fVar319 * fStack_590 + fVar336 * fVar167 + fVar232 * (float)auStack_730._0_4_;
        fVar166 = fVar303 * fStack_5ac +
                  fVar326 * fStack_58c + fVar338 * fVar290 + fVar234 * (float)auStack_730._4_4_;
        fVar168 = fVar304 * fStack_5a8 +
                  fVar328 * fStack_588 + fVar361 * fVar171 + fVar238 * (float)uStack_728;
        fVar169 = fVar340 + fStack_484 + local_480._28_4_ + auVar23._28_4_;
        fVar230 = *(float *)(bezier_basis0 + lVar131 + 0x1210);
        fVar236 = *(float *)(bezier_basis0 + lVar131 + 0x1214);
        fVar250 = *(float *)(bezier_basis0 + lVar131 + 0x1218);
        fVar255 = *(float *)(bezier_basis0 + lVar131 + 0x121c);
        fVar268 = *(float *)(bezier_basis0 + lVar131 + 0x1220);
        fVar270 = *(float *)(bezier_basis0 + lVar131 + 0x1224);
        fVar272 = *(float *)(bezier_basis0 + lVar131 + 0x1228);
        fVar273 = *(float *)(bezier_basis0 + lVar131 + 0x1694);
        fVar274 = *(float *)(bezier_basis0 + lVar131 + 0x1698);
        fVar341 = *(float *)(bezier_basis0 + lVar131 + 0x169c);
        fVar308 = *(float *)(bezier_basis0 + lVar131 + 0x16a0);
        fVar288 = *(float *)(bezier_basis0 + lVar131 + 0x16a4);
        fVar136 = *(float *)(bezier_basis0 + lVar131 + 0x16a8);
        fVar160 = *(float *)(bezier_basis0 + lVar131 + 0x16ac);
        fVar162 = *(float *)(bezier_basis0 + lVar131 + 0x1b18);
        fVar163 = *(float *)(bezier_basis0 + lVar131 + 0x1b1c);
        fVar165 = *(float *)(bezier_basis0 + lVar131 + 0x1b20);
        fVar167 = *(float *)(bezier_basis0 + lVar131 + 0x1b24);
        fVar290 = *(float *)(bezier_basis0 + lVar131 + 0x1b28);
        fVar171 = *(float *)(bezier_basis0 + lVar131 + 0x1b2c);
        fVar306 = *(float *)(bezier_basis0 + lVar131 + 0x1b30);
        fVar316 = *(float *)(bezier_basis0 + lVar131 + 0x1f9c);
        fVar317 = *(float *)(bezier_basis0 + lVar131 + 0x1fa0);
        fVar240 = *(float *)(bezier_basis0 + lVar131 + 0x1fa4);
        fVar170 = *(float *)(bezier_basis0 + lVar131 + 0x1fa8);
        fVar199 = *(float *)(bezier_basis0 + lVar131 + 0x1fac);
        fVar293 = *(float *)(bezier_basis0 + lVar131 + 0x1fb0);
        fVar161 = *(float *)(bezier_basis0 + lVar131 + 0x1fb4);
        fVar292 = fVar305 + auVar154._28_4_;
        fVar198 = *(float *)(bezier_basis0 + lVar131 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar131 + 0x1fb8);
        fVar291 = *(float *)(bezier_basis0 + lVar131 + 0x16b0) + fVar198;
        local_5a0._4_4_ =
             fVar235 * fVar236 + fVar267 * fVar274 + fVar325 * fVar163 + fVar239 * fVar317;
        local_5a0._0_4_ =
             fVar217 * fVar230 + fVar257 * fVar273 + fVar318 * fVar162 + fVar237 * fVar316;
        fStack_598 = fVar249 * fVar250 + fVar269 * fVar341 + fVar327 * fVar165 + fVar307 * fVar240;
        fStack_594 = fVar254 * fVar255 + fVar271 * fVar308 + fVar329 * fVar167 + fVar252 * fVar170;
        fStack_590 = fVar217 * fVar268 + fVar257 * fVar288 + fVar318 * fVar290 + fVar237 * fVar199;
        fStack_58c = fVar235 * fVar270 + fVar267 * fVar136 + fVar325 * fVar171 + fVar239 * fVar293;
        fStack_588 = fVar249 * fVar272 + fVar269 * fVar160 + fVar327 * fVar306 + fVar307 * fVar161;
        fStack_584 = *(float *)(bezier_basis0 + lVar131 + 0x16b0) +
                     *(float *)(bezier_basis0 + lVar131 + 0x1fb8) + fVar292;
        auVar280._0_4_ =
             fVar331 * fVar230 + fVar352 * fVar273 + fVar275 * fVar162 + fVar367 * fVar316;
        auVar280._4_4_ =
             fVar337 * fVar236 + fVar358 * fVar274 + fVar286 * fVar163 + fVar371 * fVar317;
        auVar280._8_4_ =
             fVar339 * fVar250 + fVar359 * fVar341 + fVar287 * fVar165 + fVar372 * fVar240;
        auVar280._12_4_ =
             fVar340 * fVar255 + fVar360 * fVar308 + fVar289 * fVar167 + fVar373 * fVar170;
        auVar280._16_4_ =
             fVar331 * fVar268 + fVar352 * fVar288 + fVar275 * fVar290 + fVar367 * fVar199;
        auVar280._20_4_ =
             fVar337 * fVar270 + fVar358 * fVar136 + fVar286 * fVar171 + fVar371 * fVar293;
        auVar280._24_4_ =
             fVar339 * fVar272 + fVar359 * fVar160 + fVar287 * fVar306 + fVar372 * fVar161;
        auVar280._28_4_ = fVar198 + fVar292 + fVar305 + *(float *)(bezier_basis1 + lVar131 + 0x1c);
        local_5c0._4_4_ =
             fVar303 * fVar236 + fVar326 * fVar274 + fVar338 * fVar163 + fVar234 * fVar317;
        local_5c0._0_4_ =
             fVar294 * fVar230 + fVar319 * fVar273 + fVar336 * fVar162 + fVar232 * fVar316;
        fStack_5b8 = fVar304 * fVar250 + fVar328 * fVar341 + fVar361 * fVar165 + fVar238 * fVar240;
        fStack_5b4 = fVar305 * fVar255 + fVar330 * fVar308 + fVar364 * fVar167 + fVar241 * fVar170;
        fStack_5b0 = fVar294 * fVar268 + fVar319 * fVar288 + fVar336 * fVar290 + fVar232 * fVar199;
        fStack_5ac = fVar303 * fVar270 + fVar326 * fVar136 + fVar338 * fVar171 + fVar234 * fVar293;
        fStack_5a8 = fVar304 * fVar272 + fVar328 * fVar160 + fVar361 * fVar306 + fVar238 * fVar161;
        fStack_5a4 = *(float *)(bezier_basis0 + lVar131 + 0x122c) + fVar291;
        fVar230 = *(float *)(bezier_basis1 + lVar131 + 0x1b18);
        fVar236 = *(float *)(bezier_basis1 + lVar131 + 0x1b1c);
        fVar250 = *(float *)(bezier_basis1 + lVar131 + 0x1b20);
        fVar255 = *(float *)(bezier_basis1 + lVar131 + 0x1b24);
        fVar268 = *(float *)(bezier_basis1 + lVar131 + 0x1b28);
        fVar270 = *(float *)(bezier_basis1 + lVar131 + 0x1b2c);
        fVar272 = *(float *)(bezier_basis1 + lVar131 + 0x1b30);
        fVar273 = *(float *)(bezier_basis1 + lVar131 + 0x1f9c);
        fVar274 = *(float *)(bezier_basis1 + lVar131 + 0x1fa0);
        fVar341 = *(float *)(bezier_basis1 + lVar131 + 0x1fa4);
        fVar308 = *(float *)(bezier_basis1 + lVar131 + 0x1fa8);
        fVar288 = *(float *)(bezier_basis1 + lVar131 + 0x1fac);
        fVar136 = *(float *)(bezier_basis1 + lVar131 + 0x1fb0);
        fVar160 = *(float *)(bezier_basis1 + lVar131 + 0x1fb4);
        fVar162 = *(float *)(bezier_basis1 + lVar131 + 0x1694);
        fVar163 = *(float *)(bezier_basis1 + lVar131 + 0x1698);
        fVar165 = *(float *)(bezier_basis1 + lVar131 + 0x169c);
        fVar167 = *(float *)(bezier_basis1 + lVar131 + 0x16a0);
        fVar290 = *(float *)(bezier_basis1 + lVar131 + 0x16a4);
        fVar171 = *(float *)(bezier_basis1 + lVar131 + 0x16a8);
        fVar306 = *(float *)(bezier_basis1 + lVar131 + 0x16ac);
        fVar316 = *(float *)(bezier_basis1 + lVar131 + 0x1210);
        fVar317 = *(float *)(bezier_basis1 + lVar131 + 0x1214);
        fVar240 = *(float *)(bezier_basis1 + lVar131 + 0x1218);
        fVar170 = *(float *)(bezier_basis1 + lVar131 + 0x121c);
        fVar199 = *(float *)(bezier_basis1 + lVar131 + 0x1220);
        fVar293 = *(float *)(bezier_basis1 + lVar131 + 0x1224);
        fVar161 = *(float *)(bezier_basis1 + lVar131 + 0x1228);
        auVar301._0_4_ =
             fVar217 * fVar316 + fVar257 * fVar162 + fVar318 * fVar230 + fVar237 * fVar273;
        auVar301._4_4_ =
             fVar235 * fVar317 + fVar267 * fVar163 + fVar325 * fVar236 + fVar239 * fVar274;
        auVar301._8_4_ =
             fVar249 * fVar240 + fVar269 * fVar165 + fVar327 * fVar250 + fVar307 * fVar341;
        auVar301._12_4_ =
             fVar254 * fVar170 + fVar271 * fVar167 + fVar329 * fVar255 + fVar252 * fVar308;
        auVar301._16_4_ =
             fVar217 * fVar199 + fVar257 * fVar290 + fVar318 * fVar268 + fVar237 * fVar288;
        auVar301._20_4_ =
             fVar235 * fVar293 + fVar267 * fVar171 + fVar325 * fVar270 + fVar239 * fVar136;
        auVar301._24_4_ =
             fVar249 * fVar161 + fVar269 * fVar306 + fVar327 * fVar272 + fVar307 * fVar160;
        auVar301._28_4_ = fVar329 + fVar329 + fVar305 + fVar291;
        auVar321._0_4_ =
             fVar331 * fVar316 + fVar352 * fVar162 + fVar275 * fVar230 + fVar367 * fVar273;
        auVar321._4_4_ =
             fVar337 * fVar317 + fVar358 * fVar163 + fVar286 * fVar236 + fVar371 * fVar274;
        auVar321._8_4_ =
             fVar339 * fVar240 + fVar359 * fVar165 + fVar287 * fVar250 + fVar372 * fVar341;
        auVar321._12_4_ =
             fVar340 * fVar170 + fVar360 * fVar167 + fVar289 * fVar255 + fVar373 * fVar308;
        auVar321._16_4_ =
             fVar331 * fVar199 + fVar352 * fVar290 + fVar275 * fVar268 + fVar367 * fVar288;
        auVar321._20_4_ =
             fVar337 * fVar293 + fVar358 * fVar171 + fVar286 * fVar270 + fVar371 * fVar136;
        auVar321._24_4_ =
             fVar339 * fVar161 + fVar359 * fVar306 + fVar287 * fVar272 + fVar372 * fVar160;
        auVar321._28_4_ = fVar329 + fVar329 + fVar329 + fVar305;
        auVar213._0_4_ =
             fVar294 * fVar316 + fVar319 * fVar162 + fVar336 * fVar230 + fVar273 * fVar232;
        auVar213._4_4_ =
             fVar303 * fVar317 + fVar326 * fVar163 + fVar338 * fVar236 + fVar274 * fVar234;
        auVar213._8_4_ =
             fVar304 * fVar240 + fVar328 * fVar165 + fVar361 * fVar250 + fVar341 * fVar238;
        auVar213._12_4_ =
             fVar305 * fVar170 + fVar330 * fVar167 + fVar364 * fVar255 + fVar308 * fVar241;
        auVar213._16_4_ =
             fVar294 * fVar199 + fVar319 * fVar290 + fVar336 * fVar268 + fVar288 * fVar232;
        auVar213._20_4_ =
             fVar303 * fVar293 + fVar326 * fVar171 + fVar338 * fVar270 + fVar136 * fVar234;
        auVar213._24_4_ =
             fVar304 * fVar161 + fVar328 * fVar306 + fVar361 * fVar272 + fVar160 * fVar238;
        auVar213._28_4_ =
             *(float *)(bezier_basis1 + lVar131 + 0x122c) +
             *(float *)(bezier_basis1 + lVar131 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar131 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar131 + 0x1fb8);
        auVar245._8_4_ = 0x7fffffff;
        auVar245._0_8_ = 0x7fffffff7fffffff;
        auVar245._12_4_ = 0x7fffffff;
        auVar245._16_4_ = 0x7fffffff;
        auVar245._20_4_ = 0x7fffffff;
        auVar245._24_4_ = 0x7fffffff;
        auVar245._28_4_ = 0x7fffffff;
        auVar154 = vandps_avx(_local_5a0,auVar245);
        auVar22 = vandps_avx(auVar280,auVar245);
        auVar22 = vmaxps_avx(auVar154,auVar22);
        auVar154 = vandps_avx(auVar245,_local_5c0);
        auVar154 = vmaxps_avx(auVar22,auVar154);
        auVar243 = vpermilps_avx(auVar206,0);
        auVar281._16_16_ = auVar243;
        auVar281._0_16_ = auVar243;
        auVar154 = vcmpps_avx(auVar154,auVar281,1);
        auVar23 = vblendvps_avx(_local_5a0,auVar24,auVar154);
        auVar25 = vblendvps_avx(auVar280,auVar370,auVar154);
        auVar154 = vandps_avx(auVar301,auVar245);
        auVar22 = vandps_avx(auVar321,auVar245);
        auVar26 = vmaxps_avx(auVar154,auVar22);
        auVar154 = vandps_avx(auVar213,auVar245);
        auVar154 = vmaxps_avx(auVar26,auVar154);
        auVar26 = vcmpps_avx(auVar154,auVar281,1);
        auVar154 = vblendvps_avx(auVar301,auVar24,auVar26);
        auVar24 = vblendvps_avx(auVar321,auVar370,auVar26);
        fVar199 = auVar23._0_4_;
        fVar293 = auVar23._4_4_;
        fVar161 = auVar23._8_4_;
        fVar198 = auVar23._12_4_;
        fVar292 = auVar23._16_4_;
        fVar291 = auVar23._20_4_;
        fVar216 = auVar23._24_4_;
        fVar218 = auVar154._0_4_;
        fVar231 = auVar154._4_4_;
        fVar233 = auVar154._8_4_;
        fVar135 = auVar154._12_4_;
        fVar159 = auVar154._16_4_;
        fVar237 = auVar154._20_4_;
        fVar239 = auVar154._24_4_;
        fVar307 = -auVar154._28_4_;
        fVar217 = auVar25._0_4_;
        fVar249 = auVar25._4_4_;
        fVar268 = auVar25._8_4_;
        fVar274 = auVar25._12_4_;
        fVar136 = auVar25._16_4_;
        fVar165 = auVar25._20_4_;
        fVar306 = auVar25._24_4_;
        auVar143._0_4_ = fVar217 * fVar217 + fVar199 * fVar199;
        auVar143._4_4_ = fVar249 * fVar249 + fVar293 * fVar293;
        auVar143._8_4_ = fVar268 * fVar268 + fVar161 * fVar161;
        auVar143._12_4_ = fVar274 * fVar274 + fVar198 * fVar198;
        auVar143._16_4_ = fVar136 * fVar136 + fVar292 * fVar292;
        auVar143._20_4_ = fVar165 * fVar165 + fVar291 * fVar291;
        auVar143._24_4_ = fVar306 * fVar306 + fVar216 * fVar216;
        auVar143._28_4_ = auVar321._28_4_ + auVar23._28_4_;
        auVar23 = vrsqrtps_avx(auVar143);
        fVar230 = auVar23._0_4_;
        fVar235 = auVar23._4_4_;
        auVar33._4_4_ = fVar235 * 1.5;
        auVar33._0_4_ = fVar230 * 1.5;
        fVar236 = auVar23._8_4_;
        auVar33._8_4_ = fVar236 * 1.5;
        fVar250 = auVar23._12_4_;
        auVar33._12_4_ = fVar250 * 1.5;
        fVar254 = auVar23._16_4_;
        auVar33._16_4_ = fVar254 * 1.5;
        fVar255 = auVar23._20_4_;
        auVar33._20_4_ = fVar255 * 1.5;
        fVar270 = auVar23._24_4_;
        fVar170 = auVar22._28_4_;
        auVar33._24_4_ = fVar270 * 1.5;
        auVar33._28_4_ = fVar170;
        auVar34._4_4_ = fVar235 * fVar235 * fVar235 * auVar143._4_4_ * 0.5;
        auVar34._0_4_ = fVar230 * fVar230 * fVar230 * auVar143._0_4_ * 0.5;
        auVar34._8_4_ = fVar236 * fVar236 * fVar236 * auVar143._8_4_ * 0.5;
        auVar34._12_4_ = fVar250 * fVar250 * fVar250 * auVar143._12_4_ * 0.5;
        auVar34._16_4_ = fVar254 * fVar254 * fVar254 * auVar143._16_4_ * 0.5;
        auVar34._20_4_ = fVar255 * fVar255 * fVar255 * auVar143._20_4_ * 0.5;
        auVar34._24_4_ = fVar270 * fVar270 * fVar270 * auVar143._24_4_ * 0.5;
        auVar34._28_4_ = auVar143._28_4_;
        auVar22 = vsubps_avx(auVar33,auVar34);
        fVar230 = auVar22._0_4_;
        fVar250 = auVar22._4_4_;
        fVar270 = auVar22._8_4_;
        fVar341 = auVar22._12_4_;
        fVar160 = auVar22._16_4_;
        fVar167 = auVar22._20_4_;
        fVar316 = auVar22._24_4_;
        fVar235 = auVar24._0_4_;
        fVar254 = auVar24._4_4_;
        fVar272 = auVar24._8_4_;
        fVar308 = auVar24._12_4_;
        fVar162 = auVar24._16_4_;
        fVar290 = auVar24._20_4_;
        fVar317 = auVar24._24_4_;
        auVar144._0_4_ = fVar235 * fVar235 + fVar218 * fVar218;
        auVar144._4_4_ = fVar254 * fVar254 + fVar231 * fVar231;
        auVar144._8_4_ = fVar272 * fVar272 + fVar233 * fVar233;
        auVar144._12_4_ = fVar308 * fVar308 + fVar135 * fVar135;
        auVar144._16_4_ = fVar162 * fVar162 + fVar159 * fVar159;
        auVar144._20_4_ = fVar290 * fVar290 + fVar237 * fVar237;
        auVar144._24_4_ = fVar317 * fVar317 + fVar239 * fVar239;
        auVar144._28_4_ = auVar154._28_4_ + auVar22._28_4_;
        auVar154 = vrsqrtps_avx(auVar144);
        fVar236 = auVar154._0_4_;
        fVar255 = auVar154._4_4_;
        auVar35._4_4_ = fVar255 * 1.5;
        auVar35._0_4_ = fVar236 * 1.5;
        fVar273 = auVar154._8_4_;
        auVar35._8_4_ = fVar273 * 1.5;
        fVar288 = auVar154._12_4_;
        auVar35._12_4_ = fVar288 * 1.5;
        fVar163 = auVar154._16_4_;
        auVar35._16_4_ = fVar163 * 1.5;
        fVar171 = auVar154._20_4_;
        auVar35._20_4_ = fVar171 * 1.5;
        fVar240 = auVar154._24_4_;
        auVar35._24_4_ = fVar240 * 1.5;
        auVar35._28_4_ = fVar170;
        auVar36._4_4_ = fVar255 * fVar255 * fVar255 * auVar144._4_4_ * 0.5;
        auVar36._0_4_ = fVar236 * fVar236 * fVar236 * auVar144._0_4_ * 0.5;
        auVar36._8_4_ = fVar273 * fVar273 * fVar273 * auVar144._8_4_ * 0.5;
        auVar36._12_4_ = fVar288 * fVar288 * fVar288 * auVar144._12_4_ * 0.5;
        auVar36._16_4_ = fVar163 * fVar163 * fVar163 * auVar144._16_4_ * 0.5;
        auVar36._20_4_ = fVar171 * fVar171 * fVar171 * auVar144._20_4_ * 0.5;
        auVar36._24_4_ = fVar240 * fVar240 * fVar240 * auVar144._24_4_ * 0.5;
        auVar36._28_4_ = auVar144._28_4_;
        auVar154 = vsubps_avx(auVar35,auVar36);
        fVar236 = auVar154._0_4_;
        fVar255 = auVar154._4_4_;
        fVar273 = auVar154._8_4_;
        fVar288 = auVar154._12_4_;
        fVar163 = auVar154._16_4_;
        fVar171 = auVar154._20_4_;
        fVar240 = auVar154._24_4_;
        fVar217 = fVar172 * fVar217 * fVar230;
        fVar249 = fVar191 * fVar249 * fVar250;
        auVar37._4_4_ = fVar249;
        auVar37._0_4_ = fVar217;
        fVar268 = fVar192 * fVar268 * fVar270;
        auVar37._8_4_ = fVar268;
        fVar274 = fVar193 * fVar274 * fVar341;
        auVar37._12_4_ = fVar274;
        fVar136 = fVar194 * fVar136 * fVar160;
        auVar37._16_4_ = fVar136;
        fVar165 = fVar195 * fVar165 * fVar167;
        auVar37._20_4_ = fVar165;
        fVar306 = fVar196 * fVar306 * fVar316;
        auVar37._24_4_ = fVar306;
        auVar37._28_4_ = fVar307;
        local_740._4_4_ = auVar347._4_4_ + fVar249;
        local_740._0_4_ = auVar347._0_4_ + fVar217;
        uStack_738._0_4_ = auVar347._8_4_ + fVar268;
        uStack_738._4_4_ = auVar347._12_4_ + fVar274;
        auStack_730._0_4_ = auVar347._16_4_ + fVar136;
        auStack_730._4_4_ = auVar347._20_4_ + fVar165;
        uStack_728._0_4_ = auVar347._24_4_ + fVar306;
        uStack_728._4_4_ = auVar347._28_4_ + fVar307;
        fVar217 = fVar172 * fVar230 * -fVar199;
        fVar249 = fVar191 * fVar250 * -fVar293;
        auVar38._4_4_ = fVar249;
        auVar38._0_4_ = fVar217;
        fVar268 = fVar192 * fVar270 * -fVar161;
        auVar38._8_4_ = fVar268;
        fVar274 = fVar193 * fVar341 * -fVar198;
        auVar38._12_4_ = fVar274;
        fVar136 = fVar194 * fVar160 * -fVar292;
        auVar38._16_4_ = fVar136;
        fVar165 = fVar195 * fVar167 * -fVar291;
        auVar38._20_4_ = fVar165;
        fVar306 = fVar196 * fVar316 * -fVar216;
        auVar38._24_4_ = fVar306;
        auVar38._28_4_ = fVar170;
        local_620._4_4_ = fVar249 + auVar312._4_4_;
        local_620._0_4_ = fVar217 + auVar312._0_4_;
        fStack_618 = fVar268 + auVar312._8_4_;
        fStack_614 = fVar274 + auVar312._12_4_;
        fStack_610 = fVar136 + auVar312._16_4_;
        fStack_60c = fVar165 + auVar312._20_4_;
        fStack_608 = fVar306 + auVar312._24_4_;
        fStack_604 = fVar170 + 0.0;
        fVar217 = fVar172 * fVar230 * 0.0;
        fVar230 = fVar191 * fVar250 * 0.0;
        auVar39._4_4_ = fVar230;
        auVar39._0_4_ = fVar217;
        fVar249 = fVar192 * fVar270 * 0.0;
        auVar39._8_4_ = fVar249;
        fVar250 = fVar193 * fVar341 * 0.0;
        auVar39._12_4_ = fVar250;
        fVar268 = fVar194 * fVar160 * 0.0;
        auVar39._16_4_ = fVar268;
        fVar270 = fVar195 * fVar167 * 0.0;
        auVar39._20_4_ = fVar270;
        fVar274 = fVar196 * fVar316 * 0.0;
        auVar39._24_4_ = fVar274;
        auVar39._28_4_ = fVar271;
        auVar116._4_4_ = fStack_71c;
        auVar116._0_4_ = local_720;
        auVar116._8_4_ = fStack_718;
        auVar116._12_4_ = fStack_714;
        auVar116._16_4_ = fVar164;
        auVar116._20_4_ = fVar166;
        auVar116._24_4_ = fVar168;
        auVar116._28_4_ = fVar169;
        auVar282._0_4_ = fVar217 + local_720;
        auVar282._4_4_ = fVar230 + fStack_71c;
        auVar282._8_4_ = fVar249 + fStack_718;
        auVar282._12_4_ = fVar250 + fStack_714;
        auVar282._16_4_ = fVar268 + fVar164;
        auVar282._20_4_ = fVar270 + fVar166;
        auVar282._24_4_ = fVar274 + fVar168;
        auVar282._28_4_ = fVar271 + fVar169;
        fVar217 = auVar263._0_4_ * fVar235 * fVar236;
        fVar230 = auVar263._4_4_ * fVar254 * fVar255;
        auVar40._4_4_ = fVar230;
        auVar40._0_4_ = fVar217;
        fVar235 = auVar263._8_4_ * fVar272 * fVar273;
        auVar40._8_4_ = fVar235;
        fVar249 = auVar263._12_4_ * fVar308 * fVar288;
        auVar40._12_4_ = fVar249;
        fVar250 = auVar263._16_4_ * fVar162 * fVar163;
        auVar40._16_4_ = fVar250;
        fVar254 = auVar263._20_4_ * fVar290 * fVar171;
        auVar40._20_4_ = fVar254;
        fVar268 = auVar263._24_4_ * fVar317 * fVar240;
        auVar40._24_4_ = fVar268;
        auVar40._28_4_ = auVar24._28_4_;
        auVar26 = vsubps_avx(auVar347,auVar37);
        auVar322._0_4_ = auVar244._0_4_ + fVar217;
        auVar322._4_4_ = auVar244._4_4_ + fVar230;
        auVar322._8_4_ = auVar244._8_4_ + fVar235;
        auVar322._12_4_ = auVar244._12_4_ + fVar249;
        auVar322._16_4_ = auVar244._16_4_ + fVar250;
        auVar322._20_4_ = auVar244._20_4_ + fVar254;
        auVar322._24_4_ = auVar244._24_4_ + fVar268;
        auVar322._28_4_ = auVar244._28_4_ + auVar24._28_4_;
        fVar217 = auVar263._0_4_ * fVar236 * -fVar218;
        fVar230 = auVar263._4_4_ * fVar255 * -fVar231;
        auVar41._4_4_ = fVar230;
        auVar41._0_4_ = fVar217;
        fVar235 = auVar263._8_4_ * fVar273 * -fVar233;
        auVar41._8_4_ = fVar235;
        fVar249 = auVar263._12_4_ * fVar288 * -fVar135;
        auVar41._12_4_ = fVar249;
        fVar250 = auVar263._16_4_ * fVar163 * -fVar159;
        auVar41._16_4_ = fVar250;
        fVar254 = auVar263._20_4_ * fVar171 * -fVar237;
        auVar41._20_4_ = fVar254;
        fVar268 = auVar263._24_4_ * fVar240 * -fVar239;
        auVar41._24_4_ = fVar268;
        auVar41._28_4_ = fVar330;
        auVar27 = vsubps_avx(auVar312,auVar38);
        auVar333._0_4_ = fVar217 + auVar224._0_4_;
        auVar333._4_4_ = fVar230 + auVar224._4_4_;
        auVar333._8_4_ = fVar235 + auVar224._8_4_;
        auVar333._12_4_ = fVar249 + auVar224._12_4_;
        auVar333._16_4_ = fVar250 + auVar224._16_4_;
        auVar333._20_4_ = fVar254 + auVar224._20_4_;
        auVar333._24_4_ = fVar268 + auVar224._24_4_;
        auVar333._28_4_ = fVar330 + auVar224._28_4_;
        fVar217 = auVar263._0_4_ * fVar236 * 0.0;
        fVar230 = auVar263._4_4_ * fVar255 * 0.0;
        auVar42._4_4_ = fVar230;
        auVar42._0_4_ = fVar217;
        fVar235 = auVar263._8_4_ * fVar273 * 0.0;
        auVar42._8_4_ = fVar235;
        fVar236 = auVar263._12_4_ * fVar288 * 0.0;
        auVar42._12_4_ = fVar236;
        fVar249 = auVar263._16_4_ * fVar163 * 0.0;
        auVar42._16_4_ = fVar249;
        fVar250 = auVar263._20_4_ * fVar171 * 0.0;
        auVar42._20_4_ = fVar250;
        fVar254 = auVar263._24_4_ * fVar240 * 0.0;
        auVar42._24_4_ = fVar254;
        auVar42._28_4_ = 0x3f000000;
        auVar28 = vsubps_avx(auVar116,auVar39);
        auVar363._0_4_ = fVar217 + (float)local_4a0._0_4_;
        auVar363._4_4_ = fVar230 + (float)local_4a0._4_4_;
        auVar363._8_4_ = fVar235 + fStack_498;
        auVar363._12_4_ = fVar236 + fStack_494;
        auVar363._16_4_ = fVar249 + fStack_490;
        auVar363._20_4_ = fVar250 + fStack_48c;
        auVar363._24_4_ = fVar254 + fStack_488;
        auVar363._28_4_ = fStack_484 + 0.5;
        auVar154 = vsubps_avx(auVar244,auVar40);
        auVar22 = vsubps_avx(auVar224,auVar41);
        auVar141 = vsubps_avx(_local_4a0,auVar42);
        auVar23 = vsubps_avx(auVar333,auVar27);
        auVar24 = vsubps_avx(auVar363,auVar28);
        auVar43._4_4_ = auVar28._4_4_ * auVar23._4_4_;
        auVar43._0_4_ = auVar28._0_4_ * auVar23._0_4_;
        auVar43._8_4_ = auVar28._8_4_ * auVar23._8_4_;
        auVar43._12_4_ = auVar28._12_4_ * auVar23._12_4_;
        auVar43._16_4_ = auVar28._16_4_ * auVar23._16_4_;
        auVar43._20_4_ = auVar28._20_4_ * auVar23._20_4_;
        auVar43._24_4_ = auVar28._24_4_ * auVar23._24_4_;
        auVar43._28_4_ = fVar252;
        auVar44._4_4_ = auVar27._4_4_ * auVar24._4_4_;
        auVar44._0_4_ = auVar27._0_4_ * auVar24._0_4_;
        auVar44._8_4_ = auVar27._8_4_ * auVar24._8_4_;
        auVar44._12_4_ = auVar27._12_4_ * auVar24._12_4_;
        auVar44._16_4_ = auVar27._16_4_ * auVar24._16_4_;
        auVar44._20_4_ = auVar27._20_4_ * auVar24._20_4_;
        auVar44._24_4_ = auVar27._24_4_ * auVar24._24_4_;
        auVar44._28_4_ = auVar224._28_4_;
        auVar370 = vsubps_avx(auVar44,auVar43);
        auVar45._4_4_ = auVar26._4_4_ * auVar24._4_4_;
        auVar45._0_4_ = auVar26._0_4_ * auVar24._0_4_;
        auVar45._8_4_ = auVar26._8_4_ * auVar24._8_4_;
        auVar45._12_4_ = auVar26._12_4_ * auVar24._12_4_;
        auVar45._16_4_ = auVar26._16_4_ * auVar24._16_4_;
        auVar45._20_4_ = auVar26._20_4_ * auVar24._20_4_;
        auVar45._24_4_ = auVar26._24_4_ * auVar24._24_4_;
        auVar45._28_4_ = auVar24._28_4_;
        auVar25 = vsubps_avx(auVar322,auVar26);
        auVar46._4_4_ = auVar28._4_4_ * auVar25._4_4_;
        auVar46._0_4_ = auVar28._0_4_ * auVar25._0_4_;
        auVar46._8_4_ = auVar28._8_4_ * auVar25._8_4_;
        auVar46._12_4_ = auVar28._12_4_ * auVar25._12_4_;
        auVar46._16_4_ = auVar28._16_4_ * auVar25._16_4_;
        auVar46._20_4_ = auVar28._20_4_ * auVar25._20_4_;
        auVar46._24_4_ = auVar28._24_4_ * auVar25._24_4_;
        auVar46._28_4_ = auVar244._28_4_;
        auVar21 = vsubps_avx(auVar46,auVar45);
        auVar47._4_4_ = auVar25._4_4_ * auVar27._4_4_;
        auVar47._0_4_ = auVar25._0_4_ * auVar27._0_4_;
        auVar47._8_4_ = auVar25._8_4_ * auVar27._8_4_;
        auVar47._12_4_ = auVar25._12_4_ * auVar27._12_4_;
        auVar47._16_4_ = auVar25._16_4_ * auVar27._16_4_;
        auVar47._20_4_ = auVar25._20_4_ * auVar27._20_4_;
        auVar47._24_4_ = auVar25._24_4_ * auVar27._24_4_;
        auVar47._28_4_ = auVar24._28_4_;
        auVar48._4_4_ = auVar26._4_4_ * auVar23._4_4_;
        auVar48._0_4_ = auVar26._0_4_ * auVar23._0_4_;
        auVar48._8_4_ = auVar26._8_4_ * auVar23._8_4_;
        auVar48._12_4_ = auVar26._12_4_ * auVar23._12_4_;
        auVar48._16_4_ = auVar26._16_4_ * auVar23._16_4_;
        auVar48._20_4_ = auVar26._20_4_ * auVar23._20_4_;
        auVar48._24_4_ = auVar26._24_4_ * auVar23._24_4_;
        auVar48._28_4_ = auVar23._28_4_;
        auVar23 = vsubps_avx(auVar48,auVar47);
        auVar145._0_4_ = auVar370._0_4_ * 0.0 + auVar23._0_4_ + auVar21._0_4_ * 0.0;
        auVar145._4_4_ = auVar370._4_4_ * 0.0 + auVar23._4_4_ + auVar21._4_4_ * 0.0;
        auVar145._8_4_ = auVar370._8_4_ * 0.0 + auVar23._8_4_ + auVar21._8_4_ * 0.0;
        auVar145._12_4_ = auVar370._12_4_ * 0.0 + auVar23._12_4_ + auVar21._12_4_ * 0.0;
        auVar145._16_4_ = auVar370._16_4_ * 0.0 + auVar23._16_4_ + auVar21._16_4_ * 0.0;
        auVar145._20_4_ = auVar370._20_4_ * 0.0 + auVar23._20_4_ + auVar21._20_4_ * 0.0;
        auVar145._24_4_ = auVar370._24_4_ * 0.0 + auVar23._24_4_ + auVar21._24_4_ * 0.0;
        auVar145._28_4_ = auVar23._28_4_ + auVar23._28_4_ + auVar21._28_4_;
        auVar21 = vcmpps_avx(auVar145,ZEXT432(0) << 0x20,2);
        auVar154 = vblendvps_avx(auVar154,_local_740,auVar21);
        auVar22 = vblendvps_avx(auVar22,_local_620,auVar21);
        auVar23 = vblendvps_avx(auVar141,auVar282,auVar21);
        auVar285 = ZEXT3264(auVar23);
        auVar24 = vblendvps_avx(auVar26,auVar322,auVar21);
        auVar370 = vblendvps_avx(auVar27,auVar333,auVar21);
        auVar25 = vblendvps_avx(auVar28,auVar363,auVar21);
        auVar26 = vblendvps_avx(auVar322,auVar26,auVar21);
        auVar27 = vblendvps_avx(auVar333,auVar27,auVar21);
        auVar243 = vpackssdw_avx(local_480._0_16_,local_480._16_16_);
        auVar28 = vblendvps_avx(auVar363,auVar28,auVar21);
        auVar26 = vsubps_avx(auVar26,auVar154);
        auVar142 = vsubps_avx(auVar27,auVar22);
        auVar28 = vsubps_avx(auVar28,auVar23);
        auVar178 = vsubps_avx(auVar22,auVar370);
        fVar217 = auVar142._0_4_;
        fVar166 = auVar23._0_4_;
        fVar250 = auVar142._4_4_;
        fVar291 = auVar23._4_4_;
        auVar49._4_4_ = fVar291 * fVar250;
        auVar49._0_4_ = fVar166 * fVar217;
        fVar272 = auVar142._8_4_;
        fVar168 = auVar23._8_4_;
        auVar49._8_4_ = fVar168 * fVar272;
        fVar288 = auVar142._12_4_;
        fVar216 = auVar23._12_4_;
        auVar49._12_4_ = fVar216 * fVar288;
        fVar165 = auVar142._16_4_;
        fVar169 = auVar23._16_4_;
        auVar49._16_4_ = fVar169 * fVar165;
        fVar316 = auVar142._20_4_;
        fVar218 = auVar23._20_4_;
        auVar49._20_4_ = fVar218 * fVar316;
        fVar293 = auVar142._24_4_;
        fVar231 = auVar23._24_4_;
        auVar49._24_4_ = fVar231 * fVar293;
        auVar49._28_4_ = auVar27._28_4_;
        fVar230 = auVar22._0_4_;
        fVar257 = auVar28._0_4_;
        fVar254 = auVar22._4_4_;
        fVar267 = auVar28._4_4_;
        auVar50._4_4_ = fVar267 * fVar254;
        auVar50._0_4_ = fVar257 * fVar230;
        fVar273 = auVar22._8_4_;
        fVar269 = auVar28._8_4_;
        auVar50._8_4_ = fVar269 * fVar273;
        fVar136 = auVar22._12_4_;
        fVar271 = auVar28._12_4_;
        auVar50._12_4_ = fVar271 * fVar136;
        fVar167 = auVar22._16_4_;
        fVar275 = auVar28._16_4_;
        auVar50._16_4_ = fVar275 * fVar167;
        fVar317 = auVar22._20_4_;
        fVar286 = auVar28._20_4_;
        auVar50._20_4_ = fVar286 * fVar317;
        fVar161 = auVar22._24_4_;
        fVar287 = auVar28._24_4_;
        uVar7 = auVar141._28_4_;
        auVar50._24_4_ = fVar287 * fVar161;
        auVar50._28_4_ = uVar7;
        auVar22 = vsubps_avx(auVar50,auVar49);
        fVar235 = auVar154._0_4_;
        fVar255 = auVar154._4_4_;
        auVar51._4_4_ = fVar267 * fVar255;
        auVar51._0_4_ = fVar257 * fVar235;
        fVar274 = auVar154._8_4_;
        auVar51._8_4_ = fVar269 * fVar274;
        fVar160 = auVar154._12_4_;
        auVar51._12_4_ = fVar271 * fVar160;
        fVar290 = auVar154._16_4_;
        auVar51._16_4_ = fVar275 * fVar290;
        fVar240 = auVar154._20_4_;
        auVar51._20_4_ = fVar286 * fVar240;
        fVar198 = auVar154._24_4_;
        auVar51._24_4_ = fVar287 * fVar198;
        auVar51._28_4_ = uVar7;
        fVar236 = auVar26._0_4_;
        fVar268 = auVar26._4_4_;
        auVar52._4_4_ = fVar291 * fVar268;
        auVar52._0_4_ = fVar166 * fVar236;
        fVar341 = auVar26._8_4_;
        auVar52._8_4_ = fVar168 * fVar341;
        fVar162 = auVar26._12_4_;
        auVar52._12_4_ = fVar216 * fVar162;
        fVar171 = auVar26._16_4_;
        auVar52._16_4_ = fVar169 * fVar171;
        fVar170 = auVar26._20_4_;
        auVar52._20_4_ = fVar218 * fVar170;
        fVar164 = auVar26._24_4_;
        auVar52._24_4_ = fVar231 * fVar164;
        auVar52._28_4_ = auVar363._28_4_;
        auVar27 = vsubps_avx(auVar52,auVar51);
        auVar53._4_4_ = fVar254 * fVar268;
        auVar53._0_4_ = fVar230 * fVar236;
        auVar53._8_4_ = fVar273 * fVar341;
        auVar53._12_4_ = fVar136 * fVar162;
        auVar53._16_4_ = fVar167 * fVar171;
        auVar53._20_4_ = fVar317 * fVar170;
        auVar53._24_4_ = fVar161 * fVar164;
        auVar53._28_4_ = uVar7;
        auVar368._0_4_ = fVar235 * fVar217;
        auVar368._4_4_ = fVar255 * fVar250;
        auVar368._8_4_ = fVar274 * fVar272;
        auVar368._12_4_ = fVar160 * fVar288;
        auVar368._16_4_ = fVar290 * fVar165;
        auVar368._20_4_ = fVar240 * fVar316;
        auVar368._24_4_ = fVar198 * fVar293;
        auVar368._28_4_ = 0;
        auVar141 = vsubps_avx(auVar368,auVar53);
        auVar179 = vsubps_avx(auVar23,auVar25);
        fVar249 = auVar141._28_4_ + auVar27._28_4_;
        auVar182._0_4_ = auVar141._0_4_ + auVar27._0_4_ * 0.0 + auVar22._0_4_ * 0.0;
        auVar182._4_4_ = auVar141._4_4_ + auVar27._4_4_ * 0.0 + auVar22._4_4_ * 0.0;
        auVar182._8_4_ = auVar141._8_4_ + auVar27._8_4_ * 0.0 + auVar22._8_4_ * 0.0;
        auVar182._12_4_ = auVar141._12_4_ + auVar27._12_4_ * 0.0 + auVar22._12_4_ * 0.0;
        auVar182._16_4_ = auVar141._16_4_ + auVar27._16_4_ * 0.0 + auVar22._16_4_ * 0.0;
        auVar182._20_4_ = auVar141._20_4_ + auVar27._20_4_ * 0.0 + auVar22._20_4_ * 0.0;
        auVar182._24_4_ = auVar141._24_4_ + auVar27._24_4_ * 0.0 + auVar22._24_4_ * 0.0;
        auVar182._28_4_ = fVar249 + auVar22._28_4_;
        fVar233 = auVar178._0_4_;
        fVar135 = auVar178._4_4_;
        auVar54._4_4_ = fVar135 * auVar25._4_4_;
        auVar54._0_4_ = fVar233 * auVar25._0_4_;
        fVar159 = auVar178._8_4_;
        auVar54._8_4_ = fVar159 * auVar25._8_4_;
        fVar237 = auVar178._12_4_;
        auVar54._12_4_ = fVar237 * auVar25._12_4_;
        fVar239 = auVar178._16_4_;
        auVar54._16_4_ = fVar239 * auVar25._16_4_;
        fVar307 = auVar178._20_4_;
        auVar54._20_4_ = fVar307 * auVar25._20_4_;
        fVar252 = auVar178._24_4_;
        auVar54._24_4_ = fVar252 * auVar25._24_4_;
        auVar54._28_4_ = fVar249;
        fVar249 = auVar179._0_4_;
        fVar270 = auVar179._4_4_;
        auVar55._4_4_ = auVar370._4_4_ * fVar270;
        auVar55._0_4_ = auVar370._0_4_ * fVar249;
        fVar308 = auVar179._8_4_;
        auVar55._8_4_ = auVar370._8_4_ * fVar308;
        fVar163 = auVar179._12_4_;
        auVar55._12_4_ = auVar370._12_4_ * fVar163;
        fVar306 = auVar179._16_4_;
        auVar55._16_4_ = auVar370._16_4_ * fVar306;
        fVar199 = auVar179._20_4_;
        auVar55._20_4_ = auVar370._20_4_ * fVar199;
        fVar292 = auVar179._24_4_;
        auVar55._24_4_ = auVar370._24_4_ * fVar292;
        auVar55._28_4_ = auVar141._28_4_;
        auVar27 = vsubps_avx(auVar55,auVar54);
        auVar154 = vsubps_avx(auVar154,auVar24);
        fVar289 = auVar154._0_4_;
        fVar294 = auVar154._4_4_;
        auVar56._4_4_ = fVar294 * auVar25._4_4_;
        auVar56._0_4_ = fVar289 * auVar25._0_4_;
        fVar303 = auVar154._8_4_;
        auVar56._8_4_ = fVar303 * auVar25._8_4_;
        fVar304 = auVar154._12_4_;
        auVar56._12_4_ = fVar304 * auVar25._12_4_;
        fVar305 = auVar154._16_4_;
        auVar56._16_4_ = fVar305 * auVar25._16_4_;
        fVar318 = auVar154._20_4_;
        auVar56._20_4_ = fVar318 * auVar25._20_4_;
        fVar319 = auVar154._24_4_;
        auVar56._24_4_ = fVar319 * auVar25._24_4_;
        auVar56._28_4_ = auVar25._28_4_;
        auVar57._4_4_ = auVar24._4_4_ * fVar270;
        auVar57._0_4_ = auVar24._0_4_ * fVar249;
        auVar57._8_4_ = auVar24._8_4_ * fVar308;
        auVar57._12_4_ = auVar24._12_4_ * fVar163;
        auVar57._16_4_ = auVar24._16_4_ * fVar306;
        auVar57._20_4_ = auVar24._20_4_ * fVar199;
        auVar57._24_4_ = auVar24._24_4_ * fVar292;
        auVar57._28_4_ = auVar22._28_4_;
        auVar154 = vsubps_avx(auVar56,auVar57);
        auVar58._4_4_ = auVar370._4_4_ * fVar294;
        auVar58._0_4_ = auVar370._0_4_ * fVar289;
        auVar58._8_4_ = auVar370._8_4_ * fVar303;
        auVar58._12_4_ = auVar370._12_4_ * fVar304;
        auVar58._16_4_ = auVar370._16_4_ * fVar305;
        auVar58._20_4_ = auVar370._20_4_ * fVar318;
        auVar58._24_4_ = auVar370._24_4_ * fVar319;
        auVar58._28_4_ = auVar25._28_4_;
        auVar59._4_4_ = auVar24._4_4_ * fVar135;
        auVar59._0_4_ = auVar24._0_4_ * fVar233;
        auVar59._8_4_ = auVar24._8_4_ * fVar159;
        auVar59._12_4_ = auVar24._12_4_ * fVar237;
        auVar59._16_4_ = auVar24._16_4_ * fVar239;
        auVar59._20_4_ = auVar24._20_4_ * fVar307;
        auVar59._24_4_ = auVar24._24_4_ * fVar252;
        auVar59._28_4_ = auVar24._28_4_;
        auVar22 = vsubps_avx(auVar59,auVar58);
        auVar158 = ZEXT864(0) << 0x20;
        auVar246._0_4_ = auVar27._0_4_ * 0.0 + auVar22._0_4_ + auVar154._0_4_ * 0.0;
        auVar246._4_4_ = auVar27._4_4_ * 0.0 + auVar22._4_4_ + auVar154._4_4_ * 0.0;
        auVar246._8_4_ = auVar27._8_4_ * 0.0 + auVar22._8_4_ + auVar154._8_4_ * 0.0;
        auVar246._12_4_ = auVar27._12_4_ * 0.0 + auVar22._12_4_ + auVar154._12_4_ * 0.0;
        auVar246._16_4_ = auVar27._16_4_ * 0.0 + auVar22._16_4_ + auVar154._16_4_ * 0.0;
        auVar246._20_4_ = auVar27._20_4_ * 0.0 + auVar22._20_4_ + auVar154._20_4_ * 0.0;
        auVar246._24_4_ = auVar27._24_4_ * 0.0 + auVar22._24_4_ + auVar154._24_4_ * 0.0;
        auVar246._28_4_ = auVar22._28_4_ + auVar22._28_4_ + auVar154._28_4_;
        auVar154 = vmaxps_avx(auVar182,auVar246);
        auVar154 = vcmpps_avx(auVar154,ZEXT832(0) << 0x20,2);
        auVar204 = vpackssdw_avx(auVar154._0_16_,auVar154._16_16_);
        auVar243 = vpand_avx(auVar204,auVar243);
        auVar204 = vpmovsxwd_avx(auVar243);
        auVar220 = vpunpckhwd_avx(auVar243,auVar243);
        auVar226._16_16_ = auVar220;
        auVar226._0_16_ = auVar204;
        if ((((((((auVar226 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar226 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar226 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar226 >> 0x7f,0) == '\0') &&
              (auVar226 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar220 >> 0x3f,0) == '\0') &&
            (auVar226 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar220[0xf]) {
LAB_010bc176:
          auVar315 = ZEXT3264(auVar147);
          auVar229 = ZEXT3264(auVar226);
          auVar157 = ZEXT3264(CONCAT824(local_660[1]._24_8_,
                                        CONCAT816(local_660[1]._16_8_,
                                                  CONCAT88(local_660[1]._8_8_,local_660[1]._0_8_))))
          ;
          auVar344._4_4_ = fVar191;
          auVar344._0_4_ = fVar172;
          auVar344._8_4_ = fVar192;
          auVar344._12_4_ = fVar193;
          auVar344._16_4_ = fVar194;
          auVar344._20_4_ = fVar195;
          auVar344._24_4_ = fVar196;
          auVar344._28_4_ = fVar197;
        }
        else {
          auVar60._4_4_ = fVar270 * fVar250;
          auVar60._0_4_ = fVar249 * fVar217;
          auVar60._8_4_ = fVar308 * fVar272;
          auVar60._12_4_ = fVar163 * fVar288;
          auVar60._16_4_ = fVar306 * fVar165;
          auVar60._20_4_ = fVar199 * fVar316;
          auVar60._24_4_ = fVar292 * fVar293;
          auVar60._28_4_ = auVar220._12_4_;
          auVar348._0_4_ = fVar233 * fVar257;
          auVar348._4_4_ = fVar135 * fVar267;
          auVar348._8_4_ = fVar159 * fVar269;
          auVar348._12_4_ = fVar237 * fVar271;
          auVar348._16_4_ = fVar239 * fVar275;
          auVar348._20_4_ = fVar307 * fVar286;
          auVar348._24_4_ = fVar252 * fVar287;
          auVar348._28_4_ = 0;
          auVar154 = vsubps_avx(auVar348,auVar60);
          auVar61._4_4_ = fVar294 * fVar267;
          auVar61._0_4_ = fVar289 * fVar257;
          auVar61._8_4_ = fVar303 * fVar269;
          auVar61._12_4_ = fVar304 * fVar271;
          auVar61._16_4_ = fVar305 * fVar275;
          auVar61._20_4_ = fVar318 * fVar286;
          auVar61._24_4_ = fVar319 * fVar287;
          auVar61._28_4_ = auVar28._28_4_;
          auVar62._4_4_ = fVar270 * fVar268;
          auVar62._0_4_ = fVar249 * fVar236;
          auVar62._8_4_ = fVar308 * fVar341;
          auVar62._12_4_ = fVar163 * fVar162;
          auVar62._16_4_ = fVar306 * fVar171;
          auVar62._20_4_ = fVar199 * fVar170;
          auVar62._24_4_ = fVar292 * fVar164;
          auVar62._28_4_ = auVar179._28_4_;
          auVar22 = vsubps_avx(auVar62,auVar61);
          auVar63._4_4_ = fVar135 * fVar268;
          auVar63._0_4_ = fVar233 * fVar236;
          auVar63._8_4_ = fVar159 * fVar341;
          auVar63._12_4_ = fVar237 * fVar162;
          auVar63._16_4_ = fVar239 * fVar171;
          auVar63._20_4_ = fVar307 * fVar170;
          auVar63._24_4_ = fVar252 * fVar164;
          auVar63._28_4_ = auVar182._28_4_;
          auVar64._4_4_ = fVar294 * fVar250;
          auVar64._0_4_ = fVar289 * fVar217;
          auVar64._8_4_ = fVar303 * fVar272;
          auVar64._12_4_ = fVar304 * fVar288;
          auVar64._16_4_ = fVar305 * fVar165;
          auVar64._20_4_ = fVar318 * fVar316;
          auVar64._24_4_ = fVar319 * fVar293;
          auVar64._28_4_ = auVar142._28_4_;
          auVar370 = vsubps_avx(auVar64,auVar63);
          auVar302._0_4_ = auVar154._0_4_ * 0.0 + auVar370._0_4_ + auVar22._0_4_ * 0.0;
          auVar302._4_4_ = auVar154._4_4_ * 0.0 + auVar370._4_4_ + auVar22._4_4_ * 0.0;
          auVar302._8_4_ = auVar154._8_4_ * 0.0 + auVar370._8_4_ + auVar22._8_4_ * 0.0;
          auVar302._12_4_ = auVar154._12_4_ * 0.0 + auVar370._12_4_ + auVar22._12_4_ * 0.0;
          auVar302._16_4_ = auVar154._16_4_ * 0.0 + auVar370._16_4_ + auVar22._16_4_ * 0.0;
          auVar302._20_4_ = auVar154._20_4_ * 0.0 + auVar370._20_4_ + auVar22._20_4_ * 0.0;
          auVar302._24_4_ = auVar154._24_4_ * 0.0 + auVar370._24_4_ + auVar22._24_4_ * 0.0;
          auVar302._28_4_ = auVar142._28_4_ + auVar370._28_4_ + auVar182._28_4_;
          auVar24 = vrcpps_avx(auVar302);
          fVar217 = auVar24._0_4_;
          fVar236 = auVar24._4_4_;
          auVar65._4_4_ = auVar302._4_4_ * fVar236;
          auVar65._0_4_ = auVar302._0_4_ * fVar217;
          fVar249 = auVar24._8_4_;
          auVar65._8_4_ = auVar302._8_4_ * fVar249;
          fVar250 = auVar24._12_4_;
          auVar65._12_4_ = auVar302._12_4_ * fVar250;
          fVar268 = auVar24._16_4_;
          auVar65._16_4_ = auVar302._16_4_ * fVar268;
          fVar270 = auVar24._20_4_;
          auVar65._20_4_ = auVar302._20_4_ * fVar270;
          fVar272 = auVar24._24_4_;
          auVar65._24_4_ = auVar302._24_4_ * fVar272;
          auVar65._28_4_ = auVar179._28_4_;
          auVar349._8_4_ = 0x3f800000;
          auVar349._0_8_ = 0x3f8000003f800000;
          auVar349._12_4_ = 0x3f800000;
          auVar349._16_4_ = 0x3f800000;
          auVar349._20_4_ = 0x3f800000;
          auVar349._24_4_ = 0x3f800000;
          auVar349._28_4_ = 0x3f800000;
          auVar25 = vsubps_avx(auVar349,auVar65);
          fVar217 = auVar25._0_4_ * fVar217 + fVar217;
          fVar236 = auVar25._4_4_ * fVar236 + fVar236;
          fVar249 = auVar25._8_4_ * fVar249 + fVar249;
          fVar250 = auVar25._12_4_ * fVar250 + fVar250;
          fVar268 = auVar25._16_4_ * fVar268 + fVar268;
          fVar270 = auVar25._20_4_ * fVar270 + fVar270;
          fVar272 = auVar25._24_4_ * fVar272 + fVar272;
          auVar66._4_4_ =
               (auVar154._4_4_ * fVar255 + auVar22._4_4_ * fVar254 + auVar370._4_4_ * fVar291) *
               fVar236;
          auVar66._0_4_ =
               (auVar154._0_4_ * fVar235 + auVar22._0_4_ * fVar230 + auVar370._0_4_ * fVar166) *
               fVar217;
          auVar66._8_4_ =
               (auVar154._8_4_ * fVar274 + auVar22._8_4_ * fVar273 + auVar370._8_4_ * fVar168) *
               fVar249;
          auVar66._12_4_ =
               (auVar154._12_4_ * fVar160 + auVar22._12_4_ * fVar136 + auVar370._12_4_ * fVar216) *
               fVar250;
          auVar66._16_4_ =
               (auVar154._16_4_ * fVar290 + auVar22._16_4_ * fVar167 + auVar370._16_4_ * fVar169) *
               fVar268;
          auVar66._20_4_ =
               (auVar154._20_4_ * fVar240 + auVar22._20_4_ * fVar317 + auVar370._20_4_ * fVar218) *
               fVar270;
          auVar66._24_4_ =
               (auVar154._24_4_ * fVar198 + auVar22._24_4_ * fVar161 + auVar370._24_4_ * fVar231) *
               fVar272;
          auVar66._28_4_ = auVar26._28_4_ + auVar23._28_4_;
          auVar204 = vpermilps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0);
          auVar146._16_16_ = auVar204;
          auVar146._0_16_ = auVar204;
          auVar154 = vcmpps_avx(auVar146,auVar66,2);
          uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar227._4_4_ = uVar7;
          auVar227._0_4_ = uVar7;
          auVar227._8_4_ = uVar7;
          auVar227._12_4_ = uVar7;
          auVar227._16_4_ = uVar7;
          auVar227._20_4_ = uVar7;
          auVar227._24_4_ = uVar7;
          auVar227._28_4_ = uVar7;
          auVar22 = vcmpps_avx(auVar66,auVar227,2);
          auVar154 = vandps_avx(auVar22,auVar154);
          auVar204 = vpackssdw_avx(auVar154._0_16_,auVar154._16_16_);
          auVar243 = vpand_avx(auVar243,auVar204);
          auVar204 = vpmovsxwd_avx(auVar243);
          auVar220 = vpshufd_avx(auVar243,0xee);
          auVar220 = vpmovsxwd_avx(auVar220);
          auVar285 = ZEXT1664(auVar220);
          auVar226._16_16_ = auVar220;
          auVar226._0_16_ = auVar204;
          auVar315 = ZEXT3264(auVar147);
          if ((((((((auVar226 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar226 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar226 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar226 >> 0x7f,0) == '\0') &&
                (auVar226 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar220 >> 0x3f,0) == '\0') &&
              (auVar226 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar220[0xf]) goto LAB_010bc176;
          auVar147 = vcmpps_avx(ZEXT832(0) << 0x20,auVar302,4);
          auVar204 = vpackssdw_avx(auVar147._0_16_,auVar147._16_16_);
          auVar243 = vpand_avx(auVar243,auVar204);
          auVar204 = vpmovsxwd_avx(auVar243);
          auVar229 = ZEXT1664(auVar204);
          auVar243 = vpunpckhwd_avx(auVar243,auVar243);
          auVar283._16_16_ = auVar243;
          auVar283._0_16_ = auVar204;
          auVar285 = ZEXT3264(auVar283);
          auVar157 = ZEXT3264(CONCAT824(local_660[1]._24_8_,
                                        CONCAT816(local_660[1]._16_8_,
                                                  CONCAT88(local_660[1]._8_8_,local_660[1]._0_8_))))
          ;
          auVar344._4_4_ = fVar191;
          auVar344._0_4_ = fVar172;
          auVar344._8_4_ = fVar192;
          auVar344._12_4_ = fVar193;
          auVar344._16_4_ = fVar194;
          auVar344._20_4_ = fVar195;
          auVar344._24_4_ = fVar196;
          auVar344._28_4_ = fVar197;
          if ((((((((auVar283 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar283 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar283 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar283 >> 0x7f,0) != '\0') ||
                (auVar283 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar243 >> 0x3f,0) != '\0') ||
              (auVar283 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar243[0xf] < '\0') {
            auVar67._4_4_ = auVar182._4_4_ * fVar236;
            auVar67._0_4_ = auVar182._0_4_ * fVar217;
            auVar67._8_4_ = auVar182._8_4_ * fVar249;
            auVar67._12_4_ = auVar182._12_4_ * fVar250;
            auVar67._16_4_ = auVar182._16_4_ * fVar268;
            auVar67._20_4_ = auVar182._20_4_ * fVar270;
            auVar67._24_4_ = auVar182._24_4_ * fVar272;
            auVar67._28_4_ = SUB84(local_660[1]._24_8_,4);
            auVar68._4_4_ = auVar246._4_4_ * fVar236;
            auVar68._0_4_ = auVar246._0_4_ * fVar217;
            auVar68._8_4_ = auVar246._8_4_ * fVar249;
            auVar68._12_4_ = auVar246._12_4_ * fVar250;
            auVar68._16_4_ = auVar246._16_4_ * fVar268;
            auVar68._20_4_ = auVar246._20_4_ * fVar270;
            auVar68._24_4_ = auVar246._24_4_ * fVar272;
            auVar68._28_4_ = auVar25._28_4_ + auVar24._28_4_;
            auVar247._8_4_ = 0x3f800000;
            auVar247._0_8_ = 0x3f8000003f800000;
            auVar247._12_4_ = 0x3f800000;
            auVar247._16_4_ = 0x3f800000;
            auVar247._20_4_ = 0x3f800000;
            auVar247._24_4_ = 0x3f800000;
            auVar247._28_4_ = 0x3f800000;
            auVar147 = vsubps_avx(auVar247,auVar67);
            auVar229 = ZEXT3264(auVar147);
            auVar147 = vblendvps_avx(auVar147,auVar67,auVar21);
            auVar315 = ZEXT3264(auVar147);
            auVar147 = vsubps_avx(auVar247,auVar68);
            _local_4e0 = vblendvps_avx(auVar147,auVar68,auVar21);
            auVar157 = ZEXT3264(auVar283);
            local_4c0 = auVar66;
          }
        }
        auVar147 = auVar157._0_32_;
        if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar147 >> 0x7f,0) != '\0') ||
              (auVar157 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar147 >> 0xbf,0) != '\0') ||
            (auVar157 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar157[0x1f] < '\0') {
          auVar154 = vsubps_avx(auVar263,auVar344);
          fVar230 = auVar344._0_4_ + auVar315._0_4_ * auVar154._0_4_;
          fVar235 = auVar344._4_4_ + auVar315._4_4_ * auVar154._4_4_;
          fVar236 = auVar344._8_4_ + auVar315._8_4_ * auVar154._8_4_;
          fVar249 = auVar344._12_4_ + auVar315._12_4_ * auVar154._12_4_;
          fVar250 = auVar344._16_4_ + auVar315._16_4_ * auVar154._16_4_;
          fVar254 = auVar344._20_4_ + auVar315._20_4_ * auVar154._20_4_;
          fVar255 = auVar344._24_4_ + auVar315._24_4_ * auVar154._24_4_;
          fVar268 = auVar344._28_4_ + auVar154._28_4_;
          fVar217 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar69._4_4_ = (fVar235 + fVar235) * fVar217;
          auVar69._0_4_ = (fVar230 + fVar230) * fVar217;
          auVar69._8_4_ = (fVar236 + fVar236) * fVar217;
          auVar69._12_4_ = (fVar249 + fVar249) * fVar217;
          auVar69._16_4_ = (fVar250 + fVar250) * fVar217;
          auVar69._20_4_ = (fVar254 + fVar254) * fVar217;
          auVar69._24_4_ = (fVar255 + fVar255) * fVar217;
          auVar69._28_4_ = fVar268 + fVar268;
          auVar154 = vcmpps_avx(local_4c0,auVar69,6);
          auVar22 = auVar147 & auVar154;
          if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar22 >> 0x7f,0) != '\0') ||
                (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar22 >> 0xbf,0) != '\0') ||
              (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar22[0x1f] < '\0') {
            auVar229 = ZEXT3264(CONCAT428(0xbf800000,
                                          CONCAT424(0xbf800000,
                                                    CONCAT420(0xbf800000,
                                                              CONCAT416(0xbf800000,
                                                                        CONCAT412(0xbf800000,
                                                                                  CONCAT48(
                                                  0xbf800000,0xbf800000bf800000)))))));
            local_400 = (float)local_4e0._0_4_ + (float)local_4e0._0_4_ + -1.0;
            fStack_3fc = (float)local_4e0._4_4_ + (float)local_4e0._4_4_ + -1.0;
            fStack_3f8 = (float)uStack_4d8 + (float)uStack_4d8 + -1.0;
            fStack_3f4 = uStack_4d8._4_4_ + uStack_4d8._4_4_ + -1.0;
            fStack_3f0 = (float)uStack_4d0 + (float)uStack_4d0 + -1.0;
            fStack_3ec = uStack_4d0._4_4_ + uStack_4d0._4_4_ + -1.0;
            fStack_3e8 = (float)uStack_4c8 + (float)uStack_4c8 + -1.0;
            fStack_3e4 = uStack_4c8._4_4_ + uStack_4c8._4_4_ + -1.0;
            local_6e0 = auVar315._0_32_;
            local_4e0._4_4_ = fStack_3fc;
            local_4e0._0_4_ = local_400;
            uStack_4d8._0_4_ = fStack_3f8;
            uStack_4d8._4_4_ = fStack_3f4;
            uStack_4d0._0_4_ = fStack_3f0;
            uStack_4d0._4_4_ = fStack_3ec;
            auVar123 = _local_4e0;
            uStack_4c8._0_4_ = fStack_3e8;
            uStack_4c8._4_4_ = fStack_3e4;
            auVar22 = _local_4e0;
            local_3e0 = local_4c0;
            local_3c0 = 0;
            local_3b0 = local_900;
            uStack_3a8 = uStack_8f8;
            fStack_39c = fStack_92c;
            fStack_398 = fStack_928;
            fStack_394 = fStack_924;
            _local_4e0 = auVar22;
            if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              local_660[0] = vandps_avx(auVar154,auVar147);
              auVar201._0_4_ = 1.0 / local_560;
              auVar201._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar243 = vshufps_avx(auVar201,auVar201,0);
              local_340[0] = auVar243._0_4_ * (auVar315._0_4_ + 0.0);
              local_340[1] = auVar243._4_4_ * (auVar315._4_4_ + 1.0);
              local_340[2] = auVar243._8_4_ * (auVar315._8_4_ + 2.0);
              local_340[3] = auVar243._12_4_ * (auVar315._12_4_ + 3.0);
              fStack_330 = auVar243._0_4_ * (auVar315._16_4_ + 4.0);
              fStack_32c = auVar243._4_4_ * (auVar315._20_4_ + 5.0);
              fStack_328 = auVar243._8_4_ * (auVar315._24_4_ + 6.0);
              fStack_324 = auVar315._28_4_ + 7.0;
              uStack_4d0 = auVar123._16_8_;
              uStack_4c8 = auVar22._24_8_;
              local_320 = local_4e0;
              uStack_318 = uStack_4d8;
              uStack_310 = uStack_4d0;
              uStack_308 = uStack_4c8;
              local_300 = local_4c0;
              auVar183._8_4_ = 0x7f800000;
              auVar183._0_8_ = 0x7f8000007f800000;
              auVar183._12_4_ = 0x7f800000;
              auVar183._16_4_ = 0x7f800000;
              auVar183._20_4_ = 0x7f800000;
              auVar183._24_4_ = 0x7f800000;
              auVar183._28_4_ = 0x7f800000;
              auVar147 = vblendvps_avx(auVar183,local_4c0,local_660[0]);
              auVar154 = vshufps_avx(auVar147,auVar147,0xb1);
              auVar154 = vminps_avx(auVar147,auVar154);
              auVar22 = vshufpd_avx(auVar154,auVar154,5);
              auVar154 = vminps_avx(auVar154,auVar22);
              auVar22 = vperm2f128_avx(auVar154,auVar154,1);
              auVar154 = vminps_avx(auVar154,auVar22);
              auVar154 = vcmpps_avx(auVar147,auVar154,0);
              auVar22 = local_660[0] & auVar154;
              auVar147 = local_660[0];
              if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar22 >> 0x7f,0) != '\0') ||
                    (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar22 >> 0xbf,0) != '\0') ||
                  (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar22[0x1f] < '\0') {
                auVar147 = vandps_avx(auVar154,local_660[0]);
              }
              uVar129 = vmovmskps_avx(auVar147);
              uVar20 = 0;
              if (uVar129 != 0) {
                for (; (uVar129 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                }
              }
              uVar132 = (ulong)uVar20;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar18->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar217 = local_340[uVar132];
                uVar7 = *(undefined4 *)((long)&local_320 + uVar132 * 4);
                fVar235 = 1.0 - fVar217;
                fVar230 = fVar217 * fVar235 + fVar217 * fVar235;
                auVar285 = ZEXT464(0x40400000);
                auVar243 = ZEXT416((uint)(fVar217 * fVar217 * 3.0));
                auVar243 = vshufps_avx(auVar243,auVar243,0);
                auVar204 = ZEXT416((uint)((fVar230 - fVar217 * fVar217) * 3.0));
                auVar204 = vshufps_avx(auVar204,auVar204,0);
                auVar220 = ZEXT416((uint)((fVar235 * fVar235 - fVar230) * 3.0));
                auVar220 = vshufps_avx(auVar220,auVar220,0);
                auVar208 = ZEXT416((uint)(fVar235 * fVar235 * -3.0));
                auVar208 = vshufps_avx(auVar208,auVar208,0);
                auVar202._0_4_ =
                     auVar208._0_4_ * fVar251 +
                     local_930 * auVar220._0_4_ +
                     local_8e0 * auVar243._0_4_ + local_8d0 * auVar204._0_4_;
                auVar202._4_4_ =
                     auVar208._4_4_ * fVar253 +
                     fStack_92c * auVar220._4_4_ +
                     fStack_8dc * auVar243._4_4_ + fStack_8cc * auVar204._4_4_;
                auVar202._8_4_ =
                     auVar208._8_4_ * fVar256 +
                     fStack_928 * auVar220._8_4_ +
                     fStack_8d8 * auVar243._8_4_ + fStack_8c8 * auVar204._8_4_;
                auVar202._12_4_ =
                     auVar208._12_4_ * fVar266 +
                     fStack_924 * auVar220._12_4_ +
                     fStack_8d4 * auVar243._12_4_ + fStack_8c4 * auVar204._12_4_;
                auVar229 = ZEXT464(*(uint *)(local_300 + uVar132 * 4));
                *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_300 + uVar132 * 4);
                *(float *)(ray + k * 4 + 0x180) = auVar202._0_4_;
                uVar17 = vextractps_avx(auVar202,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar17;
                uVar17 = vextractps_avx(auVar202,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar17;
                *(float *)(ray + k * 4 + 0x1e0) = fVar217;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar7;
                *(uint *)(ray + k * 4 + 0x220) = uVar130;
                *(uint *)(ray + k * 4 + 0x240) = uVar128;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                auVar243 = vshufps_avx(ZEXT416(uVar128),ZEXT416(uVar128),0);
                register0x00001210 = auVar243;
                _local_7c0 = auVar243;
                auVar243 = vshufps_avx(ZEXT416(uVar130),ZEXT416(uVar130),0);
                register0x00001210 = auVar243;
                _local_7e0 = auVar243;
                auStack_730 = *(undefined1 (*) [8])(local_778 + 0x10);
                uStack_728 = *(undefined8 *)(local_778 + 0x18);
                _local_700 = ZEXT1632(*local_770);
                fStack_710 = SUB84(auStack_730,0);
                fStack_70c = (float)((ulong)auStack_730 >> 0x20);
                fStack_708 = (float)uStack_728;
                fStack_704 = (float)((ulong)uStack_728 >> 0x20);
                _local_740 = *local_770;
                auVar157 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                local_420 = local_6e0;
                local_3bc = uVar16;
                local_3a0 = local_930;
                while( true ) {
                  local_200 = local_340[uVar132];
                  local_1e0 = *(undefined4 *)((long)&local_320 + uVar132 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar132 * 4);
                  fVar230 = 1.0 - local_200;
                  fVar217 = local_200 * fVar230 + local_200 * fVar230;
                  auVar285 = ZEXT464(0x40400000);
                  auVar243 = ZEXT416((uint)(local_200 * local_200 * 3.0));
                  auVar243 = vshufps_avx(auVar243,auVar243,0);
                  auVar204 = ZEXT416((uint)((fVar217 - local_200 * local_200) * 3.0));
                  auVar204 = vshufps_avx(auVar204,auVar204,0);
                  auVar220 = ZEXT416((uint)((fVar230 * fVar230 - fVar217) * 3.0));
                  auVar220 = vshufps_avx(auVar220,auVar220,0);
                  local_830.context = context->user;
                  auVar208 = ZEXT416((uint)(fVar230 * fVar230 * -3.0));
                  auVar208 = vshufps_avx(auVar208,auVar208,0);
                  auVar209._0_4_ =
                       auVar208._0_4_ * fVar251 +
                       auVar220._0_4_ * local_930 +
                       local_8e0 * auVar243._0_4_ + local_8d0 * auVar204._0_4_;
                  auVar209._4_4_ =
                       auVar208._4_4_ * fVar253 +
                       auVar220._4_4_ * fStack_92c +
                       fStack_8dc * auVar243._4_4_ + fStack_8cc * auVar204._4_4_;
                  auVar209._8_4_ =
                       auVar208._8_4_ * fVar256 +
                       auVar220._8_4_ * fStack_928 +
                       fStack_8d8 * auVar243._8_4_ + fStack_8c8 * auVar204._8_4_;
                  auVar209._12_4_ =
                       auVar208._12_4_ * fVar266 +
                       auVar220._12_4_ * fStack_924 +
                       fStack_8d4 * auVar243._12_4_ + fStack_8c4 * auVar204._12_4_;
                  auStack_250 = vshufps_avx(auVar209,auVar209,0);
                  local_260[0] = (RTCHitN)auStack_250[0];
                  local_260[1] = (RTCHitN)auStack_250[1];
                  local_260[2] = (RTCHitN)auStack_250[2];
                  local_260[3] = (RTCHitN)auStack_250[3];
                  local_260[4] = (RTCHitN)auStack_250[4];
                  local_260[5] = (RTCHitN)auStack_250[5];
                  local_260[6] = (RTCHitN)auStack_250[6];
                  local_260[7] = (RTCHitN)auStack_250[7];
                  local_260[8] = (RTCHitN)auStack_250[8];
                  local_260[9] = (RTCHitN)auStack_250[9];
                  local_260[10] = (RTCHitN)auStack_250[10];
                  local_260[0xb] = (RTCHitN)auStack_250[0xb];
                  local_260[0xc] = (RTCHitN)auStack_250[0xc];
                  local_260[0xd] = (RTCHitN)auStack_250[0xd];
                  local_260[0xe] = (RTCHitN)auStack_250[0xe];
                  local_260[0xf] = (RTCHitN)auStack_250[0xf];
                  auStack_230 = vshufps_avx(auVar209,auVar209,0x55);
                  local_240 = auStack_230;
                  auStack_210 = vshufps_avx(auVar209,auVar209,0xaa);
                  local_220 = auStack_210;
                  fStack_1fc = local_200;
                  fStack_1f8 = local_200;
                  fStack_1f4 = local_200;
                  fStack_1f0 = local_200;
                  fStack_1ec = local_200;
                  fStack_1e8 = local_200;
                  fStack_1e4 = local_200;
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  local_1c0 = local_7e0;
                  uStack_1b8 = uStack_7d8;
                  uStack_1b0 = uStack_7d0;
                  uStack_1a8 = uStack_7c8;
                  local_1a0 = local_7c0;
                  uStack_198 = uStack_7b8;
                  uStack_190 = uStack_7b0;
                  uStack_188 = uStack_7a8;
                  auVar147 = vcmpps_avx(auVar158._0_32_,auVar158._0_32_,0xf);
                  local_768[1] = auVar147;
                  *local_768 = auVar147;
                  local_180 = (local_830.context)->instID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_160 = (local_830.context)->instPrimID[0];
                  uStack_15c = local_160;
                  uStack_158 = local_160;
                  uStack_154 = local_160;
                  uStack_150 = local_160;
                  uStack_14c = local_160;
                  uStack_148 = local_160;
                  uStack_144 = local_160;
                  local_7a0 = local_740;
                  uStack_798 = uStack_738;
                  uStack_790 = auStack_730;
                  uStack_788 = uStack_728;
                  local_830.valid = (int *)&local_7a0;
                  local_830.geometryUserPtr = pGVar18->userPtr;
                  local_830.hit = local_260;
                  local_830.N = 8;
                  auVar140._4_4_ = fStack_71c;
                  auVar140._0_4_ = local_720;
                  auVar140._8_4_ = fStack_718;
                  auVar140._12_4_ = fStack_714;
                  auVar177 = local_700._0_16_;
                  local_830.ray = (RTCRayN *)ray;
                  if (pGVar18->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar285 = ZEXT1664(auVar285._0_16_);
                    (*pGVar18->intersectionFilterN)(&local_830);
                    auVar157 = ZEXT1664(auVar157._0_16_);
                    auVar315 = ZEXT3264(local_6e0);
                    auVar158 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar177._8_8_ = uStack_798;
                    auVar177._0_8_ = local_7a0;
                    auVar140._8_8_ = uStack_788;
                    auVar140._0_8_ = uStack_790;
                  }
                  auVar243 = vpcmpeqd_avx(auVar177,ZEXT816(0) << 0x40);
                  auVar204 = vpcmpeqd_avx(auVar140,ZEXT816(0) << 0x40);
                  auVar215._16_16_ = auVar204;
                  auVar215._0_16_ = auVar243;
                  auVar154 = auVar147 & ~auVar215;
                  if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar154 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar154 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar154 >> 0x7f,0) == '\0') &&
                        (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar154 >> 0xbf,0) == '\0') &&
                      (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar154[0x1f]) {
                    auVar155._0_4_ = auVar243._0_4_ ^ auVar147._0_4_;
                    auVar155._4_4_ = auVar243._4_4_ ^ auVar147._4_4_;
                    auVar155._8_4_ = auVar243._8_4_ ^ auVar147._8_4_;
                    auVar155._12_4_ = auVar243._12_4_ ^ auVar147._12_4_;
                    auVar155._16_4_ = auVar204._0_4_ ^ auVar147._16_4_;
                    auVar155._20_4_ = auVar204._4_4_ ^ auVar147._20_4_;
                    auVar155._24_4_ = auVar204._8_4_ ^ auVar147._24_4_;
                    auVar155._28_4_ = auVar204._12_4_ ^ auVar147._28_4_;
                  }
                  else {
                    p_Var19 = context->args->filter;
                    if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar285 = ZEXT1664(auVar285._0_16_);
                      (*p_Var19)(&local_830);
                      auVar157 = ZEXT1664(auVar157._0_16_);
                      auVar315 = ZEXT3264(local_6e0);
                      auVar158 = ZEXT1664(ZEXT816(0) << 0x40);
                      auVar177._8_8_ = uStack_798;
                      auVar177._0_8_ = local_7a0;
                      auVar140._8_8_ = uStack_788;
                      auVar140._0_8_ = uStack_790;
                    }
                    auVar243 = vpcmpeqd_avx(auVar177,ZEXT816(0) << 0x40);
                    auVar204 = vpcmpeqd_avx(auVar140,ZEXT816(0) << 0x40);
                    auVar189._16_16_ = auVar204;
                    auVar189._0_16_ = auVar243;
                    auVar155._0_4_ = auVar243._0_4_ ^ auVar147._0_4_;
                    auVar155._4_4_ = auVar243._4_4_ ^ auVar147._4_4_;
                    auVar155._8_4_ = auVar243._8_4_ ^ auVar147._8_4_;
                    auVar155._12_4_ = auVar243._12_4_ ^ auVar147._12_4_;
                    auVar155._16_4_ = auVar204._0_4_ ^ auVar147._16_4_;
                    auVar155._20_4_ = auVar204._4_4_ ^ auVar147._20_4_;
                    auVar155._24_4_ = auVar204._8_4_ ^ auVar147._24_4_;
                    auVar155._28_4_ = auVar204._12_4_ ^ auVar147._28_4_;
                    auVar147 = auVar147 & ~auVar189;
                    if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar147 >> 0x7f,0) != '\0') ||
                          (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar147 >> 0xbf,0) != '\0') ||
                        (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar147[0x1f] < '\0') {
                      auVar147 = vmaskmovps_avx(auVar155,*(undefined1 (*) [32])local_830.hit);
                      *(undefined1 (*) [32])(local_830.ray + 0x180) = auVar147;
                      auVar147 = vmaskmovps_avx(auVar155,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x20));
                      *(undefined1 (*) [32])(local_830.ray + 0x1a0) = auVar147;
                      auVar147 = vmaskmovps_avx(auVar155,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x40));
                      *(undefined1 (*) [32])(local_830.ray + 0x1c0) = auVar147;
                      auVar147 = vmaskmovps_avx(auVar155,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x60));
                      *(undefined1 (*) [32])(local_830.ray + 0x1e0) = auVar147;
                      auVar147 = vmaskmovps_avx(auVar155,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x80));
                      *(undefined1 (*) [32])(local_830.ray + 0x200) = auVar147;
                      auVar147 = vmaskmovps_avx(auVar155,*(undefined1 (*) [32])
                                                          (local_830.hit + 0xa0));
                      *(undefined1 (*) [32])(local_830.ray + 0x220) = auVar147;
                      auVar147 = vmaskmovps_avx(auVar155,*(undefined1 (*) [32])
                                                          (local_830.hit + 0xc0));
                      *(undefined1 (*) [32])(local_830.ray + 0x240) = auVar147;
                      auVar147 = vmaskmovps_avx(auVar155,*(undefined1 (*) [32])
                                                          (local_830.hit + 0xe0));
                      *(undefined1 (*) [32])(local_830.ray + 0x260) = auVar147;
                      auVar147 = vmaskmovps_avx(auVar155,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x100));
                      *(undefined1 (*) [32])(local_830.ray + 0x280) = auVar147;
                    }
                  }
                  auVar147 = local_4c0;
                  if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar155 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar155 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar155 >> 0x7f,0) == '\0') &&
                        (auVar155 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar155 >> 0xbf,0) == '\0') &&
                      (auVar155 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar155[0x1f]) {
                    *(int *)(ray + k * 4 + 0x100) = auVar157._0_4_;
                  }
                  else {
                    auVar157 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                  }
                  *(undefined4 *)(local_660[0] + uVar132 * 4) = 0;
                  auVar243 = vshufps_avx(auVar157._0_16_,auVar157._0_16_,0);
                  auVar156._16_16_ = auVar243;
                  auVar156._0_16_ = auVar243;
                  auVar229 = ZEXT3264(auVar147);
                  auVar22 = vcmpps_avx(auVar147,auVar156,2);
                  auVar154 = vandps_avx(auVar22,local_660[0]);
                  local_660[0] = local_660[0] & auVar22;
                  if ((((((((local_660[0] >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                           && (local_660[0] >> 0x3f & (undefined1  [32])0x1) ==
                              (undefined1  [32])0x0) &&
                          (local_660[0] >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                         && SUB321(local_660[0] >> 0x7f,0) == '\0') &&
                        (local_660[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_660[0] >> 0xbf,0) == '\0') &&
                      (local_660[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_660[0][0x1f]) break;
                  auVar190._8_4_ = 0x7f800000;
                  auVar190._0_8_ = 0x7f8000007f800000;
                  auVar190._12_4_ = 0x7f800000;
                  auVar190._16_4_ = 0x7f800000;
                  auVar190._20_4_ = 0x7f800000;
                  auVar190._24_4_ = 0x7f800000;
                  auVar190._28_4_ = 0x7f800000;
                  auVar147 = vblendvps_avx(auVar190,auVar147,auVar154);
                  auVar22 = vshufps_avx(auVar147,auVar147,0xb1);
                  auVar22 = vminps_avx(auVar147,auVar22);
                  auVar23 = vshufpd_avx(auVar22,auVar22,5);
                  auVar22 = vminps_avx(auVar22,auVar23);
                  auVar23 = vperm2f128_avx(auVar22,auVar22,1);
                  auVar22 = vminps_avx(auVar22,auVar23);
                  auVar22 = vcmpps_avx(auVar147,auVar22,0);
                  auVar23 = auVar154 & auVar22;
                  auVar147 = auVar154;
                  if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar23 >> 0x7f,0) != '\0') ||
                        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar23 >> 0xbf,0) != '\0') ||
                      (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar23[0x1f] < '\0') {
                    auVar147 = vandps_avx(auVar22,auVar154);
                  }
                  uVar129 = vmovmskps_avx(auVar147);
                  uVar20 = 0;
                  if (uVar129 != 0) {
                    for (; (uVar129 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                    }
                  }
                  uVar132 = (ulong)uVar20;
                  local_660[0] = auVar154;
                }
              }
            }
          }
        }
      }
      if (8 < (int)uVar16) {
        _local_740 = vpshufd_avx(ZEXT416(uVar16),0);
        auVar243 = vshufps_avx(local_800._0_16_,local_800._0_16_,0);
        local_480._16_16_ = auVar243;
        local_480._0_16_ = auVar243;
        auVar243 = vpermilps_avx(local_760._0_16_,0);
        register0x00001210 = auVar243;
        _local_4a0 = auVar243;
        auVar138._0_4_ = 1.0 / local_560;
        auVar138._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar243 = vshufps_avx(auVar138,auVar138,0);
        register0x00001210 = auVar243;
        _local_140 = auVar243;
        auVar243 = vshufps_avx(ZEXT416(uVar128),ZEXT416(uVar128),0);
        local_100._16_16_ = auVar243;
        local_100._0_16_ = auVar243;
        auVar243 = vshufps_avx(ZEXT416(uVar130),ZEXT416(uVar130),0);
        local_120._16_16_ = auVar243;
        local_120._0_16_ = auVar243;
        auVar158 = ZEXT3264(local_120);
        lVar133 = 8;
        local_6e0 = auVar315._0_32_;
        fVar217 = (float)local_6c0._0_4_;
        fVar230 = (float)local_6c0._4_4_;
        fVar235 = fStack_6b8;
        fVar236 = fStack_6b4;
        fVar249 = fStack_6b0;
        fVar250 = fStack_6ac;
        fVar254 = fStack_6a8;
        fVar255 = fStack_6a4;
        fVar268 = (float)local_680._0_4_;
        fVar270 = (float)local_680._4_4_;
        fVar272 = fStack_678;
        fVar273 = fStack_674;
        fVar274 = fStack_670;
        fVar341 = fStack_66c;
        fVar308 = fStack_668;
        do {
          pauVar1 = (undefined1 (*) [28])(bezier_basis0 + lVar133 * 4 + lVar131);
          fVar288 = *(float *)*pauVar1;
          fVar136 = *(float *)(*pauVar1 + 4);
          fVar160 = *(float *)(*pauVar1 + 8);
          fVar162 = *(float *)(*pauVar1 + 0xc);
          fVar163 = *(float *)(*pauVar1 + 0x10);
          fVar165 = *(float *)(*pauVar1 + 0x14);
          fVar167 = *(float *)(*pauVar1 + 0x18);
          auVar122 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar131 + 0x21aa768 + lVar133 * 4);
          fVar290 = *(float *)*pauVar1;
          fVar171 = *(float *)(*pauVar1 + 4);
          fVar306 = *(float *)(*pauVar1 + 8);
          fVar316 = *(float *)(*pauVar1 + 0xc);
          fVar317 = *(float *)(*pauVar1 + 0x10);
          fVar240 = *(float *)(*pauVar1 + 0x14);
          fVar170 = *(float *)(*pauVar1 + 0x18);
          auVar121 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar131 + 0x21aabec + lVar133 * 4);
          fVar199 = *(float *)*pauVar1;
          fVar293 = *(float *)(*pauVar1 + 4);
          fVar161 = *(float *)(*pauVar1 + 8);
          fVar198 = *(float *)(*pauVar1 + 0xc);
          fVar164 = *(float *)(*pauVar1 + 0x10);
          fVar292 = *(float *)(*pauVar1 + 0x14);
          fVar166 = *(float *)(*pauVar1 + 0x18);
          auVar120 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar131 + 0x21ab070 + lVar133 * 4);
          fVar291 = *(float *)*pauVar1;
          fVar168 = *(float *)(*pauVar1 + 4);
          fVar216 = *(float *)(*pauVar1 + 8);
          fVar169 = *(float *)(*pauVar1 + 0xc);
          fVar218 = *(float *)(*pauVar1 + 0x10);
          fVar231 = *(float *)(*pauVar1 + 0x14);
          fVar233 = *(float *)(*pauVar1 + 0x18);
          auVar119 = *pauVar1;
          fVar197 = auVar229._28_4_;
          fVar196 = fVar197 + *(float *)pauVar1[1];
          fVar195 = fVar197 + fVar197 + auVar158._28_4_;
          local_760._0_4_ =
               (float)local_2a0._0_4_ * fVar288 +
               fVar290 * (float)local_440._0_4_ +
               fVar199 * fVar217 + (float)local_540._0_4_ * fVar291;
          local_760._4_4_ =
               (float)local_2a0._4_4_ * fVar136 +
               fVar171 * (float)local_440._4_4_ +
               fVar293 * fVar230 + (float)local_540._4_4_ * fVar168;
          local_760._8_4_ =
               fStack_298 * fVar160 +
               fVar306 * fStack_438 + fVar161 * fVar235 + fStack_538 * fVar216;
          local_760._12_4_ =
               fStack_294 * fVar162 +
               fVar316 * fStack_434 + fVar198 * fVar236 + fStack_534 * fVar169;
          local_760._16_4_ =
               fStack_290 * fVar163 +
               fVar317 * fStack_430 + fVar164 * fVar249 + fStack_530 * fVar218;
          local_760._20_4_ =
               fStack_28c * fVar165 +
               fVar240 * fStack_42c + fVar292 * fVar250 + fStack_52c * fVar231;
          local_760._24_4_ =
               fStack_288 * fVar167 +
               fVar170 * fStack_428 + fVar166 * fVar254 + fStack_528 * fVar233;
          local_760._28_4_ = fVar196 + fVar195;
          local_800._0_4_ =
               (float)local_460._0_4_ * fVar288 +
               (float)local_520._0_4_ * fVar290 +
               fVar268 * fVar199 + (float)local_6a0._0_4_ * fVar291;
          local_800._4_4_ =
               (float)local_460._4_4_ * fVar136 +
               (float)local_520._4_4_ * fVar171 +
               fVar270 * fVar293 + (float)local_6a0._4_4_ * fVar168;
          local_800._8_4_ =
               fStack_458 * fVar160 +
               fStack_518 * fVar306 + fVar272 * fVar161 + fStack_698 * fVar216;
          local_800._12_4_ =
               fStack_454 * fVar162 +
               fStack_514 * fVar316 + fVar273 * fVar198 + fStack_694 * fVar169;
          local_800._16_4_ =
               fStack_450 * fVar163 +
               fStack_510 * fVar317 + fVar274 * fVar164 + fStack_690 * fVar218;
          local_800._20_4_ =
               fStack_44c * fVar165 +
               fStack_50c * fVar240 + fVar341 * fVar292 + fStack_68c * fVar231;
          local_800._24_4_ =
               fStack_448 * fVar167 +
               fStack_508 * fVar170 + fVar308 * fVar166 + fStack_688 * fVar233;
          local_800._28_4_ = fVar195 + fVar197 + fVar197 + auVar285._28_4_;
          fVar135 = fVar288 * (float)local_2e0._0_4_ +
                    (float)local_a0._0_4_ * fVar290 +
                    (float)local_280._0_4_ * fVar199 + fVar291 * (float)local_2c0._0_4_;
          fVar159 = fVar136 * (float)local_2e0._4_4_ +
                    (float)local_a0._4_4_ * fVar171 +
                    (float)local_280._4_4_ * fVar293 + fVar168 * (float)local_2c0._4_4_;
          fVar172 = fVar160 * fStack_2d8 +
                    fStack_98 * fVar306 + fStack_278 * fVar161 + fVar216 * fStack_2b8;
          fVar191 = fVar162 * fStack_2d4 +
                    fStack_94 * fVar316 + fStack_274 * fVar198 + fVar169 * fStack_2b4;
          fVar192 = fVar163 * fStack_2d0 +
                    fStack_90 * fVar317 + fStack_270 * fVar164 + fVar218 * fStack_2b0;
          fVar193 = fVar165 * fStack_2cc +
                    fStack_8c * fVar240 + fStack_26c * fVar292 + fVar231 * fStack_2ac;
          fVar194 = fVar167 * fStack_2c8 +
                    fStack_88 * fVar170 + fStack_268 * fVar166 + fVar233 * fStack_2a8;
          fVar195 = fVar195 + fVar197 + fVar196;
          pfVar2 = (float *)(bezier_basis1 + lVar133 * 4 + lVar131);
          fVar290 = *pfVar2;
          fVar171 = pfVar2[1];
          fVar306 = pfVar2[2];
          fVar316 = pfVar2[3];
          fVar317 = pfVar2[4];
          fVar240 = pfVar2[5];
          fVar170 = pfVar2[6];
          pfVar4 = (float *)(lVar131 + 0x21acb88 + lVar133 * 4);
          fVar199 = *pfVar4;
          fVar293 = pfVar4[1];
          fVar161 = pfVar4[2];
          fVar198 = pfVar4[3];
          fVar164 = pfVar4[4];
          fVar292 = pfVar4[5];
          fVar166 = pfVar4[6];
          auVar147 = *(undefined1 (*) [32])(lVar131 + 0x21ad00c + lVar133 * 4);
          pfVar4 = (float *)(lVar131 + 0x21ad490 + lVar133 * 4);
          fVar291 = *pfVar4;
          fVar168 = pfVar4[1];
          fVar216 = pfVar4[2];
          fVar169 = pfVar4[3];
          fVar218 = pfVar4[4];
          fVar231 = pfVar4[5];
          fVar233 = pfVar4[6];
          fVar288 = auVar147._0_4_;
          fVar136 = auVar147._4_4_;
          fVar160 = auVar147._8_4_;
          fVar162 = auVar147._12_4_;
          fVar163 = auVar147._16_4_;
          fVar165 = auVar147._20_4_;
          fVar167 = auVar147._24_4_;
          fVar197 = fVar255 + pfVar4[7];
          fVar196 = fVar255 + fVar255 + fStack_524;
          auVar355._0_4_ =
               (float)local_2a0._0_4_ * fVar290 +
               fVar199 * (float)local_440._0_4_ +
               fVar217 * fVar288 + (float)local_540._0_4_ * fVar291;
          auVar355._4_4_ =
               (float)local_2a0._4_4_ * fVar171 +
               fVar293 * (float)local_440._4_4_ +
               fVar230 * fVar136 + (float)local_540._4_4_ * fVar168;
          auVar355._8_4_ =
               fStack_298 * fVar306 +
               fVar161 * fStack_438 + fVar235 * fVar160 + fStack_538 * fVar216;
          auVar355._12_4_ =
               fStack_294 * fVar316 +
               fVar198 * fStack_434 + fVar236 * fVar162 + fStack_534 * fVar169;
          auVar355._16_4_ =
               fStack_290 * fVar317 +
               fVar164 * fStack_430 + fVar249 * fVar163 + fStack_530 * fVar218;
          auVar355._20_4_ =
               fStack_28c * fVar240 +
               fVar292 * fStack_42c + fVar250 * fVar165 + fStack_52c * fVar231;
          auVar355._24_4_ =
               fStack_288 * fVar170 +
               fVar166 * fStack_428 + fVar254 * fVar167 + fStack_528 * fVar233;
          auVar355._28_4_ = fVar197 + fVar196;
          auVar264._0_4_ =
               (float)local_460._0_4_ * fVar290 +
               fVar199 * (float)local_520._0_4_ +
               fVar268 * fVar288 + (float)local_6a0._0_4_ * fVar291;
          auVar264._4_4_ =
               (float)local_460._4_4_ * fVar171 +
               fVar293 * (float)local_520._4_4_ +
               fVar270 * fVar136 + (float)local_6a0._4_4_ * fVar168;
          auVar264._8_4_ =
               fStack_458 * fVar306 +
               fVar161 * fStack_518 + fVar272 * fVar160 + fStack_698 * fVar216;
          auVar264._12_4_ =
               fStack_454 * fVar316 +
               fVar198 * fStack_514 + fVar273 * fVar162 + fStack_694 * fVar169;
          auVar264._16_4_ =
               fStack_450 * fVar317 +
               fVar164 * fStack_510 + fVar274 * fVar163 + fStack_690 * fVar218;
          auVar264._20_4_ =
               fStack_44c * fVar240 +
               fVar292 * fStack_50c + fVar341 * fVar165 + fStack_68c * fVar231;
          auVar264._24_4_ =
               fStack_448 * fVar170 +
               fVar166 * fStack_508 + fVar308 * fVar167 + fStack_688 * fVar233;
          auVar264._28_4_ = fVar196 + fVar255 + fVar255 + fStack_684;
          local_620._0_4_ =
               (float)local_a0._0_4_ * fVar199 +
               (float)local_280._0_4_ * fVar288 + fVar291 * (float)local_2c0._0_4_ +
               fVar290 * (float)local_2e0._0_4_;
          local_620._4_4_ =
               (float)local_a0._4_4_ * fVar293 +
               (float)local_280._4_4_ * fVar136 + fVar168 * (float)local_2c0._4_4_ +
               fVar171 * (float)local_2e0._4_4_;
          fStack_618 = fStack_98 * fVar161 + fStack_278 * fVar160 + fVar216 * fStack_2b8 +
                       fVar306 * fStack_2d8;
          fStack_614 = fStack_94 * fVar198 + fStack_274 * fVar162 + fVar169 * fStack_2b4 +
                       fVar316 * fStack_2d4;
          fStack_610 = fStack_90 * fVar164 + fStack_270 * fVar163 + fVar218 * fStack_2b0 +
                       fVar317 * fStack_2d0;
          fStack_60c = fStack_8c * fVar292 + fStack_26c * fVar165 + fVar231 * fStack_2ac +
                       fVar240 * fStack_2cc;
          fStack_608 = fStack_88 * fVar166 + fStack_268 * fVar167 + fVar233 * fStack_2a8 +
                       fVar170 * fStack_2c8;
          fStack_604 = fVar255 + fVar197 + fVar196;
          auVar22 = vsubps_avx(auVar355,local_760);
          _local_5c0 = vsubps_avx(auVar264,local_800);
          fVar255 = auVar22._0_4_;
          fVar268 = auVar22._4_4_;
          auVar70._4_4_ = fVar268 * local_800._4_4_;
          auVar70._0_4_ = fVar255 * local_800._0_4_;
          fVar270 = auVar22._8_4_;
          auVar70._8_4_ = fVar270 * local_800._8_4_;
          fVar272 = auVar22._12_4_;
          auVar70._12_4_ = fVar272 * local_800._12_4_;
          fVar273 = auVar22._16_4_;
          auVar70._16_4_ = fVar273 * local_800._16_4_;
          fVar274 = auVar22._20_4_;
          auVar70._20_4_ = fVar274 * local_800._20_4_;
          fVar341 = auVar22._24_4_;
          auVar70._24_4_ = fVar341 * local_800._24_4_;
          auVar70._28_4_ = fVar196;
          fVar217 = local_5c0._0_4_;
          fVar230 = local_5c0._4_4_;
          auVar71._4_4_ = local_760._4_4_ * fVar230;
          auVar71._0_4_ = local_760._0_4_ * fVar217;
          fVar235 = local_5c0._8_4_;
          auVar71._8_4_ = local_760._8_4_ * fVar235;
          fVar236 = local_5c0._12_4_;
          auVar71._12_4_ = local_760._12_4_ * fVar236;
          fVar249 = local_5c0._16_4_;
          auVar71._16_4_ = local_760._16_4_ * fVar249;
          fVar250 = local_5c0._20_4_;
          auVar71._20_4_ = local_760._20_4_ * fVar250;
          fVar254 = local_5c0._24_4_;
          auVar71._24_4_ = local_760._24_4_ * fVar254;
          auVar71._28_4_ = auVar264._28_4_;
          auVar23 = vsubps_avx(auVar70,auVar71);
          auVar115._4_4_ = fVar159;
          auVar115._0_4_ = fVar135;
          auVar115._8_4_ = fVar172;
          auVar115._12_4_ = fVar191;
          auVar115._16_4_ = fVar192;
          auVar115._20_4_ = fVar193;
          auVar115._24_4_ = fVar194;
          auVar115._28_4_ = fVar195;
          auVar154 = vmaxps_avx(auVar115,_local_620);
          auVar72._4_4_ = auVar154._4_4_ * auVar154._4_4_ * (fVar268 * fVar268 + fVar230 * fVar230);
          auVar72._0_4_ = auVar154._0_4_ * auVar154._0_4_ * (fVar255 * fVar255 + fVar217 * fVar217);
          auVar72._8_4_ = auVar154._8_4_ * auVar154._8_4_ * (fVar270 * fVar270 + fVar235 * fVar235);
          auVar72._12_4_ =
               auVar154._12_4_ * auVar154._12_4_ * (fVar272 * fVar272 + fVar236 * fVar236);
          auVar72._16_4_ =
               auVar154._16_4_ * auVar154._16_4_ * (fVar273 * fVar273 + fVar249 * fVar249);
          auVar72._20_4_ =
               auVar154._20_4_ * auVar154._20_4_ * (fVar274 * fVar274 + fVar250 * fVar250);
          auVar72._24_4_ =
               auVar154._24_4_ * auVar154._24_4_ * (fVar341 * fVar341 + fVar254 * fVar254);
          auVar72._28_4_ = fVar197 + auVar264._28_4_;
          auVar73._4_4_ = auVar23._4_4_ * auVar23._4_4_;
          auVar73._0_4_ = auVar23._0_4_ * auVar23._0_4_;
          auVar73._8_4_ = auVar23._8_4_ * auVar23._8_4_;
          auVar73._12_4_ = auVar23._12_4_ * auVar23._12_4_;
          auVar73._16_4_ = auVar23._16_4_ * auVar23._16_4_;
          auVar73._20_4_ = auVar23._20_4_ * auVar23._20_4_;
          auVar73._24_4_ = auVar23._24_4_ * auVar23._24_4_;
          auVar73._28_4_ = auVar23._28_4_;
          auVar154 = vcmpps_avx(auVar73,auVar72,2);
          local_3c0 = (uint)lVar133;
          auVar204 = vpshufd_avx(ZEXT416(local_3c0),0);
          auVar243 = vpor_avx(auVar204,_DAT_01f7fcf0);
          auVar204 = vpor_avx(auVar204,_DAT_01fafea0);
          auVar243 = vpcmpgtd_avx(_local_740,auVar243);
          auVar285 = ZEXT1664(auVar243);
          auVar204 = vpcmpgtd_avx(_local_740,auVar204);
          register0x000012d0 = auVar204;
          _local_5a0 = auVar243;
          auVar229 = ZEXT3264(_local_5a0);
          auVar23 = _local_5a0 & auVar154;
          if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar23 >> 0x7f,0) == '\0') &&
                (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar23 >> 0xbf,0) == '\0') &&
              (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar23[0x1f]) {
LAB_010bb2b6:
            auVar158 = ZEXT3264(auVar147);
            fVar217 = (float)local_6c0._0_4_;
            fVar230 = (float)local_6c0._4_4_;
            fVar235 = fStack_6b8;
            fVar236 = fStack_6b4;
            fVar249 = fStack_6b0;
            fVar250 = fStack_6ac;
            fVar254 = fStack_6a8;
            fVar255 = fStack_6a4;
            fVar268 = (float)local_680._0_4_;
            fVar270 = (float)local_680._4_4_;
            fVar272 = fStack_678;
            fVar273 = fStack_674;
            fVar274 = fStack_670;
            fVar341 = fStack_66c;
            fVar308 = fStack_668;
          }
          else {
            local_720 = fVar290 * (float)local_600._0_4_ +
                        fVar199 * (float)local_580._0_4_ +
                        (float)local_c0._0_4_ * fVar288 + fVar232 * fVar291;
            fStack_71c = fVar171 * (float)local_600._4_4_ +
                         fVar293 * (float)local_580._4_4_ +
                         (float)local_c0._4_4_ * fVar136 + fVar234 * fVar168;
            fStack_718 = fVar306 * fStack_5f8 +
                         fVar161 * fStack_578 + fStack_b8 * fVar160 + fVar238 * fVar216;
            fStack_714 = fVar316 * fStack_5f4 +
                         fVar198 * fStack_574 + fStack_b4 * fVar162 + fVar241 * fVar169;
            fStack_710 = fVar317 * fStack_5f0 +
                         fVar164 * fStack_570 + fStack_b0 * fVar163 + fVar232 * fVar218;
            fStack_70c = fVar240 * fStack_5ec +
                         fVar292 * fStack_56c + fStack_ac * fVar165 + fVar234 * fVar231;
            fStack_708 = fVar170 * fStack_5e8 +
                         fVar166 * fStack_568 + fStack_a8 * fVar167 + fVar238 * fVar233;
            fStack_704 = pfVar2[7] + auVar147._28_4_ + local_5c0._28_4_ + 0.0;
            local_7c0._0_4_ = auVar121._0_4_;
            local_7c0._4_4_ = auVar121._4_4_;
            uStack_7b8._0_4_ = auVar121._8_4_;
            uStack_7b8._4_4_ = auVar121._12_4_;
            uStack_7b0._0_4_ = auVar121._16_4_;
            uStack_7b0._4_4_ = auVar121._20_4_;
            uStack_7a8._0_4_ = auVar121._24_4_;
            local_7e0._0_4_ = auVar120._0_4_;
            local_7e0._4_4_ = auVar120._4_4_;
            uStack_7d8._0_4_ = auVar120._8_4_;
            uStack_7d8._4_4_ = auVar120._12_4_;
            uStack_7d0._0_4_ = auVar120._16_4_;
            uStack_7d0._4_4_ = auVar120._20_4_;
            uStack_7c8._0_4_ = auVar120._24_4_;
            local_700._0_4_ = auVar119._0_4_;
            local_700._4_4_ = auVar119._4_4_;
            fStack_6f8 = auVar119._8_4_;
            fStack_6f4 = auVar119._12_4_;
            fStack_6f0 = auVar119._16_4_;
            fStack_6ec = auVar119._20_4_;
            fStack_6e8 = auVar119._24_4_;
            pfVar2 = (float *)(lVar131 + 0x21abdfc + lVar133 * 4);
            fVar217 = *pfVar2;
            fVar230 = pfVar2[1];
            fVar235 = pfVar2[2];
            fVar236 = pfVar2[3];
            fVar249 = pfVar2[4];
            fVar250 = pfVar2[5];
            fVar254 = pfVar2[6];
            pfVar4 = (float *)(lVar131 + 0x21ac280 + lVar133 * 4);
            fVar255 = *pfVar4;
            fVar268 = pfVar4[1];
            fVar270 = pfVar4[2];
            fVar272 = pfVar4[3];
            fVar273 = pfVar4[4];
            fVar274 = pfVar4[5];
            fVar341 = pfVar4[6];
            pfVar5 = (float *)(lVar131 + 0x21ab978 + lVar133 * 4);
            fVar308 = *pfVar5;
            fVar288 = pfVar5[1];
            fVar136 = pfVar5[2];
            fVar160 = pfVar5[3];
            fVar162 = pfVar5[4];
            fVar163 = pfVar5[5];
            fVar165 = pfVar5[6];
            fVar170 = pfVar2[7] + pfVar4[7];
            fVar199 = pfVar4[7] + local_760._28_4_ + 0.0;
            fVar293 = local_760._28_4_ + auVar355._28_4_ + local_760._28_4_ + 0.0;
            pfVar2 = (float *)(lVar131 + 0x21ab4f4 + lVar133 * 4);
            fVar167 = *pfVar2;
            fVar290 = pfVar2[1];
            fVar171 = pfVar2[2];
            fVar306 = pfVar2[3];
            fVar316 = pfVar2[4];
            fVar317 = pfVar2[5];
            fVar240 = pfVar2[6];
            local_560 = (float)local_2a0._0_4_ * fVar167 +
                        (float)local_440._0_4_ * fVar308 +
                        (float)local_6c0._0_4_ * fVar217 + (float)local_540._0_4_ * fVar255;
            fStack_55c = (float)local_2a0._4_4_ * fVar290 +
                         (float)local_440._4_4_ * fVar288 +
                         (float)local_6c0._4_4_ * fVar230 + (float)local_540._4_4_ * fVar268;
            fStack_558 = fStack_298 * fVar171 +
                         fStack_438 * fVar136 + fStack_6b8 * fVar235 + fStack_538 * fVar270;
            fStack_554 = fStack_294 * fVar306 +
                         fStack_434 * fVar160 + fStack_6b4 * fVar236 + fStack_534 * fVar272;
            fStack_550 = fStack_290 * fVar316 +
                         fStack_430 * fVar162 + fStack_6b0 * fVar249 + fStack_530 * fVar273;
            fStack_54c = fStack_28c * fVar317 +
                         fStack_42c * fVar163 + fStack_6ac * fVar250 + fStack_52c * fVar274;
            fStack_548 = fStack_288 * fVar240 +
                         fStack_428 * fVar165 + fStack_6a8 * fVar254 + fStack_528 * fVar341;
            fStack_544 = fVar170 + fVar199;
            auVar184._0_4_ =
                 fVar167 * (float)local_460._0_4_ +
                 (float)local_680._0_4_ * fVar217 + (float)local_6a0._0_4_ * fVar255 +
                 (float)local_520._0_4_ * fVar308;
            auVar184._4_4_ =
                 fVar290 * (float)local_460._4_4_ +
                 (float)local_680._4_4_ * fVar230 + (float)local_6a0._4_4_ * fVar268 +
                 (float)local_520._4_4_ * fVar288;
            auVar184._8_4_ =
                 fVar171 * fStack_458 +
                 fStack_678 * fVar235 + fStack_698 * fVar270 + fStack_518 * fVar136;
            auVar184._12_4_ =
                 fVar306 * fStack_454 +
                 fStack_674 * fVar236 + fStack_694 * fVar272 + fStack_514 * fVar160;
            auVar184._16_4_ =
                 fVar316 * fStack_450 +
                 fStack_670 * fVar249 + fStack_690 * fVar273 + fStack_510 * fVar162;
            auVar184._20_4_ =
                 fVar317 * fStack_44c +
                 fStack_66c * fVar250 + fStack_68c * fVar274 + fStack_50c * fVar163;
            auVar184._24_4_ =
                 fVar240 * fStack_448 +
                 fStack_668 * fVar254 + fStack_688 * fVar341 + fStack_508 * fVar165;
            auVar184._28_4_ = fVar199 + fVar293;
            auVar356._0_4_ =
                 fVar308 * (float)local_580._0_4_ +
                 (float)local_c0._0_4_ * fVar217 + fVar232 * fVar255 +
                 fVar167 * (float)local_600._0_4_;
            auVar356._4_4_ =
                 fVar288 * (float)local_580._4_4_ +
                 (float)local_c0._4_4_ * fVar230 + fVar234 * fVar268 +
                 fVar290 * (float)local_600._4_4_;
            auVar356._8_4_ =
                 fVar136 * fStack_578 + fStack_b8 * fVar235 + fVar238 * fVar270 +
                 fVar171 * fStack_5f8;
            auVar356._12_4_ =
                 fVar160 * fStack_574 + fStack_b4 * fVar236 + fVar241 * fVar272 +
                 fVar306 * fStack_5f4;
            auVar356._16_4_ =
                 fVar162 * fStack_570 + fStack_b0 * fVar249 + fVar232 * fVar273 +
                 fVar316 * fStack_5f0;
            auVar356._20_4_ =
                 fVar163 * fStack_56c + fStack_ac * fVar250 + fVar234 * fVar274 +
                 fVar317 * fStack_5ec;
            auVar356._24_4_ =
                 fVar165 * fStack_568 + fStack_a8 * fVar254 + fVar238 * fVar341 +
                 fVar240 * fStack_5e8;
            auVar356._28_4_ = pfVar5[7] + fVar170 + fVar293;
            pfVar2 = (float *)(lVar131 + 0x21ae21c + lVar133 * 4);
            fVar217 = *pfVar2;
            fVar230 = pfVar2[1];
            fVar235 = pfVar2[2];
            fVar236 = pfVar2[3];
            fVar249 = pfVar2[4];
            fVar250 = pfVar2[5];
            fVar254 = pfVar2[6];
            pfVar4 = (float *)(lVar131 + 0x21ae6a0 + lVar133 * 4);
            fVar255 = *pfVar4;
            fVar268 = pfVar4[1];
            fVar270 = pfVar4[2];
            fVar272 = pfVar4[3];
            fVar273 = pfVar4[4];
            fVar274 = pfVar4[5];
            fVar341 = pfVar4[6];
            pfVar5 = (float *)(lVar131 + 0x21add98 + lVar133 * 4);
            fVar308 = *pfVar5;
            fVar288 = pfVar5[1];
            fVar136 = pfVar5[2];
            fVar160 = pfVar5[3];
            fVar162 = pfVar5[4];
            fVar163 = pfVar5[5];
            fVar165 = pfVar5[6];
            pfVar6 = (float *)(lVar131 + 0x21ad914 + lVar133 * 4);
            fVar167 = *pfVar6;
            fVar290 = pfVar6[1];
            fVar171 = pfVar6[2];
            fVar306 = pfVar6[3];
            fVar316 = pfVar6[4];
            fVar317 = pfVar6[5];
            fVar240 = pfVar6[6];
            auVar323._0_4_ =
                 (float)local_2a0._0_4_ * fVar167 +
                 (float)local_440._0_4_ * fVar308 +
                 (float)local_6c0._0_4_ * fVar217 + (float)local_540._0_4_ * fVar255;
            auVar323._4_4_ =
                 (float)local_2a0._4_4_ * fVar290 +
                 (float)local_440._4_4_ * fVar288 +
                 (float)local_6c0._4_4_ * fVar230 + (float)local_540._4_4_ * fVar268;
            auVar323._8_4_ =
                 fStack_298 * fVar171 +
                 fStack_438 * fVar136 + fStack_6b8 * fVar235 + fStack_538 * fVar270;
            auVar323._12_4_ =
                 fStack_294 * fVar306 +
                 fStack_434 * fVar160 + fStack_6b4 * fVar236 + fStack_534 * fVar272;
            auVar323._16_4_ =
                 fStack_290 * fVar316 +
                 fStack_430 * fVar162 + fStack_6b0 * fVar249 + fStack_530 * fVar273;
            auVar323._20_4_ =
                 fStack_28c * fVar317 +
                 fStack_42c * fVar163 + fStack_6ac * fVar250 + fStack_52c * fVar274;
            auVar323._24_4_ =
                 fStack_288 * fVar240 +
                 fStack_428 * fVar165 + fStack_6a8 * fVar254 + fStack_528 * fVar341;
            auVar323._28_4_ = fStack_504 + fStack_504 + fStack_524 + fStack_504;
            auVar350._0_4_ =
                 fVar167 * (float)local_460._0_4_ +
                 fVar308 * (float)local_520._0_4_ +
                 (float)local_680._0_4_ * fVar217 + fVar255 * (float)local_6a0._0_4_;
            auVar350._4_4_ =
                 fVar290 * (float)local_460._4_4_ +
                 fVar288 * (float)local_520._4_4_ +
                 (float)local_680._4_4_ * fVar230 + fVar268 * (float)local_6a0._4_4_;
            auVar350._8_4_ =
                 fVar171 * fStack_458 +
                 fVar136 * fStack_518 + fStack_678 * fVar235 + fVar270 * fStack_698;
            auVar350._12_4_ =
                 fVar306 * fStack_454 +
                 fVar160 * fStack_514 + fStack_674 * fVar236 + fVar272 * fStack_694;
            auVar350._16_4_ =
                 fVar316 * fStack_450 +
                 fVar162 * fStack_510 + fStack_670 * fVar249 + fVar273 * fStack_690;
            auVar350._20_4_ =
                 fVar317 * fStack_44c +
                 fVar163 * fStack_50c + fStack_66c * fVar250 + fVar274 * fStack_68c;
            auVar350._24_4_ =
                 fVar240 * fStack_448 +
                 fVar165 * fStack_508 + fStack_668 * fVar254 + fVar341 * fStack_688;
            auVar350._28_4_ = fStack_504 + fStack_504 + auVar154._28_4_ + fStack_504;
            auVar265._8_4_ = 0x7fffffff;
            auVar265._0_8_ = 0x7fffffff7fffffff;
            auVar265._12_4_ = 0x7fffffff;
            auVar265._16_4_ = 0x7fffffff;
            auVar265._20_4_ = 0x7fffffff;
            auVar265._24_4_ = 0x7fffffff;
            auVar265._28_4_ = 0x7fffffff;
            auVar118._4_4_ = fStack_55c;
            auVar118._0_4_ = local_560;
            auVar118._8_4_ = fStack_558;
            auVar118._12_4_ = fStack_554;
            auVar118._16_4_ = fStack_550;
            auVar118._20_4_ = fStack_54c;
            auVar118._24_4_ = fStack_548;
            auVar118._28_4_ = fStack_544;
            auVar147 = vandps_avx(auVar118,auVar265);
            auVar23 = vandps_avx(auVar184,auVar265);
            auVar23 = vmaxps_avx(auVar147,auVar23);
            auVar147 = vandps_avx(auVar356,auVar265);
            auVar23 = vmaxps_avx(auVar23,auVar147);
            auVar23 = vcmpps_avx(auVar23,local_480,1);
            auVar24 = vblendvps_avx(auVar118,auVar22,auVar23);
            auVar149._0_4_ =
                 fVar167 * (float)local_600._0_4_ +
                 fVar308 * (float)local_580._0_4_ +
                 fVar255 * fVar232 + (float)local_c0._0_4_ * fVar217;
            auVar149._4_4_ =
                 fVar290 * (float)local_600._4_4_ +
                 fVar288 * (float)local_580._4_4_ +
                 fVar268 * fVar234 + (float)local_c0._4_4_ * fVar230;
            auVar149._8_4_ =
                 fVar171 * fStack_5f8 +
                 fVar136 * fStack_578 + fVar270 * fVar238 + fStack_b8 * fVar235;
            auVar149._12_4_ =
                 fVar306 * fStack_5f4 +
                 fVar160 * fStack_574 + fVar272 * fVar241 + fStack_b4 * fVar236;
            auVar149._16_4_ =
                 fVar316 * fStack_5f0 +
                 fVar162 * fStack_570 + fVar273 * fVar232 + fStack_b0 * fVar249;
            auVar149._20_4_ =
                 fVar317 * fStack_5ec +
                 fVar163 * fStack_56c + fVar274 * fVar234 + fStack_ac * fVar250;
            auVar149._24_4_ =
                 fVar240 * fStack_5e8 +
                 fVar165 * fStack_568 + fVar341 * fVar238 + fStack_a8 * fVar254;
            auVar149._28_4_ = auVar147._28_4_ + pfVar5[7] + pfVar4[7] + pfVar2[7];
            auVar370 = vblendvps_avx(auVar184,_local_5c0,auVar23);
            auVar147 = vandps_avx(auVar323,auVar265);
            auVar23 = vandps_avx(auVar350,auVar265);
            auVar25 = vmaxps_avx(auVar147,auVar23);
            auVar147 = vandps_avx(auVar149,auVar265);
            auVar147 = vmaxps_avx(auVar25,auVar147);
            local_880._0_4_ = auVar122._0_4_;
            local_880._4_4_ = auVar122._4_4_;
            fStack_878 = auVar122._8_4_;
            fStack_874 = auVar122._12_4_;
            fStack_870 = auVar122._16_4_;
            fStack_86c = auVar122._20_4_;
            fStack_868 = auVar122._24_4_;
            auVar23 = vcmpps_avx(auVar147,local_480,1);
            auVar147 = vblendvps_avx(auVar323,auVar22,auVar23);
            auVar150._0_4_ =
                 (float)local_600._0_4_ * (float)local_880._0_4_ +
                 (float)local_580._0_4_ * (float)local_7c0._0_4_ +
                 (float)local_c0._0_4_ * (float)local_7e0._0_4_ + fVar232 * (float)local_700._0_4_;
            auVar150._4_4_ =
                 (float)local_600._4_4_ * (float)local_880._4_4_ +
                 (float)local_580._4_4_ * (float)local_7c0._4_4_ +
                 (float)local_c0._4_4_ * (float)local_7e0._4_4_ + fVar234 * (float)local_700._4_4_;
            auVar150._8_4_ =
                 fStack_5f8 * fStack_878 +
                 fStack_578 * (float)uStack_7b8 +
                 fStack_b8 * (float)uStack_7d8 + fVar238 * fStack_6f8;
            auVar150._12_4_ =
                 fStack_5f4 * fStack_874 +
                 fStack_574 * uStack_7b8._4_4_ + fStack_b4 * uStack_7d8._4_4_ + fVar241 * fStack_6f4
            ;
            auVar150._16_4_ =
                 fStack_5f0 * fStack_870 +
                 fStack_570 * (float)uStack_7b0 +
                 fStack_b0 * (float)uStack_7d0 + fVar232 * fStack_6f0;
            auVar150._20_4_ =
                 fStack_5ec * fStack_86c +
                 fStack_56c * uStack_7b0._4_4_ + fStack_ac * uStack_7d0._4_4_ + fVar234 * fStack_6ec
            ;
            auVar150._24_4_ =
                 fStack_5e8 * fStack_868 +
                 fStack_568 * (float)uStack_7a8 +
                 fStack_a8 * (float)uStack_7c8 + fVar238 * fStack_6e8;
            auVar150._28_4_ = auVar25._28_4_ + fStack_704 + local_5c0._28_4_ + 0.0;
            auVar23 = vblendvps_avx(auVar350,_local_5c0,auVar23);
            fVar166 = auVar24._0_4_;
            fVar291 = auVar24._4_4_;
            fVar168 = auVar24._8_4_;
            fVar216 = auVar24._12_4_;
            fVar169 = auVar24._16_4_;
            fVar218 = auVar24._20_4_;
            fVar231 = auVar24._24_4_;
            fVar233 = auVar24._28_4_;
            fVar308 = auVar147._0_4_;
            fVar136 = auVar147._4_4_;
            fVar162 = auVar147._8_4_;
            fVar165 = auVar147._12_4_;
            fVar290 = auVar147._16_4_;
            fVar306 = auVar147._20_4_;
            fVar317 = auVar147._24_4_;
            fVar217 = auVar370._0_4_;
            fVar235 = auVar370._4_4_;
            fVar249 = auVar370._8_4_;
            fVar254 = auVar370._12_4_;
            fVar268 = auVar370._16_4_;
            fVar272 = auVar370._20_4_;
            fVar274 = auVar370._24_4_;
            auVar334._0_4_ = fVar217 * fVar217 + fVar166 * fVar166;
            auVar334._4_4_ = fVar235 * fVar235 + fVar291 * fVar291;
            auVar334._8_4_ = fVar249 * fVar249 + fVar168 * fVar168;
            auVar334._12_4_ = fVar254 * fVar254 + fVar216 * fVar216;
            auVar334._16_4_ = fVar268 * fVar268 + fVar169 * fVar169;
            auVar334._20_4_ = fVar272 * fVar272 + fVar218 * fVar218;
            auVar334._24_4_ = fVar274 * fVar274 + fVar231 * fVar231;
            auVar334._28_4_ = fStack_424 + auVar22._28_4_;
            auVar22 = vrsqrtps_avx(auVar334);
            fVar230 = auVar22._0_4_;
            fVar236 = auVar22._4_4_;
            auVar74._4_4_ = fVar236 * 1.5;
            auVar74._0_4_ = fVar230 * 1.5;
            fVar250 = auVar22._8_4_;
            auVar74._8_4_ = fVar250 * 1.5;
            fVar255 = auVar22._12_4_;
            auVar74._12_4_ = fVar255 * 1.5;
            fVar270 = auVar22._16_4_;
            auVar74._16_4_ = fVar270 * 1.5;
            fVar273 = auVar22._20_4_;
            auVar74._20_4_ = fVar273 * 1.5;
            fVar341 = auVar22._24_4_;
            auVar74._24_4_ = fVar341 * 1.5;
            auVar74._28_4_ = auVar350._28_4_;
            auVar75._4_4_ = fVar236 * fVar236 * fVar236 * auVar334._4_4_ * 0.5;
            auVar75._0_4_ = fVar230 * fVar230 * fVar230 * auVar334._0_4_ * 0.5;
            auVar75._8_4_ = fVar250 * fVar250 * fVar250 * auVar334._8_4_ * 0.5;
            auVar75._12_4_ = fVar255 * fVar255 * fVar255 * auVar334._12_4_ * 0.5;
            auVar75._16_4_ = fVar270 * fVar270 * fVar270 * auVar334._16_4_ * 0.5;
            auVar75._20_4_ = fVar273 * fVar273 * fVar273 * auVar334._20_4_ * 0.5;
            auVar75._24_4_ = fVar341 * fVar341 * fVar341 * auVar334._24_4_ * 0.5;
            auVar75._28_4_ = auVar334._28_4_;
            auVar24 = vsubps_avx(auVar74,auVar75);
            fVar170 = auVar24._0_4_;
            fVar199 = auVar24._4_4_;
            fVar293 = auVar24._8_4_;
            fVar161 = auVar24._12_4_;
            fVar198 = auVar24._16_4_;
            fVar164 = auVar24._20_4_;
            fVar292 = auVar24._24_4_;
            fVar230 = auVar23._0_4_;
            fVar236 = auVar23._4_4_;
            fVar250 = auVar23._8_4_;
            fVar255 = auVar23._12_4_;
            fVar270 = auVar23._16_4_;
            fVar273 = auVar23._20_4_;
            fVar341 = auVar23._24_4_;
            auVar313._0_4_ = fVar230 * fVar230 + fVar308 * fVar308;
            auVar313._4_4_ = fVar236 * fVar236 + fVar136 * fVar136;
            auVar313._8_4_ = fVar250 * fVar250 + fVar162 * fVar162;
            auVar313._12_4_ = fVar255 * fVar255 + fVar165 * fVar165;
            auVar313._16_4_ = fVar270 * fVar270 + fVar290 * fVar290;
            auVar313._20_4_ = fVar273 * fVar273 + fVar306 * fVar306;
            auVar313._24_4_ = fVar341 * fVar341 + fVar317 * fVar317;
            auVar313._28_4_ = auVar22._28_4_ + auVar147._28_4_;
            auVar147 = vrsqrtps_avx(auVar313);
            fVar288 = auVar147._0_4_;
            fVar160 = auVar147._4_4_;
            auVar76._4_4_ = fVar160 * 1.5;
            auVar76._0_4_ = fVar288 * 1.5;
            fVar163 = auVar147._8_4_;
            auVar76._8_4_ = fVar163 * 1.5;
            fVar167 = auVar147._12_4_;
            auVar76._12_4_ = fVar167 * 1.5;
            fVar171 = auVar147._16_4_;
            auVar76._16_4_ = fVar171 * 1.5;
            fVar316 = auVar147._20_4_;
            auVar76._20_4_ = fVar316 * 1.5;
            fVar240 = auVar147._24_4_;
            auVar76._24_4_ = fVar240 * 1.5;
            auVar76._28_4_ = auVar350._28_4_;
            auVar77._4_4_ = fVar160 * fVar160 * fVar160 * auVar313._4_4_ * 0.5;
            auVar77._0_4_ = fVar288 * fVar288 * fVar288 * auVar313._0_4_ * 0.5;
            auVar77._8_4_ = fVar163 * fVar163 * fVar163 * auVar313._8_4_ * 0.5;
            auVar77._12_4_ = fVar167 * fVar167 * fVar167 * auVar313._12_4_ * 0.5;
            auVar77._16_4_ = fVar171 * fVar171 * fVar171 * auVar313._16_4_ * 0.5;
            auVar77._20_4_ = fVar316 * fVar316 * fVar316 * auVar313._20_4_ * 0.5;
            auVar77._24_4_ = fVar240 * fVar240 * fVar240 * auVar313._24_4_ * 0.5;
            auVar77._28_4_ = auVar313._28_4_;
            auVar22 = vsubps_avx(auVar76,auVar77);
            fVar288 = auVar22._0_4_;
            fVar160 = auVar22._4_4_;
            fVar163 = auVar22._8_4_;
            fVar167 = auVar22._12_4_;
            fVar171 = auVar22._16_4_;
            fVar316 = auVar22._20_4_;
            fVar240 = auVar22._24_4_;
            fVar217 = fVar135 * fVar170 * fVar217;
            fVar235 = fVar159 * fVar199 * fVar235;
            auVar78._4_4_ = fVar235;
            auVar78._0_4_ = fVar217;
            fVar249 = fVar172 * fVar293 * fVar249;
            auVar78._8_4_ = fVar249;
            fVar254 = fVar191 * fVar161 * fVar254;
            auVar78._12_4_ = fVar254;
            fVar268 = fVar192 * fVar198 * fVar268;
            auVar78._16_4_ = fVar268;
            fVar272 = fVar193 * fVar164 * fVar272;
            auVar78._20_4_ = fVar272;
            fVar274 = fVar194 * fVar292 * fVar274;
            auVar78._24_4_ = fVar274;
            auVar78._28_4_ = auVar147._28_4_;
            local_880._4_4_ = fVar235 + local_760._4_4_;
            local_880._0_4_ = fVar217 + local_760._0_4_;
            fStack_878 = fVar249 + local_760._8_4_;
            fStack_874 = fVar254 + local_760._12_4_;
            fStack_870 = fVar268 + local_760._16_4_;
            fStack_86c = fVar272 + local_760._20_4_;
            fStack_868 = fVar274 + local_760._24_4_;
            fStack_864 = auVar147._28_4_ + local_760._28_4_;
            fVar217 = fVar135 * fVar170 * -fVar166;
            fVar235 = fVar159 * fVar199 * -fVar291;
            auVar79._4_4_ = fVar235;
            auVar79._0_4_ = fVar217;
            fVar249 = fVar172 * fVar293 * -fVar168;
            auVar79._8_4_ = fVar249;
            fVar254 = fVar191 * fVar161 * -fVar216;
            auVar79._12_4_ = fVar254;
            fVar268 = fVar192 * fVar198 * -fVar169;
            auVar79._16_4_ = fVar268;
            fVar272 = fVar193 * fVar164 * -fVar218;
            auVar79._20_4_ = fVar272;
            fVar274 = fVar194 * fVar292 * -fVar231;
            auVar79._24_4_ = fVar274;
            auVar79._28_4_ = -fVar233;
            local_700._4_4_ = local_800._4_4_ + fVar235;
            local_700._0_4_ = local_800._0_4_ + fVar217;
            fStack_6f8 = local_800._8_4_ + fVar249;
            fStack_6f4 = local_800._12_4_ + fVar254;
            fStack_6f0 = local_800._16_4_ + fVar268;
            fStack_6ec = local_800._20_4_ + fVar272;
            fStack_6e8 = local_800._24_4_ + fVar274;
            fStack_6e4 = local_800._28_4_ + -fVar233;
            fVar217 = fVar170 * 0.0 * fVar135;
            fVar235 = fVar199 * 0.0 * fVar159;
            auVar80._4_4_ = fVar235;
            auVar80._0_4_ = fVar217;
            fVar249 = fVar293 * 0.0 * fVar172;
            auVar80._8_4_ = fVar249;
            fVar254 = fVar161 * 0.0 * fVar191;
            auVar80._12_4_ = fVar254;
            fVar268 = fVar198 * 0.0 * fVar192;
            auVar80._16_4_ = fVar268;
            fVar272 = fVar164 * 0.0 * fVar193;
            auVar80._20_4_ = fVar272;
            fVar274 = fVar292 * 0.0 * fVar194;
            auVar80._24_4_ = fVar274;
            auVar80._28_4_ = fVar233;
            auVar26 = vsubps_avx(local_760,auVar78);
            auVar369._0_4_ = fVar217 + auVar150._0_4_;
            auVar369._4_4_ = fVar235 + auVar150._4_4_;
            auVar369._8_4_ = fVar249 + auVar150._8_4_;
            auVar369._12_4_ = fVar254 + auVar150._12_4_;
            auVar369._16_4_ = fVar268 + auVar150._16_4_;
            auVar369._20_4_ = fVar272 + auVar150._20_4_;
            auVar369._24_4_ = fVar274 + auVar150._24_4_;
            auVar369._28_4_ = fVar233 + auVar150._28_4_;
            fVar217 = (float)local_620._0_4_ * fVar288 * fVar230;
            fVar230 = (float)local_620._4_4_ * fVar160 * fVar236;
            auVar81._4_4_ = fVar230;
            auVar81._0_4_ = fVar217;
            fVar235 = fStack_618 * fVar163 * fVar250;
            auVar81._8_4_ = fVar235;
            fVar236 = fStack_614 * fVar167 * fVar255;
            auVar81._12_4_ = fVar236;
            fVar249 = fStack_610 * fVar171 * fVar270;
            auVar81._16_4_ = fVar249;
            fVar250 = fStack_60c * fVar316 * fVar273;
            auVar81._20_4_ = fVar250;
            fVar254 = fStack_608 * fVar240 * fVar341;
            auVar81._24_4_ = fVar254;
            auVar81._28_4_ = fVar195;
            auVar141 = vsubps_avx(local_800,auVar79);
            auVar357._0_4_ = auVar355._0_4_ + fVar217;
            auVar357._4_4_ = auVar355._4_4_ + fVar230;
            auVar357._8_4_ = auVar355._8_4_ + fVar235;
            auVar357._12_4_ = auVar355._12_4_ + fVar236;
            auVar357._16_4_ = auVar355._16_4_ + fVar249;
            auVar357._20_4_ = auVar355._20_4_ + fVar250;
            auVar357._24_4_ = auVar355._24_4_ + fVar254;
            auVar357._28_4_ = auVar355._28_4_ + fVar195;
            fVar217 = fVar288 * -fVar308 * (float)local_620._0_4_;
            fVar230 = fVar160 * -fVar136 * (float)local_620._4_4_;
            auVar82._4_4_ = fVar230;
            auVar82._0_4_ = fVar217;
            fVar235 = fVar163 * -fVar162 * fStack_618;
            auVar82._8_4_ = fVar235;
            fVar236 = fVar167 * -fVar165 * fStack_614;
            auVar82._12_4_ = fVar236;
            fVar249 = fVar171 * -fVar290 * fStack_610;
            auVar82._16_4_ = fVar249;
            fVar250 = fVar316 * -fVar306 * fStack_60c;
            auVar82._20_4_ = fVar250;
            fVar254 = fVar240 * -fVar317 * fStack_608;
            auVar82._24_4_ = fVar254;
            auVar82._28_4_ = local_760._28_4_;
            auVar142 = vsubps_avx(auVar150,auVar80);
            auVar248._0_4_ = auVar264._0_4_ + fVar217;
            auVar248._4_4_ = auVar264._4_4_ + fVar230;
            auVar248._8_4_ = auVar264._8_4_ + fVar235;
            auVar248._12_4_ = auVar264._12_4_ + fVar236;
            auVar248._16_4_ = auVar264._16_4_ + fVar249;
            auVar248._20_4_ = auVar264._20_4_ + fVar250;
            auVar248._24_4_ = auVar264._24_4_ + fVar254;
            auVar248._28_4_ = auVar264._28_4_ + local_760._28_4_;
            fVar217 = fVar288 * 0.0 * (float)local_620._0_4_;
            fVar230 = fVar160 * 0.0 * (float)local_620._4_4_;
            auVar83._4_4_ = fVar230;
            auVar83._0_4_ = fVar217;
            fVar235 = fVar163 * 0.0 * fStack_618;
            auVar83._8_4_ = fVar235;
            fVar236 = fVar167 * 0.0 * fStack_614;
            auVar83._12_4_ = fVar236;
            fVar249 = fVar171 * 0.0 * fStack_610;
            auVar83._16_4_ = fVar249;
            fVar250 = fVar316 * 0.0 * fStack_60c;
            auVar83._20_4_ = fVar250;
            fVar254 = fVar240 * 0.0 * fStack_608;
            auVar83._24_4_ = fVar254;
            auVar83._28_4_ = auVar150._28_4_;
            auVar147 = vsubps_avx(auVar355,auVar81);
            auVar117._4_4_ = fStack_71c;
            auVar117._0_4_ = local_720;
            auVar117._8_4_ = fStack_718;
            auVar117._12_4_ = fStack_714;
            auVar117._16_4_ = fStack_710;
            auVar117._20_4_ = fStack_70c;
            auVar117._24_4_ = fStack_708;
            auVar117._28_4_ = fStack_704;
            auVar324._0_4_ = local_720 + fVar217;
            auVar324._4_4_ = fStack_71c + fVar230;
            auVar324._8_4_ = fStack_718 + fVar235;
            auVar324._12_4_ = fStack_714 + fVar236;
            auVar324._16_4_ = fStack_710 + fVar249;
            auVar324._20_4_ = fStack_70c + fVar250;
            auVar324._24_4_ = fStack_708 + fVar254;
            auVar324._28_4_ = fStack_704 + auVar150._28_4_;
            auVar23 = vsubps_avx(auVar264,auVar82);
            auVar24 = vsubps_avx(auVar117,auVar83);
            auVar370 = vsubps_avx(auVar248,auVar141);
            auVar25 = vsubps_avx(auVar324,auVar142);
            auVar84._4_4_ = auVar142._4_4_ * auVar370._4_4_;
            auVar84._0_4_ = auVar142._0_4_ * auVar370._0_4_;
            auVar84._8_4_ = auVar142._8_4_ * auVar370._8_4_;
            auVar84._12_4_ = auVar142._12_4_ * auVar370._12_4_;
            auVar84._16_4_ = auVar142._16_4_ * auVar370._16_4_;
            auVar84._20_4_ = auVar142._20_4_ * auVar370._20_4_;
            auVar84._24_4_ = auVar142._24_4_ * auVar370._24_4_;
            auVar84._28_4_ = auVar350._28_4_;
            auVar85._4_4_ = auVar141._4_4_ * auVar25._4_4_;
            auVar85._0_4_ = auVar141._0_4_ * auVar25._0_4_;
            auVar85._8_4_ = auVar141._8_4_ * auVar25._8_4_;
            auVar85._12_4_ = auVar141._12_4_ * auVar25._12_4_;
            auVar85._16_4_ = auVar141._16_4_ * auVar25._16_4_;
            auVar85._20_4_ = auVar141._20_4_ * auVar25._20_4_;
            auVar85._24_4_ = auVar141._24_4_ * auVar25._24_4_;
            auVar85._28_4_ = auVar264._28_4_;
            auVar27 = vsubps_avx(auVar85,auVar84);
            auVar86._4_4_ = auVar26._4_4_ * auVar25._4_4_;
            auVar86._0_4_ = auVar26._0_4_ * auVar25._0_4_;
            auVar86._8_4_ = auVar26._8_4_ * auVar25._8_4_;
            auVar86._12_4_ = auVar26._12_4_ * auVar25._12_4_;
            auVar86._16_4_ = auVar26._16_4_ * auVar25._16_4_;
            auVar86._20_4_ = auVar26._20_4_ * auVar25._20_4_;
            auVar86._24_4_ = auVar26._24_4_ * auVar25._24_4_;
            auVar86._28_4_ = auVar25._28_4_;
            auVar25 = vsubps_avx(auVar357,auVar26);
            auVar87._4_4_ = auVar142._4_4_ * auVar25._4_4_;
            auVar87._0_4_ = auVar142._0_4_ * auVar25._0_4_;
            auVar87._8_4_ = auVar142._8_4_ * auVar25._8_4_;
            auVar87._12_4_ = auVar142._12_4_ * auVar25._12_4_;
            auVar87._16_4_ = auVar142._16_4_ * auVar25._16_4_;
            auVar87._20_4_ = auVar142._20_4_ * auVar25._20_4_;
            auVar87._24_4_ = auVar142._24_4_ * auVar25._24_4_;
            auVar87._28_4_ = auVar22._28_4_;
            auVar28 = vsubps_avx(auVar87,auVar86);
            auVar88._4_4_ = auVar141._4_4_ * auVar25._4_4_;
            auVar88._0_4_ = auVar141._0_4_ * auVar25._0_4_;
            auVar88._8_4_ = auVar141._8_4_ * auVar25._8_4_;
            auVar88._12_4_ = auVar141._12_4_ * auVar25._12_4_;
            auVar88._16_4_ = auVar141._16_4_ * auVar25._16_4_;
            auVar88._20_4_ = auVar141._20_4_ * auVar25._20_4_;
            auVar88._24_4_ = auVar141._24_4_ * auVar25._24_4_;
            auVar88._28_4_ = auVar22._28_4_;
            auVar89._4_4_ = auVar26._4_4_ * auVar370._4_4_;
            auVar89._0_4_ = auVar26._0_4_ * auVar370._0_4_;
            auVar89._8_4_ = auVar26._8_4_ * auVar370._8_4_;
            auVar89._12_4_ = auVar26._12_4_ * auVar370._12_4_;
            auVar89._16_4_ = auVar26._16_4_ * auVar370._16_4_;
            auVar89._20_4_ = auVar26._20_4_ * auVar370._20_4_;
            auVar89._24_4_ = auVar26._24_4_ * auVar370._24_4_;
            auVar89._28_4_ = auVar370._28_4_;
            auVar22 = vsubps_avx(auVar89,auVar88);
            auVar185._0_4_ = auVar27._0_4_ * 0.0 + auVar22._0_4_ + auVar28._0_4_ * 0.0;
            auVar185._4_4_ = auVar27._4_4_ * 0.0 + auVar22._4_4_ + auVar28._4_4_ * 0.0;
            auVar185._8_4_ = auVar27._8_4_ * 0.0 + auVar22._8_4_ + auVar28._8_4_ * 0.0;
            auVar185._12_4_ = auVar27._12_4_ * 0.0 + auVar22._12_4_ + auVar28._12_4_ * 0.0;
            auVar185._16_4_ = auVar27._16_4_ * 0.0 + auVar22._16_4_ + auVar28._16_4_ * 0.0;
            auVar185._20_4_ = auVar27._20_4_ * 0.0 + auVar22._20_4_ + auVar28._20_4_ * 0.0;
            auVar185._24_4_ = auVar27._24_4_ * 0.0 + auVar22._24_4_ + auVar28._24_4_ * 0.0;
            auVar185._28_4_ = auVar27._28_4_ + auVar22._28_4_ + auVar28._28_4_;
            auVar21 = vcmpps_avx(auVar185,ZEXT832(0) << 0x20,2);
            auVar147 = vblendvps_avx(auVar147,_local_880,auVar21);
            auVar22 = vblendvps_avx(auVar23,_local_700,auVar21);
            auVar23 = vblendvps_avx(auVar24,auVar369,auVar21);
            auVar24 = vblendvps_avx(auVar26,auVar357,auVar21);
            auVar370 = vblendvps_avx(auVar141,auVar248,auVar21);
            auVar25 = vblendvps_avx(auVar142,auVar324,auVar21);
            auVar26 = vblendvps_avx(auVar357,auVar26,auVar21);
            auVar27 = vblendvps_avx(auVar248,auVar141,auVar21);
            auVar28 = vblendvps_avx(auVar324,auVar142,auVar21);
            local_800 = vandps_avx(auVar154,_local_5a0);
            auVar26 = vsubps_avx(auVar26,auVar147);
            auVar178 = vsubps_avx(auVar27,auVar22);
            auVar28 = vsubps_avx(auVar28,auVar23);
            auVar179 = vsubps_avx(auVar22,auVar370);
            fVar217 = auVar178._0_4_;
            fVar257 = auVar23._0_4_;
            fVar255 = auVar178._4_4_;
            fVar267 = auVar23._4_4_;
            auVar90._4_4_ = fVar267 * fVar255;
            auVar90._0_4_ = fVar257 * fVar217;
            fVar308 = auVar178._8_4_;
            fVar269 = auVar23._8_4_;
            auVar90._8_4_ = fVar269 * fVar308;
            fVar167 = auVar178._12_4_;
            fVar271 = auVar23._12_4_;
            auVar90._12_4_ = fVar271 * fVar167;
            fVar170 = auVar178._16_4_;
            fVar275 = auVar23._16_4_;
            auVar90._16_4_ = fVar275 * fVar170;
            fVar166 = auVar178._20_4_;
            fVar286 = auVar23._20_4_;
            auVar90._20_4_ = fVar286 * fVar166;
            fVar233 = auVar178._24_4_;
            fVar287 = auVar23._24_4_;
            auVar90._24_4_ = fVar287 * fVar233;
            auVar90._28_4_ = auVar27._28_4_;
            fVar230 = auVar22._0_4_;
            fVar289 = auVar28._0_4_;
            fVar268 = auVar22._4_4_;
            fVar294 = auVar28._4_4_;
            auVar91._4_4_ = fVar294 * fVar268;
            auVar91._0_4_ = fVar289 * fVar230;
            fVar288 = auVar22._8_4_;
            fVar303 = auVar28._8_4_;
            auVar91._8_4_ = fVar303 * fVar288;
            fVar290 = auVar22._12_4_;
            fVar304 = auVar28._12_4_;
            auVar91._12_4_ = fVar304 * fVar290;
            fVar199 = auVar22._16_4_;
            fVar305 = auVar28._16_4_;
            auVar91._16_4_ = fVar305 * fVar199;
            fVar291 = auVar22._20_4_;
            fVar318 = auVar28._20_4_;
            auVar91._20_4_ = fVar318 * fVar291;
            fVar196 = auVar22._24_4_;
            fVar319 = auVar28._24_4_;
            uVar7 = auVar141._28_4_;
            auVar91._24_4_ = fVar319 * fVar196;
            auVar91._28_4_ = uVar7;
            auVar27 = vsubps_avx(auVar91,auVar90);
            fVar235 = auVar147._0_4_;
            fVar270 = auVar147._4_4_;
            auVar92._4_4_ = fVar294 * fVar270;
            auVar92._0_4_ = fVar289 * fVar235;
            fVar136 = auVar147._8_4_;
            auVar92._8_4_ = fVar303 * fVar136;
            fVar171 = auVar147._12_4_;
            auVar92._12_4_ = fVar304 * fVar171;
            fVar293 = auVar147._16_4_;
            auVar92._16_4_ = fVar305 * fVar293;
            fVar168 = auVar147._20_4_;
            auVar92._20_4_ = fVar318 * fVar168;
            fVar197 = auVar147._24_4_;
            auVar92._24_4_ = fVar319 * fVar197;
            auVar92._28_4_ = uVar7;
            fVar236 = auVar26._0_4_;
            fVar272 = auVar26._4_4_;
            auVar93._4_4_ = fVar267 * fVar272;
            auVar93._0_4_ = fVar257 * fVar236;
            fVar160 = auVar26._8_4_;
            auVar93._8_4_ = fVar269 * fVar160;
            fVar306 = auVar26._12_4_;
            auVar93._12_4_ = fVar271 * fVar306;
            fVar161 = auVar26._16_4_;
            auVar93._16_4_ = fVar275 * fVar161;
            fVar216 = auVar26._20_4_;
            auVar93._20_4_ = fVar286 * fVar216;
            fVar237 = auVar26._24_4_;
            auVar93._24_4_ = fVar287 * fVar237;
            auVar93._28_4_ = auVar357._28_4_;
            auVar141 = vsubps_avx(auVar93,auVar92);
            auVar94._4_4_ = fVar268 * fVar272;
            auVar94._0_4_ = fVar230 * fVar236;
            auVar94._8_4_ = fVar288 * fVar160;
            auVar94._12_4_ = fVar290 * fVar306;
            auVar94._16_4_ = fVar199 * fVar161;
            auVar94._20_4_ = fVar291 * fVar216;
            auVar94._24_4_ = fVar196 * fVar237;
            auVar94._28_4_ = uVar7;
            auVar95._4_4_ = fVar270 * fVar255;
            auVar95._0_4_ = fVar235 * fVar217;
            auVar95._8_4_ = fVar136 * fVar308;
            auVar95._12_4_ = fVar171 * fVar167;
            auVar95._16_4_ = fVar293 * fVar170;
            auVar95._20_4_ = fVar168 * fVar166;
            auVar95._24_4_ = fVar197 * fVar233;
            auVar95._28_4_ = auVar142._28_4_;
            auVar142 = vsubps_avx(auVar95,auVar94);
            auVar23 = vsubps_avx(auVar23,auVar25);
            fVar250 = auVar142._28_4_ + auVar141._28_4_;
            auVar335._0_4_ = auVar142._0_4_ + auVar141._0_4_ * 0.0 + auVar27._0_4_ * 0.0;
            auVar335._4_4_ = auVar142._4_4_ + auVar141._4_4_ * 0.0 + auVar27._4_4_ * 0.0;
            auVar335._8_4_ = auVar142._8_4_ + auVar141._8_4_ * 0.0 + auVar27._8_4_ * 0.0;
            auVar335._12_4_ = auVar142._12_4_ + auVar141._12_4_ * 0.0 + auVar27._12_4_ * 0.0;
            auVar335._16_4_ = auVar142._16_4_ + auVar141._16_4_ * 0.0 + auVar27._16_4_ * 0.0;
            auVar335._20_4_ = auVar142._20_4_ + auVar141._20_4_ * 0.0 + auVar27._20_4_ * 0.0;
            auVar335._24_4_ = auVar142._24_4_ + auVar141._24_4_ * 0.0 + auVar27._24_4_ * 0.0;
            auVar335._28_4_ = fVar250 + auVar27._28_4_;
            fVar249 = auVar179._0_4_;
            fVar273 = auVar179._4_4_;
            auVar96._4_4_ = auVar25._4_4_ * fVar273;
            auVar96._0_4_ = auVar25._0_4_ * fVar249;
            fVar162 = auVar179._8_4_;
            auVar96._8_4_ = auVar25._8_4_ * fVar162;
            fVar316 = auVar179._12_4_;
            auVar96._12_4_ = auVar25._12_4_ * fVar316;
            fVar198 = auVar179._16_4_;
            auVar96._16_4_ = auVar25._16_4_ * fVar198;
            fVar169 = auVar179._20_4_;
            auVar96._20_4_ = auVar25._20_4_ * fVar169;
            fVar239 = auVar179._24_4_;
            auVar96._24_4_ = auVar25._24_4_ * fVar239;
            auVar96._28_4_ = fVar250;
            fVar250 = auVar23._0_4_;
            fVar274 = auVar23._4_4_;
            auVar97._4_4_ = auVar370._4_4_ * fVar274;
            auVar97._0_4_ = auVar370._0_4_ * fVar250;
            fVar163 = auVar23._8_4_;
            auVar97._8_4_ = auVar370._8_4_ * fVar163;
            fVar317 = auVar23._12_4_;
            auVar97._12_4_ = auVar370._12_4_ * fVar317;
            fVar164 = auVar23._16_4_;
            auVar97._16_4_ = auVar370._16_4_ * fVar164;
            fVar218 = auVar23._20_4_;
            auVar97._20_4_ = auVar370._20_4_ * fVar218;
            fVar307 = auVar23._24_4_;
            auVar97._24_4_ = auVar370._24_4_ * fVar307;
            auVar97._28_4_ = auVar142._28_4_;
            auVar141 = vsubps_avx(auVar97,auVar96);
            auVar147 = vsubps_avx(auVar147,auVar24);
            fVar254 = auVar147._0_4_;
            fVar341 = auVar147._4_4_;
            auVar98._4_4_ = auVar25._4_4_ * fVar341;
            auVar98._0_4_ = auVar25._0_4_ * fVar254;
            fVar165 = auVar147._8_4_;
            auVar98._8_4_ = auVar25._8_4_ * fVar165;
            fVar240 = auVar147._12_4_;
            auVar98._12_4_ = auVar25._12_4_ * fVar240;
            fVar292 = auVar147._16_4_;
            auVar98._16_4_ = auVar25._16_4_ * fVar292;
            fVar231 = auVar147._20_4_;
            auVar98._20_4_ = auVar25._20_4_ * fVar231;
            fVar252 = auVar147._24_4_;
            auVar98._24_4_ = auVar25._24_4_ * fVar252;
            auVar98._28_4_ = auVar25._28_4_;
            auVar99._4_4_ = fVar274 * auVar24._4_4_;
            auVar99._0_4_ = fVar250 * auVar24._0_4_;
            auVar99._8_4_ = fVar163 * auVar24._8_4_;
            auVar99._12_4_ = fVar317 * auVar24._12_4_;
            auVar99._16_4_ = fVar164 * auVar24._16_4_;
            auVar99._20_4_ = fVar218 * auVar24._20_4_;
            auVar99._24_4_ = fVar307 * auVar24._24_4_;
            auVar99._28_4_ = auVar27._28_4_;
            auVar147 = vsubps_avx(auVar98,auVar99);
            auVar315 = ZEXT1264(ZEXT412(0)) << 0x20;
            auVar100._4_4_ = auVar370._4_4_ * fVar341;
            auVar100._0_4_ = auVar370._0_4_ * fVar254;
            auVar100._8_4_ = auVar370._8_4_ * fVar165;
            auVar100._12_4_ = auVar370._12_4_ * fVar240;
            auVar100._16_4_ = auVar370._16_4_ * fVar292;
            auVar100._20_4_ = auVar370._20_4_ * fVar231;
            auVar100._24_4_ = auVar370._24_4_ * fVar252;
            auVar100._28_4_ = auVar370._28_4_;
            auVar101._4_4_ = fVar273 * auVar24._4_4_;
            auVar101._0_4_ = fVar249 * auVar24._0_4_;
            auVar101._8_4_ = fVar162 * auVar24._8_4_;
            auVar101._12_4_ = fVar316 * auVar24._12_4_;
            auVar101._16_4_ = fVar198 * auVar24._16_4_;
            auVar101._20_4_ = fVar169 * auVar24._20_4_;
            auVar101._24_4_ = fVar239 * auVar24._24_4_;
            auVar101._28_4_ = auVar24._28_4_;
            auVar24 = vsubps_avx(auVar101,auVar100);
            auVar370 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar151._0_4_ = auVar141._0_4_ * 0.0 + auVar24._0_4_ + auVar147._0_4_ * 0.0;
            auVar151._4_4_ = auVar141._4_4_ * 0.0 + auVar24._4_4_ + auVar147._4_4_ * 0.0;
            auVar151._8_4_ = auVar141._8_4_ * 0.0 + auVar24._8_4_ + auVar147._8_4_ * 0.0;
            auVar151._12_4_ = auVar141._12_4_ * 0.0 + auVar24._12_4_ + auVar147._12_4_ * 0.0;
            auVar151._16_4_ = auVar141._16_4_ * 0.0 + auVar24._16_4_ + auVar147._16_4_ * 0.0;
            auVar151._20_4_ = auVar141._20_4_ * 0.0 + auVar24._20_4_ + auVar147._20_4_ * 0.0;
            auVar151._24_4_ = auVar141._24_4_ * 0.0 + auVar24._24_4_ + auVar147._24_4_ * 0.0;
            auVar151._28_4_ = auVar147._28_4_ + auVar24._28_4_ + auVar147._28_4_;
            auVar158 = ZEXT3264(auVar151);
            auVar147 = vmaxps_avx(auVar335,auVar151);
            auVar147 = vcmpps_avx(auVar147,auVar370,2);
            auVar24 = local_800 & auVar147;
            auVar109 = auVar22;
            if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar24 >> 0x7f,0) == '\0') &&
                  (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar24 >> 0xbf,0) == '\0') &&
                (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar24[0x1f]) {
LAB_010bbc2c:
              auVar285 = ZEXT3264(auVar109);
              auVar229 = ZEXT3264(CONCAT824(local_660[1]._24_8_,
                                            CONCAT816(local_660[1]._16_8_,
                                                      CONCAT88(local_660[1]._8_8_,local_660[1]._0_8_
                                                              ))));
              auVar345._4_4_ = fVar159;
              auVar345._0_4_ = fVar135;
              auVar345._8_4_ = fVar172;
              auVar345._12_4_ = fVar191;
              auVar345._16_4_ = fVar192;
              auVar345._20_4_ = fVar193;
              auVar345._24_4_ = fVar194;
              auVar345._28_4_ = fVar195;
            }
            else {
              auVar24 = vandps_avx(auVar147,local_800);
              auVar102._4_4_ = fVar274 * fVar255;
              auVar102._0_4_ = fVar250 * fVar217;
              auVar102._8_4_ = fVar163 * fVar308;
              auVar102._12_4_ = fVar317 * fVar167;
              auVar102._16_4_ = fVar164 * fVar170;
              auVar102._20_4_ = fVar218 * fVar166;
              auVar102._24_4_ = fVar307 * fVar233;
              auVar102._28_4_ = local_800._28_4_;
              auVar103._4_4_ = fVar273 * fVar294;
              auVar103._0_4_ = fVar249 * fVar289;
              auVar103._8_4_ = fVar162 * fVar303;
              auVar103._12_4_ = fVar316 * fVar304;
              auVar103._16_4_ = fVar198 * fVar305;
              auVar103._20_4_ = fVar169 * fVar318;
              auVar103._24_4_ = fVar239 * fVar319;
              auVar103._28_4_ = auVar147._28_4_;
              auVar25 = vsubps_avx(auVar103,auVar102);
              auVar104._4_4_ = fVar341 * fVar294;
              auVar104._0_4_ = fVar254 * fVar289;
              auVar104._8_4_ = fVar165 * fVar303;
              auVar104._12_4_ = fVar240 * fVar304;
              auVar104._16_4_ = fVar292 * fVar305;
              auVar104._20_4_ = fVar231 * fVar318;
              auVar104._24_4_ = fVar252 * fVar319;
              auVar104._28_4_ = auVar28._28_4_;
              auVar105._4_4_ = fVar274 * fVar272;
              auVar105._0_4_ = fVar250 * fVar236;
              auVar105._8_4_ = fVar163 * fVar160;
              auVar105._12_4_ = fVar317 * fVar306;
              auVar105._16_4_ = fVar164 * fVar161;
              auVar105._20_4_ = fVar218 * fVar216;
              auVar105._24_4_ = fVar307 * fVar237;
              auVar105._28_4_ = auVar23._28_4_;
              auVar27 = vsubps_avx(auVar105,auVar104);
              auVar106._4_4_ = fVar273 * fVar272;
              auVar106._0_4_ = fVar249 * fVar236;
              auVar106._8_4_ = fVar162 * fVar160;
              auVar106._12_4_ = fVar316 * fVar306;
              auVar106._16_4_ = fVar198 * fVar161;
              auVar106._20_4_ = fVar169 * fVar216;
              auVar106._24_4_ = fVar239 * fVar237;
              auVar106._28_4_ = auVar26._28_4_;
              auVar107._4_4_ = fVar341 * fVar255;
              auVar107._0_4_ = fVar254 * fVar217;
              auVar107._8_4_ = fVar165 * fVar308;
              auVar107._12_4_ = fVar240 * fVar167;
              auVar107._16_4_ = fVar292 * fVar170;
              auVar107._20_4_ = fVar231 * fVar166;
              auVar107._24_4_ = fVar252 * fVar233;
              auVar107._28_4_ = auVar178._28_4_;
              auVar28 = vsubps_avx(auVar107,auVar106);
              auVar314._0_4_ = auVar25._0_4_ * 0.0 + auVar28._0_4_ + auVar27._0_4_ * 0.0;
              auVar314._4_4_ = auVar25._4_4_ * 0.0 + auVar28._4_4_ + auVar27._4_4_ * 0.0;
              auVar314._8_4_ = auVar25._8_4_ * 0.0 + auVar28._8_4_ + auVar27._8_4_ * 0.0;
              auVar314._12_4_ = auVar25._12_4_ * 0.0 + auVar28._12_4_ + auVar27._12_4_ * 0.0;
              auVar314._16_4_ = auVar25._16_4_ * 0.0 + auVar28._16_4_ + auVar27._16_4_ * 0.0;
              auVar314._20_4_ = auVar25._20_4_ * 0.0 + auVar28._20_4_ + auVar27._20_4_ * 0.0;
              auVar314._24_4_ = auVar25._24_4_ * 0.0 + auVar28._24_4_ + auVar27._24_4_ * 0.0;
              auVar314._28_4_ = auVar179._28_4_ + auVar28._28_4_ + auVar26._28_4_;
              auVar147 = vrcpps_avx(auVar314);
              fVar217 = auVar147._0_4_;
              fVar236 = auVar147._4_4_;
              auVar108._4_4_ = auVar314._4_4_ * fVar236;
              auVar108._0_4_ = auVar314._0_4_ * fVar217;
              fVar249 = auVar147._8_4_;
              auVar108._8_4_ = auVar314._8_4_ * fVar249;
              fVar250 = auVar147._12_4_;
              auVar108._12_4_ = auVar314._12_4_ * fVar250;
              fVar254 = auVar147._16_4_;
              auVar108._16_4_ = auVar314._16_4_ * fVar254;
              fVar255 = auVar147._20_4_;
              auVar108._20_4_ = auVar314._20_4_ * fVar255;
              fVar272 = auVar147._24_4_;
              auVar108._24_4_ = auVar314._24_4_ * fVar272;
              auVar108._28_4_ = auVar23._28_4_;
              auVar351._8_4_ = 0x3f800000;
              auVar351._0_8_ = 0x3f8000003f800000;
              auVar351._12_4_ = 0x3f800000;
              auVar351._16_4_ = 0x3f800000;
              auVar351._20_4_ = 0x3f800000;
              auVar351._24_4_ = 0x3f800000;
              auVar351._28_4_ = 0x3f800000;
              auVar147 = vsubps_avx(auVar351,auVar108);
              fVar217 = auVar147._0_4_ * fVar217 + fVar217;
              fVar236 = auVar147._4_4_ * fVar236 + fVar236;
              fVar249 = auVar147._8_4_ * fVar249 + fVar249;
              fVar250 = auVar147._12_4_ * fVar250 + fVar250;
              fVar254 = auVar147._16_4_ * fVar254 + fVar254;
              fVar255 = auVar147._20_4_ * fVar255 + fVar255;
              fVar272 = auVar147._24_4_ * fVar272 + fVar272;
              fVar230 = auVar27._0_4_ * fVar230;
              fVar268 = auVar27._4_4_ * fVar268;
              auVar109._4_4_ = fVar268;
              auVar109._0_4_ = fVar230;
              fVar288 = auVar27._8_4_ * fVar288;
              auVar109._8_4_ = fVar288;
              fVar290 = auVar27._12_4_ * fVar290;
              auVar109._12_4_ = fVar290;
              fVar199 = auVar27._16_4_ * fVar199;
              auVar109._16_4_ = fVar199;
              fVar291 = auVar27._20_4_ * fVar291;
              auVar109._20_4_ = fVar291;
              fVar196 = auVar27._24_4_ * fVar196;
              auVar109._24_4_ = fVar196;
              auVar109._28_4_ = auVar22._28_4_;
              auVar110._4_4_ =
                   (fVar270 * auVar25._4_4_ + fVar268 + fVar267 * auVar28._4_4_) * fVar236;
              auVar110._0_4_ =
                   (fVar235 * auVar25._0_4_ + fVar230 + fVar257 * auVar28._0_4_) * fVar217;
              auVar110._8_4_ =
                   (fVar136 * auVar25._8_4_ + fVar288 + fVar269 * auVar28._8_4_) * fVar249;
              auVar110._12_4_ =
                   (fVar171 * auVar25._12_4_ + fVar290 + fVar271 * auVar28._12_4_) * fVar250;
              auVar110._16_4_ =
                   (fVar293 * auVar25._16_4_ + fVar199 + fVar275 * auVar28._16_4_) * fVar254;
              auVar110._20_4_ =
                   (fVar168 * auVar25._20_4_ + fVar291 + fVar286 * auVar28._20_4_) * fVar255;
              auVar110._24_4_ =
                   (fVar197 * auVar25._24_4_ + fVar196 + fVar287 * auVar28._24_4_) * fVar272;
              auVar110._28_4_ = auVar22._28_4_ + auVar28._28_4_;
              uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar228._4_4_ = uVar7;
              auVar228._0_4_ = uVar7;
              auVar228._8_4_ = uVar7;
              auVar228._12_4_ = uVar7;
              auVar228._16_4_ = uVar7;
              auVar228._20_4_ = uVar7;
              auVar228._24_4_ = uVar7;
              auVar228._28_4_ = uVar7;
              auVar22 = vcmpps_avx(_local_4a0,auVar110,2);
              auVar147 = vcmpps_avx(auVar110,auVar228,2);
              auVar147 = vandps_avx(auVar22,auVar147);
              auVar23 = auVar24 & auVar147;
              if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar23 >> 0x7f,0) == '\0') &&
                    (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar23 >> 0xbf,0) == '\0') &&
                  (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar23[0x1f]) goto LAB_010bbc2c;
              auVar147 = vandps_avx(auVar24,auVar147);
              auVar285 = ZEXT3264(auVar147);
              auVar23 = vcmpps_avx(auVar314,auVar370,4);
              auVar24 = auVar147 & auVar23;
              auVar229 = ZEXT3264(CONCAT824(local_660[1]._24_8_,
                                            CONCAT816(local_660[1]._16_8_,
                                                      CONCAT88(local_660[1]._8_8_,local_660[1]._0_8_
                                                              ))));
              auVar345._4_4_ = fVar159;
              auVar345._0_4_ = fVar135;
              auVar345._8_4_ = fVar172;
              auVar345._12_4_ = fVar191;
              auVar345._16_4_ = fVar192;
              auVar345._20_4_ = fVar193;
              auVar345._24_4_ = fVar194;
              auVar345._28_4_ = fVar195;
              if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar24 >> 0x7f,0) != '\0') ||
                    (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar24 >> 0xbf,0) != '\0') ||
                  (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar24[0x1f] < '\0') {
                auVar147 = vandps_avx(auVar23,auVar147);
                auVar229 = ZEXT3264(auVar147);
                auVar111._4_4_ = auVar335._4_4_ * fVar236;
                auVar111._0_4_ = auVar335._0_4_ * fVar217;
                auVar111._8_4_ = auVar335._8_4_ * fVar249;
                auVar111._12_4_ = auVar335._12_4_ * fVar250;
                auVar111._16_4_ = auVar335._16_4_ * fVar254;
                auVar111._20_4_ = auVar335._20_4_ * fVar255;
                auVar111._24_4_ = auVar335._24_4_ * fVar272;
                auVar111._28_4_ = auVar22._28_4_;
                auVar112._4_4_ = auVar151._4_4_ * fVar236;
                auVar112._0_4_ = auVar151._0_4_ * fVar217;
                auVar112._8_4_ = auVar151._8_4_ * fVar249;
                auVar112._12_4_ = auVar151._12_4_ * fVar250;
                auVar112._16_4_ = auVar151._16_4_ * fVar254;
                auVar112._20_4_ = auVar151._20_4_ * fVar255;
                auVar112._24_4_ = auVar151._24_4_ * fVar272;
                auVar112._28_4_ = auVar151._28_4_;
                auVar284._8_4_ = 0x3f800000;
                auVar284._0_8_ = 0x3f8000003f800000;
                auVar284._12_4_ = 0x3f800000;
                auVar284._16_4_ = 0x3f800000;
                auVar284._20_4_ = 0x3f800000;
                auVar284._24_4_ = 0x3f800000;
                auVar284._28_4_ = 0x3f800000;
                auVar285 = ZEXT3264(auVar284);
                auVar147 = vsubps_avx(auVar284,auVar111);
                _local_e0 = vblendvps_avx(auVar147,auVar111,auVar21);
                auVar147 = vsubps_avx(auVar284,auVar112);
                _local_500 = vblendvps_avx(auVar147,auVar112,auVar21);
                auVar158 = ZEXT3264(_local_500);
                local_5e0 = auVar110;
              }
            }
            auVar147 = auVar229._0_32_;
            fVar217 = (float)local_6c0._0_4_;
            fVar230 = (float)local_6c0._4_4_;
            fVar235 = fStack_6b8;
            fVar236 = fStack_6b4;
            fVar249 = fStack_6b0;
            fVar250 = fStack_6ac;
            fVar254 = fStack_6a8;
            fVar255 = fStack_6a4;
            fVar268 = (float)local_680._0_4_;
            fVar270 = (float)local_680._4_4_;
            fVar272 = fStack_678;
            fVar273 = fStack_674;
            fVar274 = fStack_670;
            fVar341 = fStack_66c;
            fVar308 = fStack_668;
            if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar147 >> 0x7f,0) != '\0') ||
                  (auVar229 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar147 >> 0xbf,0) != '\0') ||
                (auVar229 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar229[0x1f] < '\0') {
              auVar22 = vsubps_avx(_local_620,auVar345);
              fVar136 = auVar345._0_4_ + auVar22._0_4_ * (float)local_e0._0_4_;
              fVar160 = auVar345._4_4_ + auVar22._4_4_ * (float)local_e0._4_4_;
              fVar162 = auVar345._8_4_ + auVar22._8_4_ * fStack_d8;
              fVar163 = auVar345._12_4_ + auVar22._12_4_ * fStack_d4;
              fVar165 = auVar345._16_4_ + auVar22._16_4_ * fStack_d0;
              fVar167 = auVar345._20_4_ + auVar22._20_4_ * fStack_cc;
              fVar290 = auVar345._24_4_ + auVar22._24_4_ * fStack_c8;
              fVar171 = auVar345._28_4_ + auVar22._28_4_;
              fVar288 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar113._4_4_ = (fVar160 + fVar160) * fVar288;
              auVar113._0_4_ = (fVar136 + fVar136) * fVar288;
              auVar113._8_4_ = (fVar162 + fVar162) * fVar288;
              auVar113._12_4_ = (fVar163 + fVar163) * fVar288;
              auVar113._16_4_ = (fVar165 + fVar165) * fVar288;
              auVar113._20_4_ = (fVar167 + fVar167) * fVar288;
              auVar113._24_4_ = (fVar290 + fVar290) * fVar288;
              auVar113._28_4_ = fVar171 + fVar171;
              auVar22 = vcmpps_avx(local_5e0,auVar113,6);
              auVar158 = ZEXT3264(auVar22);
              auVar23 = auVar147 & auVar22;
              if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar23 >> 0x7f,0) != '\0') ||
                    (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar23 >> 0xbf,0) != '\0') ||
                  (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar23[0x1f] < '\0') {
                local_400 = (float)local_500._0_4_ + (float)local_500._0_4_ + -1.0;
                fStack_3fc = (float)local_500._4_4_ + (float)local_500._4_4_ + -1.0;
                fStack_3f8 = (float)uStack_4f8 + (float)uStack_4f8 + -1.0;
                fStack_3f4 = uStack_4f8._4_4_ + uStack_4f8._4_4_ + -1.0;
                fStack_3f0 = (float)uStack_4f0 + (float)uStack_4f0 + -1.0;
                fStack_3ec = uStack_4f0._4_4_ + uStack_4f0._4_4_ + -1.0;
                fStack_3e8 = (float)uStack_4e8 + (float)uStack_4e8 + -1.0;
                fStack_3e4 = uStack_4e8._4_4_ + uStack_4e8._4_4_ + -1.0;
                local_420 = _local_e0;
                local_500._4_4_ = fStack_3fc;
                local_500._0_4_ = local_400;
                uStack_4f8._0_4_ = fStack_3f8;
                uStack_4f8._4_4_ = fStack_3f4;
                uStack_4f0._0_4_ = fStack_3f0;
                uStack_4f0._4_4_ = fStack_3ec;
                auVar123 = _local_500;
                uStack_4e8._0_4_ = fStack_3e8;
                uStack_4e8._4_4_ = fStack_3e4;
                auVar23 = _local_500;
                local_3e0 = local_5e0;
                local_3a0 = local_930;
                fStack_39c = fStack_92c;
                fStack_398 = fStack_928;
                fStack_394 = fStack_924;
                pGVar18 = (context->scene->geometries).items[uVar128].ptr;
                _local_500 = auVar23;
                if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  local_660[0] = vandps_avx(auVar22,auVar147);
                  auVar203._0_4_ = (float)(int)local_3c0;
                  auVar203._4_8_ = SUB128(ZEXT812(0),4);
                  auVar203._12_4_ = 0;
                  auVar243 = vshufps_avx(auVar203,auVar203,0);
                  local_340[0] = (auVar243._0_4_ + (float)local_e0._0_4_ + 0.0) *
                                 (float)local_140._0_4_;
                  local_340[1] = (auVar243._4_4_ + (float)local_e0._4_4_ + 1.0) *
                                 (float)local_140._4_4_;
                  local_340[2] = (auVar243._8_4_ + fStack_d8 + 2.0) * fStack_138;
                  local_340[3] = (auVar243._12_4_ + fStack_d4 + 3.0) * fStack_134;
                  fStack_330 = (auVar243._0_4_ + fStack_d0 + 4.0) * fStack_130;
                  fStack_32c = (auVar243._4_4_ + fStack_cc + 5.0) * fStack_12c;
                  fStack_328 = (auVar243._8_4_ + fStack_c8 + 6.0) * fStack_128;
                  fStack_324 = auVar243._12_4_ + fStack_c4 + 7.0;
                  uStack_4f0 = auVar123._16_8_;
                  uStack_4e8 = auVar23._24_8_;
                  local_320 = local_500;
                  uStack_318 = uStack_4f8;
                  uStack_310 = uStack_4f0;
                  uStack_308 = uStack_4e8;
                  local_300 = local_5e0;
                  auVar186._8_4_ = 0x7f800000;
                  auVar186._0_8_ = 0x7f8000007f800000;
                  auVar186._12_4_ = 0x7f800000;
                  auVar186._16_4_ = 0x7f800000;
                  auVar186._20_4_ = 0x7f800000;
                  auVar186._24_4_ = 0x7f800000;
                  auVar186._28_4_ = 0x7f800000;
                  auVar147 = vblendvps_avx(auVar186,local_5e0,local_660[0]);
                  auVar22 = vshufps_avx(auVar147,auVar147,0xb1);
                  auVar22 = vminps_avx(auVar147,auVar22);
                  auVar23 = vshufpd_avx(auVar22,auVar22,5);
                  auVar22 = vminps_avx(auVar22,auVar23);
                  auVar23 = vperm2f128_avx(auVar22,auVar22,1);
                  auVar22 = vminps_avx(auVar22,auVar23);
                  auVar22 = vcmpps_avx(auVar147,auVar22,0);
                  auVar23 = local_660[0] & auVar22;
                  auVar147 = local_660[0];
                  if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar23 >> 0x7f,0) != '\0') ||
                        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar23 >> 0xbf,0) != '\0') ||
                      (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar23[0x1f] < '\0') {
                    auVar147 = vandps_avx(auVar22,local_660[0]);
                  }
                  uVar129 = vmovmskps_avx(auVar147);
                  uVar20 = 0;
                  if (uVar129 != 0) {
                    for (; (uVar129 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                    }
                  }
                  uVar132 = (ulong)uVar20;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar18->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar243 = *local_770;
                    _local_7c0 = auVar154._0_16_;
                    uStack_7b0 = *(undefined8 *)(local_778 + 0x10);
                    uStack_7a8 = *(undefined8 *)(local_778 + 0x18);
                    uStack_7d0 = *(undefined8 *)(local_778 + 0x10);
                    _local_7e0 = *local_770;
                    uStack_7c8 = *(undefined8 *)(local_778 + 0x18);
                    auVar158 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                    local_3bc = uVar16;
                    local_3b0 = local_900;
                    uStack_3a8 = uStack_8f8;
                    local_390 = uVar124;
                    uStack_388 = uVar125;
                    local_380 = uVar126;
                    uStack_378 = uVar127;
                    while( true ) {
                      local_200 = local_340[uVar132];
                      local_1e0 = *(undefined4 *)((long)&local_320 + uVar132 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_300 + uVar132 * 4);
                      fVar230 = 1.0 - local_200;
                      fVar217 = local_200 * fVar230 + local_200 * fVar230;
                      auVar285 = ZEXT464(0x40400000);
                      auVar204 = ZEXT416((uint)(local_200 * local_200 * 3.0));
                      auVar204 = vshufps_avx(auVar204,auVar204,0);
                      auVar220 = ZEXT416((uint)((fVar217 - local_200 * local_200) * 3.0));
                      auVar220 = vshufps_avx(auVar220,auVar220,0);
                      auVar208 = ZEXT416((uint)((fVar230 * fVar230 - fVar217) * 3.0));
                      auVar208 = vshufps_avx(auVar208,auVar208,0);
                      local_830.context = context->user;
                      auVar206 = ZEXT416((uint)(fVar230 * fVar230 * -3.0));
                      auVar206 = vshufps_avx(auVar206,auVar206,0);
                      auVar207._0_4_ =
                           fVar251 * auVar206._0_4_ +
                           local_930 * auVar208._0_4_ +
                           auVar204._0_4_ * local_8e0 + auVar220._0_4_ * local_8d0;
                      auVar207._4_4_ =
                           fVar253 * auVar206._4_4_ +
                           fStack_92c * auVar208._4_4_ +
                           auVar204._4_4_ * fStack_8dc + auVar220._4_4_ * fStack_8cc;
                      auVar207._8_4_ =
                           fVar256 * auVar206._8_4_ +
                           fStack_928 * auVar208._8_4_ +
                           auVar204._8_4_ * fStack_8d8 + auVar220._8_4_ * fStack_8c8;
                      auVar207._12_4_ =
                           fVar266 * auVar206._12_4_ +
                           fStack_924 * auVar208._12_4_ +
                           auVar204._12_4_ * fStack_8d4 + auVar220._12_4_ * fStack_8c4;
                      auStack_250 = vshufps_avx(auVar207,auVar207,0);
                      local_260[0] = (RTCHitN)auStack_250[0];
                      local_260[1] = (RTCHitN)auStack_250[1];
                      local_260[2] = (RTCHitN)auStack_250[2];
                      local_260[3] = (RTCHitN)auStack_250[3];
                      local_260[4] = (RTCHitN)auStack_250[4];
                      local_260[5] = (RTCHitN)auStack_250[5];
                      local_260[6] = (RTCHitN)auStack_250[6];
                      local_260[7] = (RTCHitN)auStack_250[7];
                      local_260[8] = (RTCHitN)auStack_250[8];
                      local_260[9] = (RTCHitN)auStack_250[9];
                      local_260[10] = (RTCHitN)auStack_250[10];
                      local_260[0xb] = (RTCHitN)auStack_250[0xb];
                      local_260[0xc] = (RTCHitN)auStack_250[0xc];
                      local_260[0xd] = (RTCHitN)auStack_250[0xd];
                      local_260[0xe] = (RTCHitN)auStack_250[0xe];
                      local_260[0xf] = (RTCHitN)auStack_250[0xf];
                      auStack_230 = vshufps_avx(auVar207,auVar207,0x55);
                      local_240 = auStack_230;
                      auStack_210 = vshufps_avx(auVar207,auVar207,0xaa);
                      local_220 = auStack_210;
                      fStack_1fc = local_200;
                      fStack_1f8 = local_200;
                      fStack_1f4 = local_200;
                      fStack_1f0 = local_200;
                      fStack_1ec = local_200;
                      fStack_1e8 = local_200;
                      fStack_1e4 = local_200;
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_1c0 = local_120._0_8_;
                      uStack_1b8 = local_120._8_8_;
                      uStack_1b0 = local_120._16_8_;
                      uStack_1a8 = local_120._24_8_;
                      local_1a0 = local_100._0_8_;
                      uStack_198 = local_100._8_8_;
                      uStack_190 = local_100._16_8_;
                      uStack_188 = local_100._24_8_;
                      auVar147 = vcmpps_avx(auVar315._0_32_,auVar315._0_32_,0xf);
                      local_768[1] = auVar147;
                      *local_768 = auVar147;
                      local_180 = (local_830.context)->instID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_160 = (local_830.context)->instPrimID[0];
                      uStack_15c = local_160;
                      uStack_158 = local_160;
                      uStack_154 = local_160;
                      uStack_150 = local_160;
                      uStack_14c = local_160;
                      uStack_148 = local_160;
                      uStack_144 = local_160;
                      local_7a0 = local_7e0;
                      uStack_798 = uStack_7d8;
                      uStack_790 = uStack_7d0;
                      uStack_788 = uStack_7c8;
                      local_830.valid = (int *)&local_7a0;
                      local_830.geometryUserPtr = pGVar18->userPtr;
                      local_830.hit = local_260;
                      local_830.N = 8;
                      auVar139 = _local_7c0;
                      auVar176 = auVar243;
                      local_830.ray = (RTCRayN *)ray;
                      if (pGVar18->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        local_800._0_8_ = uVar132;
                        local_760._0_16_ = auVar158._0_16_;
                        auVar285 = ZEXT1664(auVar285._0_16_);
                        (*pGVar18->intersectionFilterN)(&local_830);
                        auVar158 = ZEXT1664(local_760._0_16_);
                        auVar315 = ZEXT1664(ZEXT816(0) << 0x40);
                        auVar176._8_8_ = uStack_798;
                        auVar176._0_8_ = local_7a0;
                        auVar139._8_8_ = uStack_788;
                        auVar139._0_8_ = uStack_790;
                        uVar132 = local_800._0_8_;
                      }
                      auVar204 = vpcmpeqd_avx(auVar176,ZEXT816(0) << 0x40);
                      auVar220 = vpcmpeqd_avx(auVar139,ZEXT816(0) << 0x40);
                      auVar214._16_16_ = auVar220;
                      auVar214._0_16_ = auVar204;
                      auVar154 = auVar147 & ~auVar214;
                      if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar154 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar154 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar154 >> 0x7f,0) == '\0') &&
                            (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar154 >> 0xbf,0) == '\0') &&
                          (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar154[0x1f]) {
                        auVar152._0_4_ = auVar204._0_4_ ^ auVar147._0_4_;
                        auVar152._4_4_ = auVar204._4_4_ ^ auVar147._4_4_;
                        auVar152._8_4_ = auVar204._8_4_ ^ auVar147._8_4_;
                        auVar152._12_4_ = auVar204._12_4_ ^ auVar147._12_4_;
                        auVar152._16_4_ = auVar220._0_4_ ^ auVar147._16_4_;
                        auVar152._20_4_ = auVar220._4_4_ ^ auVar147._20_4_;
                        auVar152._24_4_ = auVar220._8_4_ ^ auVar147._24_4_;
                        auVar152._28_4_ = auVar220._12_4_ ^ auVar147._28_4_;
                        auVar229 = ZEXT3264(local_5e0);
                      }
                      else {
                        p_Var19 = context->args->filter;
                        auVar229 = ZEXT3264(local_5e0);
                        if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
                          local_800._0_8_ = uVar132;
                          local_760._0_16_ = auVar158._0_16_;
                          auVar285 = ZEXT1664(auVar285._0_16_);
                          (*p_Var19)(&local_830);
                          auVar158 = ZEXT1664(local_760._0_16_);
                          auVar229 = ZEXT3264(local_5e0);
                          auVar315 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar176._8_8_ = uStack_798;
                          auVar176._0_8_ = local_7a0;
                          auVar139._8_8_ = uStack_788;
                          auVar139._0_8_ = uStack_790;
                          uVar132 = local_800._0_8_;
                        }
                        auVar204 = vpcmpeqd_avx(auVar176,ZEXT816(0) << 0x40);
                        auVar220 = vpcmpeqd_avx(auVar139,ZEXT816(0) << 0x40);
                        auVar187._16_16_ = auVar220;
                        auVar187._0_16_ = auVar204;
                        auVar152._0_4_ = auVar204._0_4_ ^ auVar147._0_4_;
                        auVar152._4_4_ = auVar204._4_4_ ^ auVar147._4_4_;
                        auVar152._8_4_ = auVar204._8_4_ ^ auVar147._8_4_;
                        auVar152._12_4_ = auVar204._12_4_ ^ auVar147._12_4_;
                        auVar152._16_4_ = auVar220._0_4_ ^ auVar147._16_4_;
                        auVar152._20_4_ = auVar220._4_4_ ^ auVar147._20_4_;
                        auVar152._24_4_ = auVar220._8_4_ ^ auVar147._24_4_;
                        auVar152._28_4_ = auVar220._12_4_ ^ auVar147._28_4_;
                        auVar147 = auVar147 & ~auVar187;
                        if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar147 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar147 >> 0x7f,0) != '\0')
                              || (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar147 >> 0xbf,0) != '\0') ||
                            (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar147[0x1f] < '\0') {
                          auVar147 = vmaskmovps_avx(auVar152,*(undefined1 (*) [32])local_830.hit);
                          *(undefined1 (*) [32])(local_830.ray + 0x180) = auVar147;
                          auVar147 = vmaskmovps_avx(auVar152,*(undefined1 (*) [32])
                                                              (local_830.hit + 0x20));
                          *(undefined1 (*) [32])(local_830.ray + 0x1a0) = auVar147;
                          auVar147 = vmaskmovps_avx(auVar152,*(undefined1 (*) [32])
                                                              (local_830.hit + 0x40));
                          *(undefined1 (*) [32])(local_830.ray + 0x1c0) = auVar147;
                          auVar147 = vmaskmovps_avx(auVar152,*(undefined1 (*) [32])
                                                              (local_830.hit + 0x60));
                          *(undefined1 (*) [32])(local_830.ray + 0x1e0) = auVar147;
                          auVar147 = vmaskmovps_avx(auVar152,*(undefined1 (*) [32])
                                                              (local_830.hit + 0x80));
                          *(undefined1 (*) [32])(local_830.ray + 0x200) = auVar147;
                          auVar147 = vmaskmovps_avx(auVar152,*(undefined1 (*) [32])
                                                              (local_830.hit + 0xa0));
                          *(undefined1 (*) [32])(local_830.ray + 0x220) = auVar147;
                          auVar147 = vmaskmovps_avx(auVar152,*(undefined1 (*) [32])
                                                              (local_830.hit + 0xc0));
                          *(undefined1 (*) [32])(local_830.ray + 0x240) = auVar147;
                          auVar147 = vmaskmovps_avx(auVar152,*(undefined1 (*) [32])
                                                              (local_830.hit + 0xe0));
                          *(undefined1 (*) [32])(local_830.ray + 0x260) = auVar147;
                          auVar147 = vmaskmovps_avx(auVar152,*(undefined1 (*) [32])
                                                              (local_830.hit + 0x100));
                          *(undefined1 (*) [32])(local_830.ray + 0x280) = auVar147;
                        }
                      }
                      if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar152 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar152 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar152 >> 0x7f,0) == '\0') &&
                            (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar152 >> 0xbf,0) == '\0') &&
                          (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar152[0x1f]) {
                        *(int *)(ray + k * 4 + 0x100) = auVar158._0_4_;
                      }
                      else {
                        auVar158 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                      }
                      *(undefined4 *)(local_660[0] + uVar132 * 4) = 0;
                      auVar204 = vshufps_avx(auVar158._0_16_,auVar158._0_16_,0);
                      auVar153._16_16_ = auVar204;
                      auVar153._0_16_ = auVar204;
                      auVar154 = vcmpps_avx(auVar229._0_32_,auVar153,2);
                      auVar147 = vandps_avx(auVar154,local_660[0]);
                      local_660[0] = local_660[0] & auVar154;
                      if ((((((((local_660[0] >> 0x1f & (undefined1  [32])0x1) ==
                                (undefined1  [32])0x0 &&
                               (local_660[0] >> 0x3f & (undefined1  [32])0x1) ==
                               (undefined1  [32])0x0) &&
                              (local_660[0] >> 0x5f & (undefined1  [32])0x1) ==
                              (undefined1  [32])0x0) && SUB321(local_660[0] >> 0x7f,0) == '\0') &&
                            (local_660[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                           && SUB321(local_660[0] >> 0xbf,0) == '\0') &&
                          (local_660[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                          && -1 < local_660[0][0x1f]) break;
                      auVar188._8_4_ = 0x7f800000;
                      auVar188._0_8_ = 0x7f8000007f800000;
                      auVar188._12_4_ = 0x7f800000;
                      auVar188._16_4_ = 0x7f800000;
                      auVar188._20_4_ = 0x7f800000;
                      auVar188._24_4_ = 0x7f800000;
                      auVar188._28_4_ = 0x7f800000;
                      auVar154 = vblendvps_avx(auVar188,auVar229._0_32_,auVar147);
                      auVar22 = vshufps_avx(auVar154,auVar154,0xb1);
                      auVar22 = vminps_avx(auVar154,auVar22);
                      auVar23 = vshufpd_avx(auVar22,auVar22,5);
                      auVar22 = vminps_avx(auVar22,auVar23);
                      auVar23 = vperm2f128_avx(auVar22,auVar22,1);
                      auVar22 = vminps_avx(auVar22,auVar23);
                      auVar22 = vcmpps_avx(auVar154,auVar22,0);
                      auVar23 = auVar147 & auVar22;
                      auVar154 = auVar147;
                      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar23 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar23 >> 0x7f,0) != '\0') ||
                            (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar23 >> 0xbf,0) != '\0') ||
                          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar23[0x1f] < '\0') {
                        auVar154 = vandps_avx(auVar22,auVar147);
                      }
                      uVar129 = vmovmskps_avx(auVar154);
                      uVar20 = 0;
                      if (uVar129 != 0) {
                        for (; (uVar129 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                        }
                      }
                      uVar132 = (ulong)uVar20;
                      local_660[0] = auVar147;
                    }
                    goto LAB_010bb2b6;
                  }
                  fVar288 = local_340[uVar132];
                  auVar158 = ZEXT464((uint)fVar288);
                  uVar7 = *(undefined4 *)((long)&local_320 + uVar132 * 4);
                  fVar160 = 1.0 - fVar288;
                  fVar136 = fVar288 * fVar160 + fVar288 * fVar160;
                  auVar285 = ZEXT464(0x40400000);
                  auVar243 = ZEXT416((uint)(fVar288 * fVar288 * 3.0));
                  auVar243 = vshufps_avx(auVar243,auVar243,0);
                  auVar204 = ZEXT416((uint)((fVar136 - fVar288 * fVar288) * 3.0));
                  auVar204 = vshufps_avx(auVar204,auVar204,0);
                  auVar220 = ZEXT416((uint)((fVar160 * fVar160 - fVar136) * 3.0));
                  auVar220 = vshufps_avx(auVar220,auVar220,0);
                  auVar208 = ZEXT416((uint)(fVar160 * fVar160 * -3.0));
                  auVar208 = vshufps_avx(auVar208,auVar208,0);
                  auVar205._0_4_ =
                       fVar251 * auVar208._0_4_ +
                       local_930 * auVar220._0_4_ +
                       auVar243._0_4_ * local_8e0 + auVar204._0_4_ * local_8d0;
                  auVar205._4_4_ =
                       fVar253 * auVar208._4_4_ +
                       fStack_92c * auVar220._4_4_ +
                       auVar243._4_4_ * fStack_8dc + auVar204._4_4_ * fStack_8cc;
                  auVar205._8_4_ =
                       fVar256 * auVar208._8_4_ +
                       fStack_928 * auVar220._8_4_ +
                       auVar243._8_4_ * fStack_8d8 + auVar204._8_4_ * fStack_8c8;
                  auVar205._12_4_ =
                       fVar266 * auVar208._12_4_ +
                       fStack_924 * auVar220._12_4_ +
                       auVar243._12_4_ * fStack_8d4 + auVar204._12_4_ * fStack_8c4;
                  auVar229 = ZEXT464(*(uint *)(local_300 + uVar132 * 4));
                  *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_300 + uVar132 * 4);
                  *(float *)(ray + k * 4 + 0x180) = auVar205._0_4_;
                  uVar17 = vextractps_avx(auVar205,1);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar17;
                  uVar17 = vextractps_avx(auVar205,2);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar17;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar288;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar7;
                  *(uint *)(ray + k * 4 + 0x220) = uVar130;
                  *(uint *)(ray + k * 4 + 0x240) = uVar128;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
              }
            }
          }
          lVar133 = lVar133 + 8;
          auVar315 = ZEXT3264(local_6e0);
        } while ((int)lVar133 < (int)uVar16);
      }
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar148._4_4_ = uVar7;
      auVar148._0_4_ = uVar7;
      auVar148._8_4_ = uVar7;
      auVar148._12_4_ = uVar7;
      auVar148._16_4_ = uVar7;
      auVar148._20_4_ = uVar7;
      auVar148._24_4_ = uVar7;
      auVar148._28_4_ = uVar7;
      auVar147 = vcmpps_avx(local_80,auVar148,2);
      uVar128 = vmovmskps_avx(auVar147);
      uVar128 = (uint)uVar134 & uVar128;
    } while (uVar128 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }